

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLNodeLaplacian_sync.cpp
# Opt level: O2

void __thiscall
amrex::MLNodeLaplacian::compSyncResidualCoarse
          (MLNodeLaplacian *this,MultiFab *sync_resid,MultiFab *a_phi,MultiFab *vold,MultiFab *rhcc,
          BoxArray *fine_grids,IntVect *ref_ratio)

{
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  long lVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  Real RVar18;
  LinOpBCType LVar19;
  LinOpBCType LVar20;
  Geometry *this_00;
  DistributionMapping *cdm;
  BoxArray *ba;
  pointer paVar21;
  pointer paVar22;
  ulong uVar23;
  undefined8 *puVar24;
  EBCellFlagFab *this_01;
  FabArray<amrex::FArrayBox> *this_02;
  GpuArray<amrex::LinOpBCType,_3U> bchi;
  GpuArray<amrex::LinOpBCType,_3U> bclo;
  ulong uVar25;
  double *pdVar26;
  bool bVar27;
  int i;
  FabType FVar28;
  uint uVar29;
  ulong uVar30;
  long lVar31;
  _func_int **pp_Var32;
  long lVar33;
  EBFArrayBoxFactory *this_03;
  long lVar34;
  long lVar35;
  int iVar36;
  long lVar37;
  long lVar38;
  long lVar39;
  undefined8 *puVar40;
  int iVar41;
  long lVar42;
  long lVar43;
  long lVar44;
  long lVar45;
  int *piVar46;
  long lVar47;
  long lVar48;
  double *pdVar49;
  undefined8 *puVar50;
  undefined8 *puVar51;
  long lVar52;
  Real *pRVar53;
  Real *pRVar54;
  int j_1;
  int iVar55;
  long lVar56;
  int iVar57;
  long lVar58;
  long lVar59;
  int iVar60;
  int iVar61;
  long lVar62;
  long lVar63;
  long lVar64;
  long lVar65;
  long lVar66;
  long lVar67;
  long lVar68;
  long lVar69;
  long lVar70;
  long lVar71;
  long lVar72;
  long lVar73;
  long lVar74;
  long lVar75;
  double *pdVar76;
  long lVar77;
  uint uVar78;
  long lVar79;
  int *piVar80;
  long lVar81;
  long lVar82;
  long lVar83;
  long lVar84;
  long lVar85;
  int i_3;
  int iVar86;
  long lVar87;
  long lVar88;
  long lVar89;
  long lVar90;
  long lVar91;
  int i_5;
  long lVar92;
  long lVar93;
  long lVar94;
  long lVar95;
  long lVar96;
  double *pdVar97;
  long lVar98;
  long lVar99;
  int j;
  long lVar100;
  long lVar101;
  long lVar102;
  double *pdVar103;
  long lVar104;
  long lVar105;
  long lVar106;
  Real *pRVar107;
  int iVar108;
  long lVar109;
  int *piVar110;
  long lVar111;
  long lVar112;
  long lVar113;
  long lVar114;
  long lVar115;
  double dVar116;
  double dVar117;
  double dVar118;
  double dVar119;
  double dVar120;
  double dVar121;
  double dVar122;
  double dVar123;
  double dVar124;
  undefined8 uVar125;
  Real RVar126;
  double dVar127;
  double dVar128;
  double dVar129;
  double dVar130;
  double dVar131;
  double dVar132;
  double dVar133;
  double dVar134;
  double dVar135;
  int iVar136;
  double dVar137;
  double dVar138;
  double dVar139;
  double dVar140;
  ulong uVar141;
  double dVar142;
  double dVar143;
  double dVar144;
  double dVar145;
  double dVar146;
  double dVar147;
  double dVar148;
  double dVar149;
  double dVar150;
  double dVar151;
  double dVar152;
  double dVar153;
  double dVar154;
  double dVar155;
  double dVar156;
  double dVar157;
  double dVar158;
  double dVar159;
  double dVar160;
  double dVar161;
  Periodicity PVar162;
  double *local_1030;
  double *local_1028;
  long local_1020;
  long local_1018;
  double *local_1010;
  double *local_1000;
  double *local_ff8;
  long local_ff0;
  long local_fe8;
  long local_fd8;
  double *local_fc8;
  double *local_fc0;
  double *local_fb8;
  long local_fb0;
  long local_fa8;
  long local_f98;
  double *local_f90;
  long local_f88;
  long local_f80;
  long local_f78;
  double *local_f70;
  double *local_f68;
  long local_f58;
  double *local_f50;
  long local_f48;
  long local_f40;
  long local_f38;
  undefined8 *local_f30;
  long local_f28;
  long local_f18;
  long local_f10;
  long local_f08;
  long local_ef8;
  double *local_ef0;
  long local_ee8;
  long local_ee0;
  double *local_ed0;
  long local_ec8;
  double *local_ec0;
  long local_eb8;
  long local_ea8;
  long local_ea0;
  long local_e98;
  long local_e88;
  long local_e80;
  long local_e78;
  long local_e68;
  long local_e60;
  long local_e58;
  long local_e50;
  long local_e48;
  Box local_e38;
  Box bx_2;
  long local_dd8;
  double *local_d90;
  double *local_d88;
  int local_d80;
  long local_d78;
  long local_d48;
  long local_d40;
  long local_d38;
  long local_d30;
  long local_d28;
  long local_d20;
  long local_d18;
  long local_d10;
  long local_d08;
  int local_ce8;
  Box bx;
  long local_cb8;
  Box bx_1;
  int local_c68;
  uint local_c64;
  uint local_c60;
  Array4<const_double> local_c20;
  undefined1 local_be0 [32];
  int local_bc0;
  int local_bbc;
  int local_bb8;
  long local_ba0;
  long local_b98;
  long local_b90;
  long local_b88;
  long local_b80;
  long local_b78;
  long local_b70;
  ulong local_b68;
  undefined4 local_b5c;
  Array4<const_int> local_b58;
  FabArray<amrex::FArrayBox> *local_b18;
  _Head_base<0UL,_amrex::MultiFab_*,_false> local_b10;
  long local_b08;
  long local_b00;
  long local_af8;
  long local_af0;
  long local_ae8;
  long local_ae0;
  long local_ad8;
  long local_ad0;
  Box lhs_1;
  int local_aa8;
  int local_aa4;
  int local_aa0;
  Box result;
  Box lhs;
  Box bx_6;
  undefined4 uStack_a2c;
  int local_a28;
  int local_a24;
  int local_a20;
  Array4<const_double> local_a08;
  Box local_9c8;
  FabArray<amrex::EBCellFlagFab> *local_9a8;
  Box *local_9a0;
  long local_998;
  long local_990;
  long local_988;
  Array4<const_double> local_980;
  int local_940;
  int local_93c;
  Box bx_3;
  Box bx_5;
  Box lhs_2;
  Real facz;
  Real facy;
  Real facx;
  FArrayBox rhs;
  MFIter mfi_1;
  undefined1 local_7d0 [28];
  undefined4 uStack_7b4;
  int local_7b0;
  int local_7ac;
  int local_7a8;
  long local_790;
  long local_788;
  long local_780;
  long local_778;
  long local_770;
  long local_768;
  long local_760;
  long local_758;
  FabArray<amrex::IArrayBox> *local_750;
  FabArray<amrex::FArrayBox> *local_748;
  long local_740;
  long local_738;
  long local_730;
  long local_728;
  long local_720;
  long local_718;
  long local_710;
  long local_708;
  long local_700;
  long local_6f8;
  long local_6f0;
  long local_6e8;
  FArrayBox sten;
  FArrayBox u;
  FArrayBox cn;
  Real fm2xm2y4z;
  Real f2x2ymz;
  Real f2xmy2z;
  Real fmx2y2z;
  Real fxyz;
  Real fm2x4ym2z;
  Real f4xm2ym2z;
  Real facy_2;
  Real facx_2;
  Real facz_2;
  Elixir steneli;
  Elixir rhseli;
  Elixir ueli;
  Box local_44c;
  Elixir cneli;
  MFItInfo local_414;
  BoxArray local_400;
  BoxArray local_398;
  MultiFab phi;
  iMultiFab crse_cc_mask;
  
  local_748 = &vold->super_FabArray<amrex::FArrayBox>;
  FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
            (&sync_resid->super_FabArray<amrex::FArrayBox>,0.0);
  this_00 = *(Geometry **)
             &(((this->super_MLNodeLinOp).super_MLLinOp.m_geom.
                super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                .
                super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->
              super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>).
              super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>;
  cdm = *(DistributionMapping **)
         &(((this->super_MLNodeLinOp).super_MLLinOp.m_dmap.
            super_vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
            .
            super__Vector_base<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start)->
          super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>).
          super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
  ;
  ba = *(BoxArray **)
        &(((this->super_MLNodeLinOp).super_MLLinOp.m_grids.
           super_vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
           .
           super__Vector_base<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->
         super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>).
         super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>;
  crse_cc_mask.super_FabArray<amrex::IArrayBox>.super_FabArrayBase._vptr_FabArrayBase =
       (_func_int **)0x100000001;
  crse_cc_mask.super_FabArray<amrex::IArrayBox>.super_FabArrayBase.boxarray.m_bat.m_bat_type =
       indexType;
  convert(&local_398,ba,(IntVect *)&crse_cc_mask);
  crse_cc_mask.super_FabArray<amrex::IArrayBox>.super_FabArrayBase._vptr_FabArrayBase =
       (_func_int **)0x0;
  crse_cc_mask.super_FabArray<amrex::IArrayBox>.super_FabArrayBase.boxarray.m_bat.m_bat_type = null;
  convert(&local_400,fine_grids,(IntVect *)&crse_cc_mask);
  paVar21 = (this->super_MLNodeLinOp).super_MLLinOp.m_lobc.
            super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
            .
            super__Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  paVar22 = (this->super_MLNodeLinOp).super_MLLinOp.m_hibc.
            super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
            .
            super__Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  uVar23 = *(ulong *)paVar21->_M_elems;
  LVar19 = paVar21->_M_elems[2];
  bclo.arr = *&paVar21->_M_elems;
  local_b68 = *(ulong *)paVar22->_M_elems;
  LVar20 = paVar22->_M_elems[2];
  phi.super_FabArray<amrex::FArrayBox>.super_FabArrayBase._vptr_FabArrayBase =
       (_func_int **)0x100000001;
  phi.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_bat_type = indexType;
  PVar162 = Geometry::periodicity(this_00);
  mfi_1.m_fa._M_t.
  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._0_1_ =
       (undefined1)PVar162.period.vect[0];
  mfi_1.m_fa._M_t.
  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._1_7_ = PVar162.period.vect._1_7_
  ;
  mfi_1.fabArray._0_4_ = PVar162.period.vect[2];
  makeFineMask(&crse_cc_mask,ba,cdm,(IntVect *)&phi,&local_400,ref_ratio,(Periodicity *)&mfi_1,1,0);
  MFIter::MFIter((MFIter *)&phi,(FabArrayBase *)&crse_cc_mask,'\0');
  uVar25 = local_b68;
  uVar30 = local_b68 >> 0x20;
  local_9a0 = &this_00->domain;
  while (phi.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.
         m_loshft.vect[0] <
         phi.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.
         m_loshft.vect[2]) {
    FabArray<amrex::IArrayBox>::array<amrex::IArrayBox,_0>
              ((Array4<int> *)&mfi_1,&crse_cc_mask.super_FabArray<amrex::IArrayBox>,(MFIter *)&phi);
    MFIter::validbox((Box *)&rhs,(MFIter *)&phi);
    bchi.arr[2] = LVar20;
    bchi.arr[0] = (undefined4)local_b68;
    bchi.arr[1] = local_b68._4_4_;
    mlndlap_fillbc_cc<int>((Box *)&rhs,(Array4<int> *)&mfi_1,local_9a0,bclo,bchi);
    MFIter::operator++((MFIter *)&phi);
  }
  MFIter::~MFIter((MFIter *)&phi);
  mfi_1.m_fa._M_t.
  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._1_7_ = 0;
  mfi_1.m_fa._M_t.
  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._0_1_ = 1;
  mfi_1.fabArray._0_4_ = 0;
  mfi_1._12_12_ = SUB1612((undefined1  [16])0x0,4);
  mfi_1.tile_size.vect[2] = 0;
  mfi_1.flags = '\0';
  mfi_1._29_3_ = 0;
  mfi_1.currentIndex = 0;
  mfi_1.beginIndex = 0;
  rhs.super_BaseFab<double>._vptr_BaseFab = (_func_int **)&PTR__FabFactory_006d8928;
  MultiFab::MultiFab(&phi,&local_398,cdm,1,1,(MFInfo *)&mfi_1,(FabFactory<amrex::FArrayBox> *)&rhs);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&mfi_1.tile_size);
  MFIter::MFIter(&mfi_1,(FabArrayBase *)&phi,true);
  while( true ) {
    if (mfi_1.endIndex <= mfi_1.currentIndex) break;
    MFIter::tilebox((Box *)&cn,&mfi_1);
    MFIter::growntilebox(&bx_1,&mfi_1,-1000000);
    FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              ((Array4<double> *)&rhs,&phi.super_FabArray<amrex::FArrayBox>,&mfi_1);
    FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              ((Array4<const_double> *)&u,&a_phi->super_FabArray<amrex::FArrayBox>,&mfi_1);
    FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>
              ((Array4<const_int> *)&sten,&crse_cc_mask.super_FabArray<amrex::IArrayBox>,&mfi_1);
    iVar57 = bx_1.bigend.vect[2];
    iVar61 = bx_1.bigend.vect[1];
    iVar60 = bx_1.bigend.vect[0];
    lVar31 = (long)bx_1.smallend.vect[0];
    lVar37 = (long)bx_1.smallend.vect[1];
    iVar41 = bx_1.smallend.vect[2] + -1;
    iVar36 = bx_1.smallend.vect[1] + -1;
    for (lVar56 = (long)bx_1.smallend.vect[2]; iVar55 = (int)lVar56, lVar87 = lVar37,
        iVar136 = iVar36, iVar55 <= iVar57; lVar56 = lVar56 + 1) {
      for (; iVar86 = (int)lVar87, lVar33 = lVar31 * 8, lVar109 = lVar31, iVar86 <= iVar61;
          lVar87 = lVar87 + 1) {
        while( true ) {
          iVar108 = (int)lVar109;
          if (iVar60 < iVar108) break;
          local_7d0._0_4_ = iVar108;
          local_7d0._4_4_ = iVar86;
          local_7d0._8_4_ = iVar55;
          bVar27 = Box::contains((Box *)&cn,(IntVect *)local_7d0);
          if (bVar27) {
            lVar42 = (lVar56 - rhs.super_BaseFab<double>.domain.bigend.vect[1]) *
                     (long)rhs.super_BaseFab<double>.dptr;
            lVar38 = (lVar87 - rhs.super_BaseFab<double>.domain.bigend.vect[0]) *
                     (long)rhs.super_BaseFab<double>.super_DataAllocator.m_arena;
            rhs.super_BaseFab<double>._vptr_BaseFab
            [(lVar42 + lVar38 + lVar109) - (long)rhs.super_BaseFab<double>.domain.smallend.vect[2]]
                 = u.super_BaseFab<double>._vptr_BaseFab
                   [((lVar56 - u.super_BaseFab<double>.domain.bigend.vect[1]) *
                     (long)u.super_BaseFab<double>.dptr +
                    (lVar87 - u.super_BaseFab<double>.domain.bigend.vect[0]) *
                    (long)u.super_BaseFab<double>.super_DataAllocator.m_arena + lVar109) -
                    (long)u.super_BaseFab<double>.domain.smallend.vect[2]];
            lVar43 = (long)sten.super_BaseFab<double>.domain.smallend.vect[2];
            lVar45 = (long)(~sten.super_BaseFab<double>.domain.bigend.vect[1] + iVar55) *
                     (long)sten.super_BaseFab<double>.dptr;
            lVar62 = (long)(~sten.super_BaseFab<double>.domain.smallend.vect[2] + iVar108) * 4 +
                     (long)(~sten.super_BaseFab<double>.domain.bigend.vect[0] + iVar86) *
                     (long)sten.super_BaseFab<double>.super_DataAllocator.m_arena * 4;
            if ((((*(int *)((long)sten.super_BaseFab<double>._vptr_BaseFab + lVar45 * 4 + lVar62) ==
                   0) && (*(int *)((long)sten.super_BaseFab<double>._vptr_BaseFab +
                                  lVar109 * 4 +
                                  (long)(iVar41 - sten.super_BaseFab<double>.domain.bigend.vect[1])
                                  * (long)sten.super_BaseFab<double>.dptr * 4 +
                                  (long)(iVar136 - sten.super_BaseFab<double>.domain.bigend.vect[0])
                                  * (long)sten.super_BaseFab<double>.super_DataAllocator.m_arena * 4
                                  + lVar43 * -4) == 0)) &&
                (lVar73 = (long)(~sten.super_BaseFab<double>.domain.smallend.vect[2] + iVar108) * 4
                          + (long)(iVar86 - sten.super_BaseFab<double>.domain.bigend.vect[0]) *
                            (long)sten.super_BaseFab<double>.super_DataAllocator.m_arena * 4,
                *(int *)((long)sten.super_BaseFab<double>._vptr_BaseFab + lVar45 * 4 + lVar73) == 0)
                ) && (((lVar45 = (lVar87 - sten.super_BaseFab<double>.domain.bigend.vect[0]) *
                                 (long)sten.super_BaseFab<double>.super_DataAllocator.m_arena,
                       *(int *)((long)sten.super_BaseFab<double>._vptr_BaseFab +
                               lVar109 * 4 +
                               (long)(iVar41 - sten.super_BaseFab<double>.domain.bigend.vect[1]) *
                               (long)sten.super_BaseFab<double>.dptr * 4 + lVar45 * 4 + lVar43 * -4)
                       == 0 && (lVar79 = (long)(iVar55 - sten.super_BaseFab<double>.domain.bigend.
                                                         vect[1]) *
                                         (long)sten.super_BaseFab<double>.dptr,
                               *(int *)((long)sten.super_BaseFab<double>._vptr_BaseFab +
                                       lVar79 * 4 + lVar62) == 0)) &&
                      ((lVar62 = (long)sten.super_BaseFab<double>.dptr *
                                 (lVar56 - sten.super_BaseFab<double>.domain.bigend.vect[1]),
                       *(int *)((long)sten.super_BaseFab<double>._vptr_BaseFab +
                               lVar109 * 4 +
                               (long)sten.super_BaseFab<double>.super_DataAllocator.m_arena *
                               (long)(iVar136 - sten.super_BaseFab<double>.domain.bigend.vect[0]) *
                               4 + lVar62 * 4 + lVar43 * -4) == 0 &&
                       ((*(int *)((long)sten.super_BaseFab<double>._vptr_BaseFab +
                                 lVar79 * 4 + lVar73) == 0 &&
                        (*(int *)((long)sten.super_BaseFab<double>._vptr_BaseFab +
                                 lVar109 * 4 + lVar45 * 4 + lVar62 * 4 + lVar43 * -4) == 0)))))))) {
              pp_Var32 = (_func_int **)
                         ((long)rhs.super_BaseFab<double>._vptr_BaseFab +
                         lVar33 + lVar38 * 8 + lVar42 * 8 +
                                  (long)rhs.super_BaseFab<double>.domain.smallend.vect[2] * -8);
              goto LAB_005205d8;
            }
          }
          else {
            pp_Var32 = rhs.super_BaseFab<double>._vptr_BaseFab +
                       ((long)iVar86 - (long)rhs.super_BaseFab<double>.domain.bigend.vect[0]) *
                       (long)rhs.super_BaseFab<double>.super_DataAllocator.m_arena +
                       ((long)iVar108 - (long)rhs.super_BaseFab<double>.domain.smallend.vect[2]) +
                       ((long)iVar55 - (long)rhs.super_BaseFab<double>.domain.bigend.vect[1]) *
                       (long)rhs.super_BaseFab<double>.dptr;
LAB_005205d8:
            *pp_Var32 = (_func_int *)0x0;
          }
          lVar109 = lVar109 + 1;
          lVar33 = lVar33 + 8;
        }
        iVar136 = iVar136 + 1;
      }
      iVar41 = iVar41 + 1;
    }
    MFIter::operator++(&mfi_1);
  }
  MFIter::~MFIter(&mfi_1);
  bx.smallend.vect._0_8_ = *(undefined8 *)(local_9a0->smallend).vect;
  uVar125 = *(undefined8 *)((local_9a0->smallend).vect + 2);
  bx.bigend.vect[1] = (int)((ulong)*(undefined8 *)(local_9a0->bigend).vect >> 0x20);
  bx._20_8_ = *(undefined8 *)((local_9a0->bigend).vect + 2);
  bx.smallend.vect[2] = (int)uVar125;
  bx.bigend.vect[0] = (int)((ulong)uVar125 >> 0x20);
  for (lVar31 = 0; lVar31 != 3; lVar31 = lVar31 + 1) {
    if ((bx.btype.itype >> ((uint)lVar31 & 0x1f) & 1) == 0) {
      piVar80 = bx.bigend.vect + lVar31;
      *piVar80 = *piVar80 + 1;
    }
  }
  bx.btype.itype = 7;
  dVar5 = (this_00->super_CoordSys).inv_dx[0];
  dVar6 = (this_00->super_CoordSys).inv_dx[1];
  dVar7 = (this_00->super_CoordSys).inv_dx[2];
  puVar24 = *(undefined8 **)
             &(((this->m_sigma).
                super_vector<amrex::Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>_>_>
                .
                super__Vector_base<amrex::Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->
              super_vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>
              ).
              super__Vector_base<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>
  ;
  local_750 = (FabArray<amrex::IArrayBox> *)
              **(undefined8 **)
                &(((this->super_MLNodeLinOp).m_dirichlet_mask.
                   super_vector<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                   .
                   super__Vector_base<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->
                 super_vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                 ).
                 super__Vector_base<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
  ;
  lVar31 = **(long **)&(((this->super_MLNodeLinOp).super_MLLinOp.m_factory.
                         super_vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                         .
                         super__Vector_base<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super_vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
                       ).
                       super__Vector_base<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
  ;
  if ((lVar31 == 0) ||
     (this_03 = (EBFArrayBoxFactory *)
                __dynamic_cast(lVar31,&FabFactory<amrex::FArrayBox>::typeinfo,
                               &EBFArrayBoxFactory::typeinfo,0),
     this_03 == (EBFArrayBoxFactory *)0x0)) {
    local_b10._M_head_impl =
         *(MultiFab **)
          &(((this->m_integral).
             super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
             .
             super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->_M_t).
           super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>;
    local_b5c = (undefined4)CONCAT71(SUB87(local_b10._M_head_impl,1),1);
    local_9a8 = (FabArray<amrex::EBCellFlagFab> *)0x0;
    local_b18 = (FabArray<amrex::FArrayBox> *)0x0;
  }
  else {
    local_9a8 = EBFArrayBoxFactory::getMultiEBCellFlagFab(this_03);
    local_b10._M_head_impl =
         *(MultiFab **)
          &(((this->m_integral).
             super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
             .
             super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->_M_t).
           super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>;
    local_b18 = &EBFArrayBoxFactory::getVolFrac(this_03)->super_FabArray<amrex::FArrayBox>;
    local_b5c = 0;
  }
  local_414.num_streams = Gpu::Device::max_gpu_streams;
  local_414.do_tiling = true;
  local_414.tilesize.vect[0] = (int)FabArrayBase::mfiter_tile_size;
  local_414.tilesize.vect[1] = FabArrayBase::mfiter_tile_size._4_4_;
  local_414.tilesize.vect[2] = DAT_006ddef0;
  local_414.dynamic = true;
  local_414.device_sync = true;
  FArrayBox::FArrayBox(&rhs);
  FArrayBox::FArrayBox(&u);
  FArrayBox::FArrayBox(&sten);
  FArrayBox::FArrayBox(&cn);
  MFIter::MFIter(&mfi_1,(FabArrayBase *)sync_resid,&local_414);
  dVar137 = dVar5 * 0.027777777777777776 * dVar5;
  dVar145 = dVar6 * 0.027777777777777776 * dVar6;
  dVar128 = dVar7 * 0.027777777777777776 * dVar7;
  dVar148 = dVar145 + dVar145;
  dVar116 = dVar137 * 4.0;
  dVar150 = dVar145 * 4.0;
  dVar155 = dVar137 * -2.0;
  dVar117 = dVar137 + dVar145 + dVar128;
  dVar153 = dVar128 + dVar128;
  dVar138 = dVar137 + dVar137;
  dVar139 = -dVar148;
  dVar140 = dVar128 * 4.0;
  dVar154 = -dVar153;
  dVar8 = *(double *)(&DAT_00620bb0 + (ulong)(((int)local_b68 - 0x66U & 0xfffffffb) == 0) * 8);
  do {
    if (mfi_1.endIndex <= mfi_1.currentIndex) {
      MFIter::~MFIter(&mfi_1);
      BaseFab<double>::~BaseFab(&cn.super_BaseFab<double>);
      BaseFab<double>::~BaseFab(&sten.super_BaseFab<double>);
      BaseFab<double>::~BaseFab(&u.super_BaseFab<double>);
      BaseFab<double>::~BaseFab(&rhs.super_BaseFab<double>);
      MultiFab::~MultiFab(&phi);
      iMultiFab::~iMultiFab(&crse_cc_mask);
      BoxArray::~BoxArray(&local_400);
      BoxArray::~BoxArray(&local_398);
      return;
    }
    MFIter::tilebox(&local_e38,&mfi_1);
    FVar28 = regular;
    if ((char)local_b5c == '\0') {
      piVar80 = &mfi_1.currentIndex;
      if (mfi_1.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
        piVar80 = ((mfi_1.local_index_map)->super_vector<int,_std::allocator<int>_>).
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start + mfi_1.currentIndex;
      }
      this_01 = (local_9a8->m_fabs_v).
                super__Vector_base<amrex::EBCellFlagFab_*,_std::allocator<amrex::EBCellFlagFab_*>_>.
                _M_impl.super__Vector_impl_data._M_start[*piVar80];
      bx_1.bigend.vect[1] = local_e38.bigend.vect[1];
      bx_1.bigend.vect[2] = local_e38.bigend.vect[2];
      bx_1.smallend.vect[1] = local_e38.smallend.vect[1];
      bx_1.smallend.vect[0] = local_e38.smallend.vect[0];
      bx_1.smallend.vect[2] = local_e38.smallend.vect[2];
      bx_1.bigend.vect[0] = local_e38.bigend.vect[0];
      for (lVar31 = 0; lVar31 != 3; lVar31 = lVar31 + 1) {
        if ((local_e38.btype.itype >> ((uint)lVar31 & 0x1f) & 1) != 0) {
          piVar80 = bx_1.bigend.vect + lVar31;
          *piVar80 = *piVar80 + -1;
        }
      }
      bx_1.btype.itype = 0;
      FVar28 = EBCellFlagFab::getType(this_01,&bx_1);
      if (FVar28 != covered) goto LAB_00520b31;
    }
    else {
LAB_00520b31:
      bx_2.smallend.vect[0] = local_e38.smallend.vect[0] + -1;
      bx_2.smallend.vect[1] = local_e38.smallend.vect[1] + -1;
      bx_2.smallend.vect[2] = local_e38.smallend.vect[2] + -1;
      bx_2.bigend.vect[0] = local_e38.bigend.vect[0] + 1;
      bx_2.bigend.vect[1] = local_e38.bigend.vect[1] + 1;
      bx_2.bigend.vect[2] = local_e38.bigend.vect[2] + 1;
      for (lVar31 = 0; lVar31 != 3; lVar31 = lVar31 + 1) {
        if ((local_e38.btype.itype >> ((uint)lVar31 & 0x1f) & 1) != 0) {
          piVar80 = bx_2.bigend.vect + lVar31;
          *piVar80 = *piVar80 + -1;
        }
      }
      bx_2.btype.itype = 0;
      FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>
                ((Array4<const_int> *)&bx_1,&crse_cc_mask.super_FabArray<amrex::IArrayBox>,&mfi_1);
      lVar31 = (long)bx_2.smallend.vect[2];
      piVar80 = (int *)((lVar31 - (int)local_c60) *
                        CONCAT44(bx_1.bigend.vect[2],bx_1.bigend.vect[1]) * 4 +
                        ((long)bx_2.smallend.vect[1] - (long)(int)local_c64) *
                        CONCAT44(bx_1.bigend.vect[0],bx_1.smallend.vect[2]) * 4 +
                        (long)bx_2.smallend.vect[0] * 4 + (long)local_c68 * -4 +
                       bx_1.smallend.vect._0_8_);
      for (; piVar46 = piVar80, lVar37 = (long)bx_2.smallend.vect[1], lVar31 <= bx_2.bigend.vect[2];
          lVar31 = lVar31 + 1) {
        for (; lVar56 = (long)bx_2.smallend.vect[0], piVar110 = piVar46,
            lVar37 <= bx_2.bigend.vect[1]; lVar37 = lVar37 + 1) {
          while (lVar56 <= bx_2.bigend.vect[0]) {
            iVar41 = *piVar110;
            lVar56 = lVar56 + 1;
            piVar110 = piVar110 + 1;
            if (iVar41 == 0) {
              MFIter::validbox((Box *)local_7d0,&mfi_1);
              bx_3.smallend.vect[1] = local_7d0._4_4_;
              bx_3.smallend.vect[0] = local_7d0._0_4_;
              bx_3.bigend.vect[2] = local_7d0._20_4_;
              bx_3.bigend.vect[1] = local_7d0._16_4_;
              bx_3.smallend.vect[2] = local_7d0._8_4_;
              bx_3.bigend.vect[0] = local_7d0._12_4_;
              for (lVar31 = 0; lVar31 != 3; lVar31 = lVar31 + 1) {
                if (((uint)local_7d0._24_4_ >> ((uint)lVar31 & 0x1f) & 1) != 0) {
                  piVar80 = bx_3.bigend.vect + lVar31;
                  *piVar80 = *piVar80 + -1;
                }
              }
              bx_3.btype.itype = 0;
              FArrayBox::resize((FArrayBox *)&u.super_BaseFab<double>,&bx_2,3,(Arena *)0x0);
              BaseFab<double>::elixir<double,_0>(&ueli,&u.super_BaseFab<double>);
              iVar61 = u.super_BaseFab<double>.domain.smallend.vect[2];
              iVar60 = u.super_BaseFab<double>.domain.smallend.vect[1];
              iVar41 = u.super_BaseFab<double>.domain.smallend.vect[0];
              pdVar26 = u.super_BaseFab<double>.dptr;
              lVar87 = (long)u.super_BaseFab<double>.domain.smallend.vect[0];
              lVar33 = (long)u.super_BaseFab<double>.domain.smallend.vect[1];
              lVar56 = (long)u.super_BaseFab<double>.domain.smallend.vect[2];
              lVar31 = (long)((u.super_BaseFab<double>.domain.bigend.vect[1] -
                              u.super_BaseFab<double>.domain.smallend.vect[1]) + 1);
              lVar37 = (long)((u.super_BaseFab<double>.domain.bigend.vect[2] -
                              u.super_BaseFab<double>.domain.smallend.vect[2]) + 1);
              uVar141 = CONCAT44(-(uint)(bx_3.smallend.vect[1] < bx_2.smallend.vect[1]),
                                 -(uint)(bx_3.smallend.vect[0] < bx_2.smallend.vect[0]));
              uVar141 = ~uVar141 & bx_3.smallend.vect._0_8_ |
                        CONCAT44(bx_2.smallend.vect[1],bx_2.smallend.vect[0]) & uVar141;
              lhs.smallend.vect[0] = (int)uVar141;
              lhs.smallend.vect[1] = (int)(uVar141 >> 0x20);
              lhs.smallend.vect[2] = bx_3.smallend.vect[2];
              if (bx_3.smallend.vect[2] < bx_2.smallend.vect[2]) {
                lhs.smallend.vect[2] = bx_2.smallend.vect[2];
              }
              uVar141 = CONCAT44(-(uint)(bx_2.bigend.vect[1] < bx_3.bigend.vect[1]),
                                 -(uint)(bx_2.bigend.vect[0] < bx_3.bigend.vect[0]));
              uVar141 = ~uVar141 & CONCAT44(bx_3.bigend.vect[1],bx_3.bigend.vect[0]) |
                        CONCAT44(bx_2.bigend.vect[1],bx_2.bigend.vect[0]) & uVar141;
              lhs.bigend.vect[0] = (int)uVar141;
              lhs.bigend.vect[1] = (int)(uVar141 >> 0x20);
              lhs.bigend.vect[2] = bx_3.bigend.vect[2];
              if (bx_2.bigend.vect[2] < bx_3.bigend.vect[2]) {
                lhs.bigend.vect[2] = bx_2.bigend.vect[2];
              }
              lhs.btype.itype = bx_2.btype.itype;
              paVar21 = (this->super_MLNodeLinOp).super_MLLinOp.m_lobc.
                        super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                        .
                        super__Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              paVar22 = (this->super_MLNodeLinOp).super_MLLinOp.m_hibc.
                        super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                        .
                        super__Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              for (lVar109 = 0; lVar109 != 0xc; lVar109 = lVar109 + 4) {
                if ((*(int *)((long)paVar21->_M_elems + lVar109) == 0x6a) &&
                   (iVar57 = *(int *)((long)lhs.smallend.vect + lVar109),
                   iVar57 == *(int *)((long)(local_9a0->smallend).vect + lVar109))) {
                  *(int *)((long)lhs.smallend.vect + lVar109) = iVar57 + -1;
                }
                if ((*(int *)((long)paVar22->_M_elems + lVar109) == 0x6a) &&
                   (iVar57 = *(int *)((long)lhs.bigend.vect + lVar109),
                   iVar57 == *(int *)((long)(local_9a0->bigend).vect + lVar109))) {
                  *(int *)((long)lhs.bigend.vect + lVar109) = iVar57 + 1;
                }
              }
              lVar100 = (long)((u.super_BaseFab<double>.domain.bigend.vect[0] -
                               u.super_BaseFab<double>.domain.smallend.vect[0]) + 1);
              lVar111 = lVar31 * lVar100;
              lVar88 = lVar111 * lVar37;
              FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                        ((Array4<const_double> *)local_7d0,local_748,&mfi_1);
              iVar57 = bx_2.smallend.vect[0];
              lVar66 = (long)bx_2.smallend.vect[1];
              lVar92 = (long)bx_2.smallend.vect[2];
              lVar42 = (long)bx_2.bigend.vect[0];
              lVar43 = (long)bx_2.bigend.vect[1];
              lVar45 = (long)bx_2.bigend.vect[2];
              lVar70 = (long)bx_2.smallend.vect[0];
              lVar73 = (lVar66 * 8 + (lVar92 - lVar56) * lVar31 * 8 + lVar33 * -8) * lVar100 +
                       lVar70 * 8 + lVar87 * -8 + (long)pdVar26;
              lVar109 = lVar37 * 8;
              lVar79 = ((lVar109 + lVar92 * 8 + lVar56 * -8) * lVar31 + lVar66 * 8 + lVar33 * -8) *
                       lVar100 + lVar70 * 8 + lVar87 * -8 + (long)pdVar26;
              lVar62 = lVar111 * 8;
              lVar38 = lVar100 * 8;
              for (; lVar92 <= lVar45; lVar92 = lVar92 + 1) {
                lVar47 = lVar73;
                local_1018 = lVar79;
                for (lVar101 = lVar66; lVar101 <= lVar43; lVar101 = lVar101 + 1) {
                  lVar112 = lVar70;
                  for (lVar89 = 0; lVar70 + lVar89 <= lVar42; lVar89 = lVar89 + 1) {
                    local_b58.p._0_4_ = iVar57 + (int)lVar89;
                    local_b58.p._4_4_ = (undefined4)lVar101;
                    local_b58.jstride._0_4_ = (undefined4)lVar92;
                    bVar27 = Box::contains(&lhs,(IntVect *)&local_b58);
                    if ((bVar27) &&
                       (*(int *)((lVar101 - (int)local_c64) *
                                 CONCAT44(bx_1.bigend.vect[0],bx_1.smallend.vect[2]) * 4 +
                                 (lVar92 - (int)local_c60) *
                                 CONCAT44(bx_1.bigend.vect[2],bx_1.bigend.vect[1]) * 4 +
                                 (long)local_c68 * -4 + bx_1.smallend.vect._0_8_ + lVar70 * 4 +
                                lVar89 * 4) != 0)) {
                      lVar34 = (long)local_7b0;
                      lVar35 = (lVar101 - local_7ac) * CONCAT44(local_7d0._12_4_,local_7d0._8_4_) *
                               8 + (lVar92 - local_7a8) *
                                   CONCAT44(local_7d0._20_4_,local_7d0._16_4_) * 8;
                      lVar58 = CONCAT44(local_7d0._4_4_,local_7d0._0_4_) + lVar70 * 8;
                      lVar39 = (lVar70 - lVar87) + lVar89;
                      *(undefined8 *)(lVar47 + lVar89 * 8) =
                           *(undefined8 *)(lVar35 + lVar34 * -8 + lVar58 + lVar89 * 8);
                      *(undefined8 *)(local_1018 + lVar89 * 8) =
                           *(undefined8 *)
                            (lVar35 + CONCAT44(uStack_7b4,local_7d0._24_4_) * 8 + lVar34 * -8 +
                             lVar58 + lVar89 * 8);
                      dVar124 = *(double *)
                                 (CONCAT44(uStack_7b4,local_7d0._24_4_) * 0x10 + lVar35 +
                                  lVar34 * -8 + lVar58 + lVar89 * 8);
                    }
                    else {
                      lVar39 = lVar112 - lVar87;
                      *(undefined8 *)(lVar47 + lVar89 * 8) = 0;
                      *(undefined8 *)(local_1018 + lVar89 * 8) = 0;
                      dVar124 = 0.0;
                    }
                    pdVar26[(lVar92 - lVar56) * lVar111 +
                            (lVar101 - lVar33) * lVar100 + lVar88 * 2 + lVar39] = dVar124;
                    lVar112 = lVar112 + 1;
                  }
                  lVar47 = lVar47 + lVar38;
                  local_1018 = local_1018 + lVar38;
                }
                lVar73 = lVar73 + lVar62;
                lVar79 = lVar79 + lVar62;
              }
              FArrayBox::resize((FArrayBox *)&rhs.super_BaseFab<double>,&local_e38,1,(Arena *)0x0);
              BaseFab<double>::elixir<double,_0>(&rhseli,&rhs.super_BaseFab<double>);
              pdVar76 = rhs.super_BaseFab<double>.dptr;
              lVar42 = (long)rhs.super_BaseFab<double>.domain.smallend.vect[0];
              lVar43 = (long)rhs.super_BaseFab<double>.domain.smallend.vect[1];
              lVar79 = (long)rhs.super_BaseFab<double>.domain.smallend.vect[2];
              lVar73 = (long)((rhs.super_BaseFab<double>.domain.bigend.vect[0] -
                              rhs.super_BaseFab<double>.domain.smallend.vect[0]) + 1);
              lVar45 = (long)((rhs.super_BaseFab<double>.domain.bigend.vect[1] -
                              rhs.super_BaseFab<double>.domain.smallend.vect[1]) + 1);
              FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>
                        (&local_b58,local_750,&mfi_1);
              local_ce8 = (int)(uVar25 >> 0x20);
              local_d80 = (int)(uVar23 >> 0x20);
              iVar57 = (int)uVar23;
              local_ba0 = lVar45;
              local_b08 = lVar42;
              local_b00 = lVar79;
              local_af8 = lVar43;
              if (FVar28 == singlevalued) {
                FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                          (&local_a08,local_b18,&mfi_1);
                FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                          (&local_980,&(local_b10._M_head_impl)->super_FabArray<amrex::FArrayBox>,
                           &mfi_1);
                lVar88 = (long)local_e38.smallend.vect[0];
                local_b98 = (long)local_e38.smallend.vect[1];
                lVar70 = (long)local_e38.smallend.vect[2];
                lVar66 = local_b98 * 8;
                local_d08 = (lVar66 + (lVar70 - lVar79) * lVar45 * 8 + lVar43 * -8) * lVar73 +
                            lVar88 * 8 + lVar42 * -8 + (long)pdVar76;
                local_ae0 = lVar45 * lVar73 * 8;
                local_cb8 = lVar70 + -1;
                lVar43 = lVar37 * 0x10 + lVar70 * 8 + lVar56 * -8;
                lVar42 = (lVar43 + -8) * lVar31 + local_b98 * 8 + lVar33 * -8;
                local_d10 = (lVar42 + -8) * lVar100 + lVar88 * 8 + lVar87 * -8 + (long)pdVar26;
                lVar79 = local_b98 * 8 + ((lVar37 + lVar70) * 8 + lVar56 * -8 + -8) * lVar31 +
                         lVar33 * -8;
                local_d18 = (lVar79 + -8) * lVar100 + lVar88 * 8 + lVar87 * -8 + (long)pdVar26;
                lVar45 = lVar66 + (local_cb8 - lVar56) * lVar31 * 8 + lVar33 * -8;
                local_d20 = (lVar45 + -8) * lVar100 + lVar88 * 8 + lVar87 * -8 + (long)pdVar26;
                lVar43 = lVar43 * lVar31 + local_b98 * 8 + lVar33 * -8;
                local_d28 = (lVar43 + -8) * lVar100 + lVar88 * 8 + lVar87 * -8 + (long)pdVar26;
                lVar109 = (lVar109 + lVar70 * 8 + lVar56 * -8) * lVar31 + local_b98 * 8 +
                          lVar33 * -8;
                local_d30 = (lVar109 + -8) * lVar100 + lVar88 * 8 + lVar87 * -8 + (long)pdVar26;
                lVar37 = lVar66 + (lVar70 - lVar56) * lVar31 * 8 + lVar33 * -8;
                local_d38 = (lVar37 + -8) * lVar100 + lVar88 * 8 + lVar87 * -8 + (long)pdVar26;
                local_d40 = lVar42 * lVar100 + lVar88 * 8 + lVar87 * -8 + (long)pdVar26;
                local_d48 = lVar79 * lVar100 + lVar88 * 8 + lVar87 * -8 + (long)pdVar26;
                local_b78 = lVar45 * lVar100 + lVar88 * 8 + lVar87 * -8 + (long)pdVar26;
                local_b80 = lVar43 * lVar100 + lVar88 * 8 + lVar87 * -8 + (long)pdVar26;
                local_b88 = lVar109 * lVar100 + lVar88 * 8 + lVar87 * -8 + (long)pdVar26;
                local_b90 = lVar37 * lVar100 + lVar88 * 8 + lVar87 * -8 + (long)pdVar26;
                local_b70 = (long)local_e38.bigend.vect[1];
                local_ad8 = (long)local_e38.bigend.vect[2];
                lVar37 = lVar88 * 8;
                local_ad0 = lVar73 * 8;
                local_ae8 = local_b98 + -1;
                for (; lVar70 <= local_ad8; lVar70 = lVar70 + 1) {
                  local_eb8 = local_b90;
                  local_ec0 = (double *)local_b88;
                  local_ef0 = (double *)local_b80;
                  local_ef8 = local_b78;
                  local_ec8 = local_d48;
                  local_f30 = (undefined8 *)local_d40;
                  local_e78 = local_d38;
                  local_f88 = local_d30;
                  local_f98 = local_d28;
                  local_e80 = local_d20;
                  local_e88 = local_d18;
                  local_dd8 = local_d10;
                  local_1020 = local_d08;
                  lVar42 = local_ae8;
                  for (lVar109 = local_b98; lVar109 <= local_b70; lVar109 = lVar109 + 1) {
                    lVar35 = (long)local_980.begin.x;
                    lVar93 = (local_cb8 - local_980.begin.z) * local_980.kstride * 8;
                    lVar34 = CONCAT44(local_980.jstride._4_4_,(undefined4)local_980.jstride) * 8;
                    lVar89 = (lVar42 - local_980.begin.y) * lVar34;
                    lVar43 = lVar89 + lVar93;
                    lVar67 = local_980.nstride * 0x30;
                    lVar58 = local_980.nstride * 0x38;
                    lVar45 = (lVar70 - local_980.begin.z) * local_980.kstride * 8;
                    lVar89 = lVar89 + lVar45;
                    lVar34 = (lVar109 - local_980.begin.y) * lVar34;
                    lVar93 = lVar93 + lVar34;
                    lVar34 = lVar34 + lVar45;
                    lVar74 = local_980.nstride * 0x40;
                    lVar71 = local_980.nstride * 0x10;
                    lVar39 = CONCAT44(local_980.p._4_4_,local_980.p._0_4_) + lVar37;
                    lVar45 = lVar67 + lVar43 + lVar35 * -8 + lVar39;
                    lVar79 = lVar43 + lVar58 + lVar35 * -8 + lVar39;
                    lVar48 = lVar43 + lVar35 * -8 + lVar39;
                    lVar66 = lVar43 + lVar74 + lVar35 * -8 + lVar39;
                    lVar92 = lVar43 + lVar71 + lVar35 * -8 + lVar39;
                    lVar43 = lVar43 + local_980.nstride * 8 + lVar35 * -8 + lVar39;
                    lVar47 = lVar89 + lVar67 + lVar35 * -8 + lVar39;
                    lVar113 = lVar89 + lVar58 + lVar35 * -8 + lVar39;
                    lVar101 = lVar89 + lVar35 * -8 + lVar39;
                    lVar68 = lVar89 + lVar74 + lVar35 * -8 + lVar39;
                    lVar112 = lVar89 + lVar71 + lVar35 * -8 + lVar39;
                    lVar89 = lVar89 + local_980.nstride * 8 + lVar35 * -8 + lVar39;
                    lVar63 = lVar67 + lVar93 + lVar35 * -8 + lVar39;
                    lVar64 = lVar58 + lVar93 + lVar35 * -8 + lVar39;
                    lVar94 = lVar93 + lVar35 * -8 + lVar39;
                    lVar59 = lVar74 + lVar93 + lVar35 * -8 + lVar39;
                    lVar44 = lVar71 + lVar93 + lVar35 * -8 + lVar39;
                    lVar90 = local_980.nstride * 8 + lVar93 + lVar35 * -8 + lVar39;
                    lVar102 = lVar67 + lVar34 + lVar35 * -8 + lVar39;
                    lVar81 = lVar58 + lVar34 + lVar35 * -8 + lVar39;
                    lVar93 = lVar34 + lVar35 * -8 + lVar39;
                    lVar74 = lVar74 + lVar34 + lVar35 * -8 + lVar39;
                    lVar71 = lVar71 + lVar34 + lVar35 * -8 + lVar39;
                    lVar39 = local_980.nstride * 8 + lVar34 + lVar35 * -8 + lVar39;
                    lVar58 = (local_cb8 - local_a08.begin.z) * local_a08.kstride * 8;
                    lVar82 = (lVar70 - local_a08.begin.z) * local_a08.kstride * 8;
                    lVar34 = (lVar42 - local_a08.begin.y) * local_a08.jstride * 8;
                    lVar67 = (lVar109 - local_a08.begin.y) * local_a08.jstride * 8;
                    lVar83 = (long)local_a08.begin.x;
                    lVar35 = lVar58 + lVar34 + lVar83 * -8 + lVar37;
                    lVar34 = lVar34 + lVar82 + lVar83 * -8 + lVar37;
                    lVar58 = lVar58 + lVar67 + lVar83 * -8 + lVar37;
                    lVar67 = lVar67 + lVar82 + lVar83 * -8 + lVar37;
                    for (lVar82 = 0; lVar88 + lVar82 <= (long)local_e38.bigend.vect[0];
                        lVar82 = lVar82 + 1) {
                      dVar124 = 0.0;
                      if (*(int *)((lVar109 - local_b58.begin.y) *
                                   CONCAT44(local_b58.jstride._4_4_,(undefined4)local_b58.jstride) *
                                   4 + (lVar70 - local_b58.begin.z) * local_b58.kstride * 4 +
                                   (long)local_b58.begin.x * -4 +
                                   CONCAT44(local_b58.p._4_4_,(int)local_b58.p) + lVar88 * 4 +
                                  lVar82 * 4) == 0) {
                        dVar124 = 1.0;
                        if (iVar57 == 0x66) {
                          dVar134 = 1.0;
                          if (bx.smallend.vect[0] - lVar88 == lVar82) {
LAB_00521c78:
                            dVar134 = 0.0;
                          }
                        }
                        else {
                          dVar134 = 1.0;
                          if (iVar57 == 0x6a && bx.smallend.vect[0] - lVar88 == lVar82)
                          goto LAB_00521c78;
                        }
                        dVar142 = 1.0;
                        if ((((int)local_b68 == 0x66) || ((int)local_b68 == 0x6a)) &&
                           (dVar142 = 1.0, bx.bigend.vect[0] - lVar88 == lVar82)) {
                          dVar142 = 0.0;
                        }
                        if (local_d80 == 0x66) {
                          dVar146 = dVar124;
                          if (lVar109 == bx.smallend.vect[1]) {
LAB_00521cf0:
                            dVar146 = 0.0;
                          }
                        }
                        else {
                          dVar146 = 1.0;
                          if (lVar109 == bx.smallend.vect[1] && uVar23 >> 0x20 == 0x6a)
                          goto LAB_00521cf0;
                        }
                        dVar149 = 1.0;
                        if (local_ce8 == 0x66) {
                          if (lVar109 == bx.bigend.vect[1]) {
LAB_00521d1b:
                            dVar149 = 0.0;
                          }
                        }
                        else if (lVar109 == bx.bigend.vect[1] && uVar30 == 0x6a) goto LAB_00521d1b;
                        if (LVar19 == Neumann) {
                          dVar147 = dVar124;
                          if (lVar70 == bx.smallend.vect[2]) {
LAB_00521d4f:
                            dVar147 = 0.0;
                          }
                        }
                        else {
                          dVar147 = 1.0;
                          if (lVar70 == bx.smallend.vect[2] && LVar19 == inflow) goto LAB_00521d4f;
                        }
                        if (LVar20 == Neumann) {
                          if (lVar70 == bx.bigend.vect[2]) {
LAB_00521d8b:
                            dVar124 = 0.0;
                          }
                        }
                        else {
                          dVar124 = 1.0;
                          if (lVar70 == bx.bigend.vect[2] && LVar20 == inflow) goto LAB_00521d8b;
                        }
                        dVar9 = *(double *)(lVar89 + -8 + lVar82 * 8);
                        dVar118 = *(double *)(lVar89 + lVar82 * 8);
                        dVar127 = *(double *)((long)local_a08.p + lVar82 * 8 + lVar34 + -8);
                        dVar135 = *(double *)((long)local_a08.p + lVar82 * 8 + lVar34);
                        dVar129 = *(double *)(lVar112 + -8 + lVar82 * 8);
                        dVar129 = dVar129 + dVar129;
                        dVar130 = *(double *)(lVar112 + lVar82 * 8);
                        dVar118 = dVar118 + dVar118;
                        dVar130 = dVar130 + dVar130;
                        dVar119 = *(double *)(lVar39 + -8 + lVar82 * 8);
                        dVar10 = *(double *)((long)local_a08.p + lVar82 * 8 + lVar67 + -8);
                        dVar119 = dVar119 + dVar119;
                        dVar160 = *(double *)(lVar93 + -8 + lVar82 * 8);
                        dVar151 = dVar160 + dVar160 + dVar10;
                        dVar160 = *(double *)(lVar71 + -8 + lVar82 * 8);
                        dVar160 = dVar160 + dVar160;
                        dVar120 = *(double *)(lVar39 + lVar82 * 8) * -2.0;
                        dVar11 = *(double *)((long)local_a08.p + lVar82 * 8 + lVar67);
                        dVar143 = *(double *)(lVar71 + lVar82 * 8) * -2.0;
                        dVar121 = *(double *)(lVar43 + -8 + lVar82 * 8) * -2.0;
                        dVar12 = *(double *)((long)local_a08.p + lVar82 * 8 + lVar35 + -8);
                        dVar131 = *(double *)(lVar92 + -8 + lVar82 * 8) * -2.0;
                        dVar122 = *(double *)(lVar43 + lVar82 * 8);
                        dVar122 = dVar122 + dVar122;
                        dVar123 = *(double *)(lVar48 + lVar82 * 8);
                        dVar13 = *(double *)((long)local_a08.p + lVar82 * 8 + lVar35);
                        dVar152 = (dVar123 + dVar123) - dVar13;
                        dVar123 = *(double *)(lVar92 + lVar82 * 8);
                        dVar123 = dVar123 + dVar123;
                        dVar132 = *(double *)(lVar90 + -8 + lVar82 * 8);
                        dVar132 = dVar132 + dVar132;
                        dVar14 = *(double *)(lVar94 + -8 + lVar82 * 8);
                        dVar15 = *(double *)((long)local_a08.p + lVar82 * 8 + lVar58 + -8);
                        dVar133 = *(double *)(lVar44 + -8 + lVar82 * 8);
                        dVar133 = dVar133 + dVar133;
                        dVar144 = *(double *)(lVar90 + lVar82 * 8);
                        dVar144 = dVar144 + dVar144;
                        dVar159 = *(double *)(lVar94 + lVar82 * 8);
                        dVar159 = dVar159 + dVar159;
                        dVar16 = *(double *)((long)local_a08.p + lVar82 * 8 + lVar58);
                        dVar158 = *(double *)(lVar44 + lVar82 * 8);
                        dVar158 = dVar158 + dVar158;
                        dVar17 = *(double *)(lVar101 + -8 + lVar82 * 8);
                        dVar156 = *(double *)(lVar101 + lVar82 * 8);
                        dVar156 = dVar156 + dVar156;
                        dVar157 = *(double *)(lVar93 + lVar82 * 8);
                        dVar161 = dVar11 - (dVar157 + dVar157);
                        dVar157 = *(double *)(lVar48 + -8 + lVar82 * 8) * -2.0 - dVar12;
                        dVar124 = ((*(double *)(lVar63 + lVar82 * 8) * -4.0 +
                                   (dVar159 - dVar16) + dVar144) *
                                   *(double *)((long)local_f30 + lVar82 * 8) * dVar142 * dVar149 +
                                  (*(double *)(lVar63 + -8 + lVar82 * 8) * 4.0 +
                                  (dVar14 * -2.0 - dVar15) + dVar132) *
                                  *(double *)((long)local_f30 + -8 + lVar82 * 8) * dVar134 * dVar149
                                  + (*(double *)(lVar45 + lVar82 * 8) * 4.0 + (dVar152 - dVar122)) *
                                    *(double *)(local_dd8 + lVar82 * 8) * dVar142 * dVar146 +
                                    (*(double *)(lVar45 + -8 + lVar82 * 8) * -4.0 +
                                    dVar157 + dVar121) * *(double *)(local_dd8 + -8 + lVar82 * 8) *
                                    dVar134 * dVar146 +
                                    (*(double *)(lVar102 + lVar82 * 8) * 4.0 + dVar161 + dVar120) *
                                    *(double *)((long)local_ef0 + lVar82 * 8) * dVar142 * dVar149 +
                                    (*(double *)(lVar102 + -8 + lVar82 * 8) * -4.0 +
                                    (dVar151 - dVar119)) *
                                    *(double *)((long)local_ef0 + -8 + lVar82 * 8) * dVar134 *
                                    dVar149 + (*(double *)(lVar47 + -8 + lVar82 * 8) * 4.0 +
                                              dVar9 + dVar9 + dVar17 + dVar17 + dVar127) *
                                              *(double *)(local_f98 + -8 + lVar82 * 8) * dVar134 *
                                              dVar146 + (*(double *)(lVar47 + lVar82 * 8) * -4.0 +
                                                        (dVar135 - dVar156) + dVar118) *
                                                        *(double *)(local_f98 + lVar82 * 8) *
                                                        dVar142 * dVar146) * dVar7 * 0.25 +
                                  ((*(double *)(lVar59 + lVar82 * 8) * -4.0 +
                                   (dVar16 - dVar144) + dVar158) *
                                   *(double *)(local_ef8 + lVar82 * 8) * dVar149 * dVar147 +
                                  (*(double *)(lVar59 + -8 + lVar82 * 8) * 4.0 +
                                  ((dVar132 - dVar15) - dVar133)) *
                                  *(double *)(local_ef8 + -8 + lVar82 * 8) * dVar149 * dVar147 +
                                  (*(double *)(lVar66 + lVar82 * 8) * 4.0 +
                                  dVar122 + dVar13 + dVar123) * *(double *)(local_e80 + lVar82 * 8)
                                  * dVar146 * dVar147 +
                                  (*(double *)(lVar66 + -8 + lVar82 * 8) * -4.0 +
                                  (dVar121 - dVar12) + dVar131) *
                                  *(double *)(local_e80 + -8 + lVar82 * 8) * dVar146 * dVar147 +
                                  (*(double *)(lVar74 + lVar82 * 8) * 4.0 +
                                  dVar120 + dVar11 + dVar143) * *(double *)(local_eb8 + lVar82 * 8)
                                  * dVar149 * dVar124 +
                                  (*(double *)(lVar74 + -8 + lVar82 * 8) * -4.0 +
                                  (dVar119 - dVar10) + dVar160) *
                                  *(double *)(local_eb8 + -8 + lVar82 * 8) * dVar149 * dVar124 +
                                  (*(double *)(lVar68 + -8 + lVar82 * 8) * 4.0 +
                                  (dVar9 * -2.0 - dVar127) + dVar129) *
                                  *(double *)(local_e78 + -8 + lVar82 * 8) * dVar146 * dVar124 +
                                  (*(double *)(lVar68 + lVar82 * 8) * -4.0 +
                                  ((dVar118 + dVar135) - dVar130)) *
                                  *(double *)(local_e78 + lVar82 * 8) * dVar146 * dVar124) *
                                  dVar5 * 0.25 +
                                  ((*(double *)(lVar64 + lVar82 * 8) * -4.0 +
                                   (dVar16 - dVar159) + dVar158) *
                                   *(double *)(local_ec8 + lVar82 * 8) * dVar142 * dVar147 +
                                  (*(double *)(lVar64 + -8 + lVar82 * 8) * 4.0 +
                                  dVar14 + dVar14 + dVar15 + dVar133) *
                                  *(double *)(local_ec8 + -8 + lVar82 * 8) * dVar134 * dVar147 +
                                  (*(double *)(lVar79 + lVar82 * 8) * 4.0 + (dVar152 - dVar123)) *
                                  *(double *)(local_e88 + lVar82 * 8) * dVar142 * dVar147 +
                                  (*(double *)(lVar79 + -8 + lVar82 * 8) * -4.0 + dVar131 + dVar157)
                                  * *(double *)(local_e88 + -8 + lVar82 * 8) * dVar134 * dVar147 +
                                  (*(double *)(lVar81 + lVar82 * 8) * 4.0 + dVar143 + dVar161) *
                                  *(double *)((long)local_ec0 + lVar82 * 8) * dVar142 * dVar124 +
                                  (*(double *)(lVar81 + -8 + lVar82 * 8) * -4.0 +
                                  (dVar151 - dVar160)) *
                                  *(double *)((long)local_ec0 + -8 + lVar82 * 8) * dVar134 * dVar124
                                  + (*(double *)(lVar113 + -8 + lVar82 * 8) * 4.0 +
                                    (dVar17 * -2.0 - dVar127) + dVar129) *
                                    *(double *)(local_f88 + -8 + lVar82 * 8) * dVar134 * dVar124 +
                                    (*(double *)(lVar113 + lVar82 * 8) * -4.0 +
                                    (dVar156 - dVar135) + dVar130) *
                                    *(double *)(local_f88 + lVar82 * 8) * dVar142 * dVar124) *
                                  dVar6 * 0.25;
                      }
                      *(double *)(local_1020 + lVar82 * 8) = dVar124;
                    }
                    local_1020 = local_1020 + local_ad0;
                    lVar42 = lVar42 + 1;
                    local_dd8 = local_dd8 + lVar38;
                    local_e88 = local_e88 + lVar38;
                    local_e80 = local_e80 + lVar38;
                    local_f98 = local_f98 + lVar38;
                    local_f88 = local_f88 + lVar38;
                    local_e78 = local_e78 + lVar38;
                    local_f30 = (undefined8 *)((long)local_f30 + lVar38);
                    local_ec8 = local_ec8 + lVar38;
                    local_ef8 = local_ef8 + lVar38;
                    local_ef0 = (double *)((long)local_ef0 + lVar38);
                    local_ec0 = (double *)((long)local_ec0 + lVar38);
                    local_eb8 = local_eb8 + lVar38;
                  }
                  local_d08 = local_d08 + local_ae0;
                  local_cb8 = local_cb8 + 1;
                  local_d10 = local_d10 + lVar62;
                  local_d18 = local_d18 + lVar62;
                  local_d20 = local_d20 + lVar62;
                  local_d28 = local_d28 + lVar62;
                  local_d30 = local_d30 + lVar62;
                  local_d38 = local_d38 + lVar62;
                  local_d40 = local_d40 + lVar62;
                  local_d48 = local_d48 + lVar62;
                  local_b78 = local_b78 + lVar62;
                  local_b80 = local_b80 + lVar62;
                  local_b88 = local_b88 + lVar62;
                  local_b90 = local_b90 + lVar62;
                }
              }
              else {
                lVar92 = (long)local_e38.smallend.vect[0];
                lVar47 = (long)local_e38.smallend.vect[1];
                lVar70 = (long)local_e38.smallend.vect[2];
                uVar29 = ~iVar60;
                uVar78 = ~iVar61;
                lVar66 = lVar47 * 8;
                local_ef0 = (double *)
                            ((lVar66 + (lVar70 - lVar79) * lVar45 * 8 + lVar43 * -8) * lVar73 +
                             lVar92 * 8 + lVar42 * -8 + (long)pdVar76);
                pdVar49 = pdVar26 + (lVar92 - lVar87);
                lVar43 = (lVar37 * 0x10 + lVar70 * 8 + lVar56 * -8) * lVar31;
                lVar79 = (lVar109 + lVar70 * 8 + lVar56 * -8) * lVar31;
                lVar42 = (lVar70 - lVar56) * lVar31;
                local_ef8 = (lVar43 + lVar47 * 8 + lVar33 * -8) * lVar100 + lVar92 * 8 + lVar87 * -8
                            + (long)pdVar26;
                local_ec8 = (lVar79 + lVar47 * 8 + lVar33 * -8) * lVar100 + lVar92 * 8 + lVar87 * -8
                            + (long)pdVar26;
                local_f30 = (undefined8 *)
                            ((lVar66 + lVar42 * 8 + lVar33 * -8) * lVar100 + lVar92 * 8 +
                             lVar87 * -8 + (long)pdVar26);
                lVar66 = lVar66 + lVar33 * -8;
                iVar36 = uVar78 + local_e38.smallend.vect[2];
                local_f50 = pdVar49;
                for (; lVar70 <= local_e38.bigend.vect[2]; lVar70 = lVar70 + 1) {
                  lVar39 = (long)iVar36;
                  lVar89 = (lVar37 * 0x10 + lVar39 * 8) * lVar31;
                  lVar35 = (lVar109 + lVar39 * 8) * lVar31;
                  lVar39 = lVar39 * lVar31 * 8;
                  local_1030 = (double *)((lVar66 + lVar89) * lVar100 + (long)pdVar49);
                  local_1010 = (double *)((lVar35 + lVar66) * lVar100 + (long)pdVar49);
                  local_fc8 = (double *)((lVar66 + lVar39) * lVar100 + (long)pdVar49);
                  lVar58 = (int)(uVar78 + (int)lVar70) * lVar111;
                  lVar112 = (lVar70 - lVar56) * lVar111;
                  lVar34 = CONCAT44(local_b58.jstride._4_4_,(undefined4)local_b58.jstride) * 4;
                  lVar67 = (lVar47 - local_b58.begin.y) * lVar34 +
                           (lVar70 - local_b58.begin.z) * local_b58.kstride * 4 +
                           (long)local_b58.begin.x * -4 +
                           CONCAT44(local_b58.p._4_4_,(int)local_b58.p) + lVar92 * 4;
                  local_fa8 = (long)local_f30;
                  local_fb0 = local_ec8;
                  local_ff0 = local_ef8;
                  pdVar97 = local_ef0;
                  iVar136 = uVar29 + local_e38.smallend.vect[1];
                  for (lVar101 = lVar47; lVar101 <= local_e38.bigend.vect[1]; lVar101 = lVar101 + 1)
                  {
                    if (local_e38.smallend.vect[0] <= local_e38.bigend.vect[0]) {
                      lVar44 = (long)iVar136;
                      lVar48 = (int)(uVar29 + (int)lVar101) * lVar100;
                      lVar93 = (lVar101 - lVar33) * lVar100;
                      lVar59 = 0;
                      do {
                        dVar124 = 0.0;
                        if (*(int *)(lVar67 + lVar59 * 4) == 0) {
                          if (iVar57 == 0x66) {
                            dVar124 = 1.0;
                            if (bx.smallend.vect[0] - lVar92 == lVar59) {
LAB_00522d30:
                              dVar124 = 0.0;
                            }
                          }
                          else {
                            dVar124 = 1.0;
                            if (iVar57 == 0x6a && bx.smallend.vect[0] - lVar92 == lVar59)
                            goto LAB_00522d30;
                          }
                          dVar134 = 1.0;
                          if ((((int)local_b68 == 0x66) || ((int)local_b68 == 0x6a)) &&
                             (dVar134 = 1.0, bx.bigend.vect[0] - lVar92 == lVar59)) {
                            dVar134 = 0.0;
                          }
                          if (local_d80 == 0x66) {
                            dVar142 = 1.0;
                            if (lVar101 == bx.smallend.vect[1]) {
LAB_00522da0:
                              dVar142 = 0.0;
                            }
                          }
                          else {
                            dVar142 = 1.0;
                            if (lVar101 == bx.smallend.vect[1] && uVar23 >> 0x20 == 0x6a)
                            goto LAB_00522da0;
                          }
                          if (local_ce8 == 0x66) {
                            dVar146 = 1.0;
                            if (lVar101 == bx.bigend.vect[1]) {
LAB_00522dc9:
                              dVar146 = 0.0;
                            }
                          }
                          else {
                            dVar146 = 1.0;
                            if (lVar101 == bx.bigend.vect[1] && uVar30 == 0x6a) goto LAB_00522dc9;
                          }
                          if (LVar19 == Neumann) {
                            dVar149 = 1.0;
                            if (lVar70 == bx.smallend.vect[2]) {
LAB_00522dfd:
                              dVar149 = 0.0;
                            }
                          }
                          else {
                            dVar149 = 1.0;
                            if (lVar70 == bx.smallend.vect[2] && LVar19 == inflow)
                            goto LAB_00522dfd;
                          }
                          dVar147 = 1.0;
                          if (LVar20 == Neumann) {
                            if (lVar70 == bx.bigend.vect[2]) {
LAB_00522e34:
                              dVar147 = 0.0;
                            }
                          }
                          else if (lVar70 == bx.bigend.vect[2] && LVar20 == inflow)
                          goto LAB_00522e34;
                          lVar63 = (long)(~iVar41 + local_e38.smallend.vect[0] + (int)lVar59);
                          pdVar103 = pdVar26 + lVar48 + lVar63 + lVar58;
                          pdVar1 = pdVar26 + lVar93 + lVar63 + lVar58;
                          pdVar2 = pdVar26 + lVar48 + lVar63 + lVar112;
                          pdVar3 = pdVar26 + lVar93 + lVar63 + lVar112;
                          dVar124 = (dVar134 * *(double *)(local_ff0 + lVar59 * 8) * dVar146 +
                                    dVar124 * pdVar3[lVar88 * 2] * dVar146 +
                                    *(double *)
                                     ((long)local_f50 + lVar59 * 8 + (lVar43 + lVar44 * 8) * lVar100
                                     ) * dVar134 * dVar142 +
                                    pdVar2[lVar88 * 2] * dVar124 * dVar142 +
                                    (((-pdVar103[lVar88 * 2] * dVar124 * dVar142 -
                                      *(double *)
                                       ((long)pdVar49 + lVar59 * 8 + (lVar89 + lVar44 * 8) * lVar100
                                       ) * dVar134 * dVar142) -
                                     pdVar1[lVar88 * 2] * dVar124 * dVar146) -
                                    local_1030[lVar59] * dVar134 * dVar146)) * dVar7 * 0.25 +
                                    (*(double *)(local_fa8 + lVar59 * 8) * dVar146 * dVar147 +
                                    ((*(double *)
                                       ((long)local_f50 +
                                       lVar59 * 8 + (lVar42 * 8 + lVar44 * 8) * lVar100) * dVar142 *
                                      dVar147 +
                                     ((local_fc8[lVar59] * dVar146 * dVar149 +
                                      ((*(double *)
                                         ((long)pdVar49 +
                                         lVar59 * 8 + (lVar39 + lVar44 * 8) * lVar100) * dVar142 *
                                        dVar149 - *pdVar103 * dVar142 * dVar149) -
                                      *pdVar1 * dVar146 * dVar149)) - *pdVar2 * dVar142 * dVar147))
                                    - *pdVar3 * dVar146 * dVar147)) * dVar5 * 0.25 +
                                    (*(double *)(local_fb0 + lVar59 * 8) * dVar134 * dVar147 +
                                    pdVar3[lVar88] * dVar124 * dVar147 +
                                    (((local_1010[lVar59] * dVar134 * dVar149 +
                                      pdVar1[lVar88] * dVar124 * dVar149 +
                                      (-pdVar103[lVar88] * dVar124 * dVar149 -
                                      *(double *)
                                       ((long)pdVar49 + lVar59 * 8 + (lVar35 + lVar44 * 8) * lVar100
                                       ) * dVar134 * dVar149)) - pdVar2[lVar88] * dVar124 * dVar147)
                                    - *(double *)
                                       ((long)local_f50 +
                                       lVar59 * 8 + (lVar79 + lVar44 * 8) * lVar100) * dVar134 *
                                      dVar147)) * dVar6 * 0.25;
                        }
                        *(double *)((long)pdVar97 + lVar59 * 8) = dVar124;
                        lVar59 = lVar59 + 1;
                      } while ((local_e38.bigend.vect[0] - local_e38.smallend.vect[0]) + 1 !=
                               (int)lVar59);
                    }
                    pdVar97 = (double *)((long)pdVar97 + lVar73 * 8);
                    lVar67 = lVar67 + lVar34;
                    iVar136 = iVar136 + 1;
                    local_ff0 = local_ff0 + lVar38;
                    local_fb0 = local_fb0 + lVar38;
                    local_fa8 = local_fa8 + lVar38;
                    local_1030 = local_1030 + lVar100;
                    local_1010 = local_1010 + lVar100;
                    local_fc8 = local_fc8 + lVar100;
                  }
                  local_ef0 = (double *)((long)local_ef0 + lVar45 * lVar73 * 8);
                  local_f50 = local_f50 + lVar111;
                  iVar36 = iVar36 + 1;
                  local_ef8 = local_ef8 + lVar62;
                  local_ec8 = local_ec8 + lVar62;
                  local_f30 = (undefined8 *)((long)local_f30 + lVar62);
                }
              }
              if (rhcc != (MultiFab *)0x0) {
                FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                          (&local_a08,&rhcc->super_FabArray<amrex::FArrayBox>,&mfi_1);
                lhs_1.btype = bx_2.btype;
                uVar141 = CONCAT44(-(uint)(bx_3.smallend.vect[1] < bx_2.smallend.vect[1]),
                                   -(uint)(bx_3.smallend.vect[0] < bx_2.smallend.vect[0]));
                lhs_1.smallend.vect._0_8_ =
                     ~uVar141 & bx_3.smallend.vect._0_8_ |
                     CONCAT44(bx_2.smallend.vect[1],bx_2.smallend.vect[0]) & uVar141;
                lhs_1.smallend.vect[2] = bx_3.smallend.vect[2];
                if (bx_3.smallend.vect[2] < bx_2.smallend.vect[2]) {
                  lhs_1.smallend.vect[2] = bx_2.smallend.vect[2];
                }
                uVar141 = CONCAT44(-(uint)(bx_2.bigend.vect[1] < bx_3.bigend.vect[1]),
                                   -(uint)(bx_2.bigend.vect[0] < bx_3.bigend.vect[0]));
                uVar141 = ~uVar141 & CONCAT44(bx_3.bigend.vect[1],bx_3.bigend.vect[0]) |
                          CONCAT44(bx_2.bigend.vect[1],bx_2.bigend.vect[0]) & uVar141;
                lhs_1.bigend.vect[0] = (int)uVar141;
                lhs_1.bigend.vect[1] = (int)(uVar141 >> 0x20);
                lhs_1.bigend.vect[2] = bx_3.bigend.vect[2];
                if (bx_2.bigend.vect[2] < bx_3.bigend.vect[2]) {
                  lhs_1.bigend.vect[2] = bx_2.bigend.vect[2];
                }
                lVar43 = (long)bx_2.smallend.vect[0];
                lVar42 = (long)bx_2.smallend.vect[1];
                lVar79 = (long)bx_2.smallend.vect[2];
                lVar45 = (long)bx_2.bigend.vect[0];
                lVar37 = (long)bx_2.bigend.vect[1];
                lVar109 = (long)bx_2.bigend.vect[2];
                pdVar49 = (double *)
                          ((lVar42 * 8 + (lVar79 - lVar56) * lVar31 * 8 + lVar33 * -8) * lVar100 +
                           lVar43 * 8 + lVar87 * -8 + (long)pdVar26);
                for (; pdVar97 = pdVar49, lVar66 = lVar42, lVar79 <= lVar109; lVar79 = lVar79 + 1) {
                  for (; lVar70 = lVar43, pdVar103 = pdVar97, lVar66 <= lVar37; lVar66 = lVar66 + 1)
                  {
                    for (; lVar70 <= lVar45; lVar70 = lVar70 + 1) {
                      local_980.p._0_4_ = (undefined4)lVar70;
                      local_980.p._4_4_ = (undefined4)lVar66;
                      local_980.jstride._0_4_ = (undefined4)lVar79;
                      bVar27 = Box::contains(&lhs_1,(IntVect *)&local_980);
                      if ((bVar27) &&
                         (*(int *)((lVar66 - (int)local_c64) *
                                   CONCAT44(bx_1.bigend.vect[0],bx_1.smallend.vect[2]) * 4 +
                                   (lVar79 - (int)local_c60) *
                                   CONCAT44(bx_1.bigend.vect[2],bx_1.bigend.vect[1]) * 4 +
                                   (long)local_c68 * -4 + bx_1.smallend.vect._0_8_ + lVar70 * 4) !=
                          0)) {
                        dVar124 = local_a08.p
                                  [((lVar79 - local_a08.begin.z) * local_a08.kstride +
                                   (lVar66 - local_a08.begin.y) * local_a08.jstride + lVar70) -
                                   (long)local_a08.begin.x];
                      }
                      else {
                        dVar124 = 0.0;
                      }
                      *pdVar103 = dVar124;
                      pdVar103 = pdVar103 + 1;
                    }
                    pdVar97 = pdVar97 + lVar100;
                  }
                  pdVar49 = pdVar49 + lVar111;
                }
                if (FVar28 == singlevalued) {
                  FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                            (&local_980,local_b18,&mfi_1);
                  FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                            ((Array4<const_double> *)&bx_6,
                             &(local_b10._M_head_impl)->super_FabArray<amrex::FArrayBox>,&mfi_1);
                  lVar45 = (long)local_e38.smallend.vect[0];
                  lVar109 = (long)local_e38.smallend.vect[1];
                  lVar66 = (long)local_e38.smallend.vect[2];
                  local_f18 = lVar66 + -1;
                  lVar37 = lVar109 * 8;
                  lVar42 = lVar37 + (local_f18 - lVar56) * lVar31 * 8 + lVar33 * -8;
                  lVar88 = lVar42 * lVar100 + lVar45 * 8 + lVar87 * -8 + (long)pdVar26;
                  lVar43 = lVar37 + (lVar66 - lVar56) * lVar31 * 8 + lVar33 * -8;
                  lVar79 = lVar43 * lVar100 + lVar45 * 8 + lVar87 * -8 + (long)pdVar26;
                  lVar70 = (lVar42 + -8) * lVar100 + lVar45 * 8 + lVar87 * -8 + (long)pdVar26;
                  lVar42 = (lVar43 + -8) * lVar100 + lVar45 * 8 + lVar87 * -8 + (long)pdVar26;
                  lVar37 = (lVar37 + (lVar66 - local_b00) * local_ba0 * 8 + local_af8 * -8) * lVar73
                           + lVar45 * 8 + local_b08 * -8 + (long)pdVar76;
                  for (; lVar43 = lVar109, lVar92 = lVar37, lVar47 = lVar109 + -1,
                      local_fd8 = lVar88, local_f80 = lVar79, local_f78 = lVar70, local_f38 = lVar42
                      , lVar66 <= local_e38.bigend.vect[2]; lVar66 = lVar66 + 1) {
                    for (; lVar43 <= local_e38.bigend.vect[1]; lVar43 = lVar43 + 1) {
                      lVar68 = (long)local_a28;
                      lVar64 = CONCAT44(uStack_a2c,bx_6.btype.itype);
                      lVar112 = CONCAT44(bx_6.bigend.vect[2],bx_6.bigend.vect[1]) * 8;
                      lVar90 = (local_f18 - local_a20) * lVar112;
                      lVar82 = CONCAT44(bx_6.bigend.vect[0],bx_6.smallend.vect[2]) * 8;
                      lVar59 = (lVar43 - local_a24) * lVar82;
                      lVar101 = lVar90 + lVar59;
                      lVar74 = lVar64 * 0x90;
                      lVar81 = lVar64 * 0x38;
                      lVar94 = lVar64 * 0x30;
                      lVar112 = (lVar66 - local_a20) * lVar112;
                      lVar59 = lVar59 + lVar112;
                      lVar82 = (lVar47 - local_a24) * lVar82;
                      lVar90 = lVar90 + lVar82;
                      lVar82 = lVar82 + lVar112;
                      lVar114 = lVar64 * 0x40;
                      lVar102 = lVar64 * 0x10;
                      lVar71 = bx_6.smallend.vect._0_8_ + lVar45 * 8;
                      lVar112 = lVar74 + lVar101 + lVar68 * -8 + lVar71;
                      lVar89 = lVar114 + lVar101 + lVar68 * -8 + lVar71;
                      lVar39 = lVar81 + lVar101 + lVar68 * -8 + lVar71;
                      lVar35 = lVar101 + lVar94 + lVar68 * -8 + lVar71;
                      lVar34 = lVar102 + lVar101 + lVar68 * -8 + lVar71;
                      lVar58 = lVar64 * 8 + lVar101 + lVar68 * -8 + lVar71;
                      lVar101 = lVar101 + lVar68 * -8 + lVar71;
                      lVar67 = lVar59 + lVar74 + lVar68 * -8 + lVar71;
                      lVar44 = lVar59 + lVar114 + lVar68 * -8 + lVar71;
                      lVar48 = lVar59 + lVar81 + lVar68 * -8 + lVar71;
                      lVar84 = lVar59 + lVar94 + lVar68 * -8 + lVar71;
                      lVar75 = lVar59 + lVar102 + lVar68 * -8 + lVar71;
                      lVar93 = lVar59 + lVar64 * 8 + lVar68 * -8 + lVar71;
                      lVar59 = lVar59 + lVar68 * -8 + lVar71;
                      lVar72 = lVar90 + lVar74 + lVar68 * -8 + lVar71;
                      lVar69 = lVar114 + lVar90 + lVar68 * -8 + lVar71;
                      lVar65 = lVar81 + lVar90 + lVar68 * -8 + lVar71;
                      lVar113 = lVar94 + lVar90 + lVar68 * -8 + lVar71;
                      lVar83 = lVar102 + lVar90 + lVar68 * -8 + lVar71;
                      lVar63 = lVar90 + lVar64 * 8 + lVar68 * -8 + lVar71;
                      lVar95 = lVar90 + lVar68 * -8 + lVar71;
                      lVar90 = lVar74 + lVar82 + lVar68 * -8 + lVar71;
                      lVar115 = lVar114 + lVar82 + lVar68 * -8 + lVar71;
                      lVar91 = lVar81 + lVar82 + lVar68 * -8 + lVar71;
                      lVar104 = lVar94 + lVar82 + lVar68 * -8 + lVar71;
                      lVar94 = lVar102 + lVar82 + lVar68 * -8 + lVar71;
                      lVar64 = lVar82 + lVar64 * 8 + lVar68 * -8 + lVar71;
                      lVar71 = lVar82 + lVar68 * -8 + lVar71;
                      lVar82 = (local_f18 - local_980.begin.z) * local_980.kstride * 8;
                      lVar68 = (lVar66 - local_980.begin.z) * local_980.kstride * 8;
                      lVar102 = CONCAT44(local_980.jstride._4_4_,(undefined4)local_980.jstride) * 8;
                      lVar114 = (lVar43 - local_980.begin.y) * lVar102;
                      lVar102 = (lVar47 - local_980.begin.y) * lVar102;
                      lVar74 = (long)local_980.begin.x;
                      lVar81 = CONCAT44(local_980.p._4_4_,local_980.p._0_4_) + lVar45 * 8;
                      lVar96 = lVar82 + lVar114 + lVar74 * -8 + lVar81;
                      lVar114 = lVar114 + lVar68 + lVar74 * -8 + lVar81;
                      lVar82 = lVar82 + lVar102 + lVar74 * -8 + lVar81;
                      lVar81 = lVar102 + lVar68 + lVar74 * -8 + lVar81;
                      for (lVar68 = 0; lVar45 + lVar68 <= (long)local_e38.bigend.vect[0];
                          lVar68 = lVar68 + 1) {
                        dVar124 = 0.0;
                        if (*(int *)((lVar43 - local_b58.begin.y) *
                                     CONCAT44(local_b58.jstride._4_4_,(undefined4)local_b58.jstride)
                                     * 4 + (lVar66 - local_b58.begin.z) * local_b58.kstride * 4 +
                                     (long)local_b58.begin.x * -4 +
                                     CONCAT44(local_b58.p._4_4_,(int)local_b58.p) + lVar45 * 4 +
                                    lVar68 * 4) == 0) {
                          dVar124 = ((*(double *)(lVar113 + -8 + lVar68 * 8) +
                                      *(double *)(lVar65 + -8 + lVar68 * 8) +
                                     *(double *)(lVar69 + -8 + lVar68 * 8)) * 0.5 +
                                     *(double *)(lVar82 + -8 + lVar68 * 8) * 0.125 +
                                     (*(double *)(lVar95 + -8 + lVar68 * 8) +
                                      *(double *)(lVar63 + -8 + lVar68 * 8) +
                                     *(double *)(lVar83 + -8 + lVar68 * 8)) * 0.25 +
                                    *(double *)(lVar72 + -8 + lVar68 * 8)) *
                                    *(double *)(local_f78 + -8 + lVar68 * 8) +
                                    ((((-*(double *)(lVar113 + lVar68 * 8) -
                                       *(double *)(lVar65 + lVar68 * 8)) +
                                      *(double *)(lVar69 + lVar68 * 8)) * 0.5 +
                                     *(double *)(lVar82 + lVar68 * 8) * 0.125 +
                                     ((*(double *)(lVar63 + lVar68 * 8) -
                                      *(double *)(lVar95 + lVar68 * 8)) +
                                     *(double *)(lVar83 + lVar68 * 8)) * 0.25) -
                                    *(double *)(lVar72 + lVar68 * 8)) *
                                    *(double *)(local_f78 + lVar68 * 8) +
                                    ((((*(double *)(lVar39 + -8 + lVar68 * 8) -
                                       *(double *)(lVar35 + -8 + lVar68 * 8)) -
                                      *(double *)(lVar89 + -8 + lVar68 * 8)) * 0.5 +
                                     *(double *)(lVar96 + -8 + lVar68 * 8) * 0.125 +
                                     ((*(double *)(lVar101 + -8 + lVar68 * 8) -
                                      *(double *)(lVar58 + -8 + lVar68 * 8)) +
                                     *(double *)(lVar34 + -8 + lVar68 * 8)) * 0.25) -
                                    *(double *)(lVar112 + -8 + lVar68 * 8)) *
                                    *(double *)(local_fd8 + -8 + lVar68 * 8) +
                                    (((*(double *)(lVar35 + lVar68 * 8) -
                                      *(double *)(lVar39 + lVar68 * 8)) -
                                     *(double *)(lVar89 + lVar68 * 8)) * 0.5 +
                                     *(double *)(lVar96 + lVar68 * 8) * 0.125 +
                                     ((-*(double *)(lVar101 + lVar68 * 8) -
                                      *(double *)(lVar58 + lVar68 * 8)) +
                                     *(double *)(lVar34 + lVar68 * 8)) * 0.25 +
                                    *(double *)(lVar112 + lVar68 * 8)) *
                                    *(double *)(local_fd8 + lVar68 * 8) +
                                    ((((*(double *)(lVar104 + -8 + lVar68 * 8) -
                                       *(double *)(lVar91 + -8 + lVar68 * 8)) -
                                      *(double *)(lVar115 + -8 + lVar68 * 8)) * 0.5 +
                                     *(double *)(lVar81 + -8 + lVar68 * 8) * 0.125 +
                                     ((*(double *)(lVar71 + -8 + lVar68 * 8) +
                                      *(double *)(lVar64 + -8 + lVar68 * 8)) -
                                     *(double *)(lVar94 + -8 + lVar68 * 8)) * 0.25) -
                                    *(double *)(lVar90 + -8 + lVar68 * 8)) *
                                    *(double *)(local_f38 + -8 + lVar68 * 8) +
                                    (((*(double *)(lVar91 + lVar68 * 8) -
                                      *(double *)(lVar104 + lVar68 * 8)) -
                                     *(double *)(lVar115 + lVar68 * 8)) * 0.5 +
                                     *(double *)(lVar81 + lVar68 * 8) * 0.125 +
                                     ((*(double *)(lVar64 + lVar68 * 8) -
                                      *(double *)(lVar71 + lVar68 * 8)) -
                                     *(double *)(lVar94 + lVar68 * 8)) * 0.25 +
                                    *(double *)(lVar90 + lVar68 * 8)) *
                                    *(double *)(local_f38 + lVar68 * 8) +
                                    (((*(double *)(lVar84 + lVar68 * 8) +
                                       *(double *)(lVar48 + lVar68 * 8) +
                                      *(double *)(lVar44 + lVar68 * 8)) * 0.5 +
                                     *(double *)(lVar114 + lVar68 * 8) * 0.125 +
                                     ((-*(double *)(lVar59 + lVar68 * 8) -
                                      *(double *)(lVar93 + lVar68 * 8)) -
                                     *(double *)(lVar75 + lVar68 * 8)) * 0.25) -
                                    *(double *)(lVar67 + lVar68 * 8)) *
                                    *(double *)(local_f80 + lVar68 * 8) +
                                    (((-*(double *)(lVar84 + -8 + lVar68 * 8) -
                                      *(double *)(lVar48 + -8 + lVar68 * 8)) +
                                     *(double *)(lVar44 + -8 + lVar68 * 8)) * 0.5 +
                                     *(double *)(lVar114 + -8 + lVar68 * 8) * 0.125 +
                                     ((*(double *)(lVar59 + -8 + lVar68 * 8) -
                                      *(double *)(lVar93 + -8 + lVar68 * 8)) -
                                     *(double *)(lVar75 + -8 + lVar68 * 8)) * 0.25 +
                                    *(double *)(lVar67 + -8 + lVar68 * 8)) *
                                    *(double *)(local_f80 + -8 + lVar68 * 8);
                        }
                        *(double *)(lVar92 + lVar68 * 8) =
                             dVar124 + *(double *)(lVar92 + lVar68 * 8);
                      }
                      lVar47 = lVar47 + 1;
                      local_fd8 = local_fd8 + lVar38;
                      local_f80 = local_f80 + lVar38;
                      local_f78 = local_f78 + lVar38;
                      local_f38 = local_f38 + lVar38;
                      lVar92 = lVar92 + lVar73 * 8;
                    }
                    local_f18 = local_f18 + 1;
                    lVar88 = lVar88 + lVar62;
                    lVar79 = lVar79 + lVar62;
                    lVar70 = lVar70 + lVar62;
                    lVar42 = lVar42 + lVar62;
                    lVar37 = lVar37 + local_ba0 * lVar73 * 8;
                  }
                }
                else {
                  lVar109 = (long)local_e38.smallend.vect[0];
                  lVar42 = (long)local_e38.smallend.vect[2];
                  uVar29 = ~iVar60;
                  uVar78 = ~iVar61;
                  pdVar49 = pdVar26 + (lVar109 - lVar87);
                  lVar79 = (lVar42 - lVar56) * lVar31;
                  lVar37 = (long)local_e38.smallend.vect[1] * 8;
                  lVar43 = (lVar37 + lVar79 * 8 + lVar33 * -8) * lVar100 + lVar109 * 8 + lVar87 * -8
                           + (long)pdVar26;
                  lVar45 = (lVar37 + (lVar42 - local_b00) * local_ba0 * 8 + local_af8 * -8) * lVar73
                           + lVar109 * 8 + local_b08 * -8 + (long)pdVar76;
                  iVar60 = uVar78 + local_e38.smallend.vect[2];
                  local_1010 = pdVar49;
                  for (; lVar42 <= local_e38.bigend.vect[2]; lVar42 = lVar42 + 1) {
                    lVar92 = (long)iVar60 * lVar31 * 8;
                    pdVar97 = (double *)((lVar37 + lVar33 * -8 + lVar92) * lVar100 + (long)pdVar49);
                    lVar101 = (int)(uVar78 + (int)lVar42) * lVar111;
                    lVar47 = (lVar42 - lVar56) * lVar111;
                    lVar66 = lVar43;
                    lVar88 = lVar45;
                    iVar61 = uVar29 + local_e38.smallend.vect[1];
                    for (lVar70 = (long)local_e38.smallend.vect[1];
                        lVar70 <= local_e38.bigend.vect[1]; lVar70 = lVar70 + 1) {
                      lVar39 = (int)((int)lVar70 + uVar29) * lVar100;
                      lVar112 = (lVar70 - lVar33) * lVar100;
                      for (lVar89 = 0; lVar109 + lVar89 <= (long)local_e38.bigend.vect[0];
                          lVar89 = lVar89 + 1) {
                        dVar124 = 0.0;
                        if (*(int *)((lVar70 - local_b58.begin.y) *
                                     CONCAT44(local_b58.jstride._4_4_,(undefined4)local_b58.jstride)
                                     * 4 + (lVar42 - local_b58.begin.z) * local_b58.kstride * 4 +
                                     (long)local_b58.begin.x * -4 +
                                     CONCAT44(local_b58.p._4_4_,(int)local_b58.p) + lVar109 * 4 +
                                    lVar89 * 4) == 0) {
                          lVar35 = (long)(~iVar41 + local_e38.smallend.vect[0] + (int)lVar89);
                          dVar124 = (pdVar26[lVar39 + lVar35 + lVar101] +
                                     *(double *)
                                      ((long)pdVar49 +
                                      lVar89 * 8 + (lVar92 + (long)iVar61 * 8) * lVar100) +
                                     pdVar26[lVar112 + lVar35 + lVar101] + pdVar97[lVar89] +
                                     pdVar26[lVar39 + lVar35 + lVar47] +
                                     *(double *)
                                      ((long)local_1010 +
                                      lVar89 * 8 + (lVar79 * 8 + (long)iVar61 * 8) * lVar100) +
                                     pdVar26[lVar112 + lVar35 + lVar47] +
                                    *(double *)(lVar66 + lVar89 * 8)) * 0.125;
                        }
                        *(double *)(lVar88 + lVar89 * 8) =
                             dVar124 + *(double *)(lVar88 + lVar89 * 8);
                      }
                      iVar61 = iVar61 + 1;
                      lVar66 = lVar66 + lVar38;
                      pdVar97 = pdVar97 + lVar100;
                      lVar88 = lVar88 + lVar73 * 8;
                    }
                    local_1010 = local_1010 + lVar111;
                    iVar60 = iVar60 + 1;
                    lVar43 = lVar43 + lVar62;
                    lVar45 = lVar45 + local_ba0 * lVar73 * 8;
                  }
                }
              }
              FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                        ((Array4<double> *)&local_a08,&sync_resid->super_FabArray<amrex::FArrayBox>,
                         &mfi_1);
              FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                        (&local_980,&phi.super_FabArray<amrex::FArrayBox>,&mfi_1);
              if (FVar28 == singlevalued) {
                FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                          ((Array4<const_double> *)&bx_6,(FabArray<amrex::FArrayBox> *)*puVar24,
                           &mfi_1);
                local_9c8.btype.itype = local_e38.btype.itype;
                local_9c8.bigend.vect[2] = local_e38.bigend.vect[2];
                local_9c8.bigend.vect[0] = local_e38.bigend.vect[0];
                local_9c8.bigend.vect[1] = local_e38.bigend.vect[1];
                lhs_1.smallend.vect[0] = local_e38.smallend.vect[0] + -1;
                lhs_1.smallend.vect[1] = local_e38.smallend.vect[1] + -1;
                lhs_1.smallend.vect[2] = local_e38.smallend.vect[2] + -1;
                lhs_1.bigend.vect[1] = local_e38.bigend.vect[1];
                lhs_1.bigend.vect[2] = local_e38.bigend.vect[2];
                lhs_1.bigend.vect[0] = local_e38.bigend.vect[0];
                for (lVar31 = 0; lVar31 != 3; lVar31 = lVar31 + 1) {
                  if ((local_e38.btype.itype >> ((uint)lVar31 & 0x1f) & 1) != 0) {
                    piVar80 = lhs_1.bigend.vect + lVar31;
                    *piVar80 = *piVar80 + -1;
                  }
                }
                lhs_1.btype.itype = 0;
                result.btype.itype = 0;
                result.smallend.vect[2] = local_e38.smallend.vect[2] + -2;
                result.bigend.vect[0] = lhs_1.bigend.vect[0] + 1;
                result.smallend.vect[1] = local_e38.smallend.vect[1] + -2;
                result.smallend.vect[0] = local_e38.smallend.vect[0] + -2;
                result.bigend.vect[1] = lhs_1.bigend.vect[1] + 1;
                result.bigend.vect[2] = lhs_1.bigend.vect[2] + 1;
                local_9c8.smallend.vect._0_8_ = lhs_1.smallend.vect._0_8_;
                local_9c8.smallend.vect[2] = lhs_1.smallend.vect[2];
                FArrayBox::resize((FArrayBox *)&sten.super_BaseFab<double>,&local_9c8,9,(Arena *)0x0
                                 );
                BaseFab<double>::elixir<double,_0>(&steneli,&sten.super_BaseFab<double>);
                iVar136 = sten.super_BaseFab<double>.domain.bigend.vect[2];
                iVar36 = sten.super_BaseFab<double>.domain.bigend.vect[1];
                iVar61 = sten.super_BaseFab<double>.domain.bigend.vect[0];
                iVar60 = sten.super_BaseFab<double>.domain.smallend.vect[1];
                iVar41 = sten.super_BaseFab<double>.domain.smallend.vect[0];
                local_d90 = sten.super_BaseFab<double>.dptr;
                lVar56 = (long)sten.super_BaseFab<double>.domain.smallend.vect[0];
                lVar45 = (long)sten.super_BaseFab<double>.domain.smallend.vect[1];
                local_990 = (long)sten.super_BaseFab<double>.domain.smallend.vect[2];
                FArrayBox::resize((FArrayBox *)&cn.super_BaseFab<double>,&result,0x1c,(Arena *)0x0);
                local_ad0 = (long)((iVar61 - iVar41) + 1);
                lVar31 = (long)((iVar36 - iVar60) + 1);
                lVar37 = (long)((iVar136 - (int)local_990) + 1);
                local_998 = lVar56;
                BaseFab<double>::elixir<double,_0>(&cneli,&cn.super_BaseFab<double>);
                iVar61 = cn.super_BaseFab<double>.domain.smallend.vect[2];
                iVar60 = cn.super_BaseFab<double>.domain.smallend.vect[1];
                iVar41 = cn.super_BaseFab<double>.domain.smallend.vect[0];
                pdVar26 = cn.super_BaseFab<double>.dptr;
                lVar38 = (long)cn.super_BaseFab<double>.domain.smallend.vect[0];
                lVar42 = (long)cn.super_BaseFab<double>.domain.smallend.vect[1];
                lVar43 = (long)cn.super_BaseFab<double>.domain.smallend.vect[2];
                lVar62 = (long)((cn.super_BaseFab<double>.domain.bigend.vect[0] -
                                cn.super_BaseFab<double>.domain.smallend.vect[0]) + 1);
                local_af0 = (long)((cn.super_BaseFab<double>.domain.bigend.vect[1] -
                                   cn.super_BaseFab<double>.domain.smallend.vect[1]) + 1);
                lVar33 = (long)((cn.super_BaseFab<double>.domain.bigend.vect[2] -
                                cn.super_BaseFab<double>.domain.smallend.vect[2]) + 1);
                lVar56 = local_af0 * lVar62;
                lVar109 = lVar33 * lVar56;
                FabArray<amrex::EBCellFlagFab>::const_array<amrex::EBCellFlagFab,_0>
                          ((Array4<const_amrex::EBCellFlag> *)&lhs_1,local_9a8,&mfi_1);
                FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                          ((Array4<const_double> *)local_be0,local_b18,&mfi_1);
                FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                          (&local_c20,&(local_b10._M_head_impl)->super_FabArray<amrex::FArrayBox>,
                           &mfi_1);
                MFIter::validbox(&local_44c,&mfi_1);
                bx_5.bigend.vect[1] = local_44c.bigend.vect[1];
                bx_5.bigend.vect[2] = local_44c.bigend.vect[2];
                bx_5.btype.itype = local_44c.btype.itype;
                bx_5.smallend.vect[0] = local_44c.smallend.vect[0];
                bx_5.smallend.vect[1] = local_44c.smallend.vect[1];
                bx_5.smallend.vect[2] = local_44c.smallend.vect[2];
                bx_5.bigend.vect[0] = local_44c.bigend.vect[0];
                for (lVar87 = 0; lVar87 != 3; lVar87 = lVar87 + 1) {
                  if ((bx_5.btype.itype >> ((uint)lVar87 & 0x1f) & 1) != 0) {
                    piVar80 = bx_5.bigend.vect + lVar87;
                    *piVar80 = *piVar80 + -1;
                  }
                }
                iVar136 = result.smallend.vect[0];
                iVar36 = result.smallend.vect[1];
                uVar141 = CONCAT44(-(uint)(local_44c.smallend.vect[1] < iVar36),
                                   -(uint)(local_44c.smallend.vect[0] < iVar136));
                lhs_2.smallend.vect._0_8_ =
                     ~uVar141 & local_44c.smallend.vect._0_8_ | result.smallend.vect._0_8_ & uVar141
                ;
                lhs_2.smallend.vect[2] = local_44c.smallend.vect[2];
                if (local_44c.smallend.vect[2] < result.smallend.vect[2]) {
                  lhs_2.smallend.vect[2] = result.smallend.vect[2];
                }
                uVar141 = CONCAT44(-(uint)(result.bigend.vect[1] < bx_5.bigend.vect[1]),
                                   -(uint)(result.bigend.vect[0] < bx_5.bigend.vect[0]));
                uVar141 = ~uVar141 & CONCAT44(bx_5.bigend.vect[1],bx_5.bigend.vect[0]) |
                          CONCAT44(result.bigend.vect[1],result.bigend.vect[0]) & uVar141;
                lhs_2.bigend.vect[0] = (int)uVar141;
                lhs_2.bigend.vect[1] = (int)(uVar141 >> 0x20);
                lhs_2.bigend.vect[2] = bx_5.bigend.vect[2];
                if (result.bigend.vect[2] < bx_5.bigend.vect[2]) {
                  lhs_2.bigend.vect[2] = result.bigend.vect[2];
                }
                lhs_2.btype.itype = result.btype.itype;
                lVar88 = (long)result.smallend.vect[2];
                lVar79 = (long)result.bigend.vect[0];
                lVar66 = (long)result.bigend.vect[1];
                lVar70 = (long)result.bigend.vect[2];
                local_b78 = lVar56 * 8;
                lVar92 = local_b78 * lVar33;
                local_f30 = (undefined8 *)
                            (((long)iVar36 * 8 + (lVar88 - lVar43) * local_af0 * 8 + lVar42 * -8) *
                             lVar62 + (long)iVar136 * 8 + lVar38 * -8 + (long)pdVar26);
                lVar87 = lVar62 * 8;
                local_988 = lVar45;
                for (; lVar88 <= lVar70; lVar88 = lVar88 + 1) {
                  lVar100 = (lVar88 - lVar43) * lVar56;
                  puVar50 = local_f30;
                  for (lVar45 = (long)iVar36; lVar45 <= lVar66; lVar45 = lVar45 + 1) {
                    lVar47 = (lVar45 - lVar42) * lVar62;
                    puVar51 = puVar50;
                    lVar111 = (long)iVar136;
                    while( true ) {
                      lVar101 = 0x1b;
                      if (lVar79 < lVar111) break;
                      bx_5.smallend.vect[1] = (int)lVar45;
                      bx_5.smallend.vect[0] = (int)lVar111;
                      bx_5.smallend.vect[2] = (int)lVar88;
                      bVar27 = Box::contains(&lhs_2,&bx_5.smallend);
                      if ((bVar27) &&
                         (*(int *)((lVar45 - (int)local_c64) *
                                   CONCAT44(bx_1.bigend.vect[0],bx_1.smallend.vect[2]) * 4 +
                                   bx_1.smallend.vect._0_8_ + (lVar111 - local_c68) * 4 +
                                  (lVar88 - (int)local_c60) *
                                  CONCAT44(bx_1.bigend.vect[2],bx_1.bigend.vect[1]) * 4) != 0)) {
                        uVar29 = *(uint *)((lVar45 - local_aa4) *
                                           CONCAT44(lhs_1.bigend.vect[0],lhs_1.smallend.vect[2]) * 4
                                           + lhs_1.smallend.vect._0_8_ + (lVar111 - local_aa8) * 4 +
                                          (lVar88 - local_aa0) *
                                          CONCAT44(lhs_1.bigend.vect[2],lhs_1.bigend.vect[1]) * 4) &
                                 3;
                        if (uVar29 == 0) {
LAB_00525e77:
                          lVar112 = lVar111 - lVar38;
                          lVar101 = 0x1b;
                          puVar40 = puVar51;
                          while (bVar27 = lVar101 != 0, lVar101 = lVar101 + -1, bVar27) {
                            *puVar40 = 0x3ff0000000000000;
                            puVar40 = (undefined8 *)((long)puVar40 + lVar92);
                          }
                        }
                        else if (uVar29 == 3) {
                          lVar112 = lVar111 - lVar38;
                          lVar101 = 0x1b;
                          puVar40 = puVar51;
                          while (bVar27 = lVar101 != 0, lVar101 = lVar101 + -1, bVar27) {
                            *puVar40 = 0;
                            puVar40 = (undefined8 *)((long)puVar40 + lVar92);
                          }
                        }
                        else {
                          lVar89 = (lVar88 - local_bb8) *
                                   CONCAT44(local_be0._20_4_,local_be0._16_4_);
                          lVar101 = (lVar45 - local_bbc) *
                                    CONCAT44(local_be0._12_4_,local_be0._8_4_) * 8 +
                                    CONCAT44(local_be0._4_4_,local_be0._0_4_) +
                                    (lVar111 - local_bc0) * 8;
                          dVar124 = *(double *)(lVar101 + lVar89 * 8);
                          if (0.9999999999999778 <= dVar124) goto LAB_00525e77;
                          lVar34 = (lVar45 - local_c20.begin.y) * local_c20.jstride;
                          lVar35 = (lVar88 - local_c20.begin.z) * local_c20.kstride;
                          lVar39 = lVar111 - local_c20.begin.x;
                          lVar112 = lVar111 - lVar38;
                          pdVar26[lVar100 + lVar47 + lVar112] =
                               (((local_c20.p[lVar34 + lVar39 + lVar35 + local_c20.nstride * 6] -
                                 local_c20.p[lVar34 + lVar39 + lVar35 + local_c20.nstride * 9]) -
                                local_c20.p[lVar34 + lVar39 + lVar35 + local_c20.nstride * 0xb]) +
                               local_c20.p[lVar34 + lVar39 + lVar35 + local_c20.nstride * 0xf]) *
                               9.0 + dVar124 * 0.5625 +
                                     ((-local_c20.p[lVar34 + lVar39 + lVar35] -
                                      local_c20.p[lVar34 + lVar39 + lVar35 + local_c20.nstride]) +
                                      local_c20.p[lVar34 + lVar39 + lVar35 + local_c20.nstride * 3]
                                     + local_c20.p[lVar34 + lVar39 + lVar35 + local_c20.nstride * 4]
                                     ) * 2.25;
                          pdVar26[lVar100 + lVar47 + lVar112 + lVar109] =
                               (local_c20.p[lVar34 + lVar39 + lVar35 + local_c20.nstride * 0xb] -
                               local_c20.p[lVar34 + lVar39 + lVar35 + local_c20.nstride * 0xf]) *
                               18.0 + *(double *)(lVar101 + lVar89 * 8) * 1.125 +
                                      ((local_c20.p
                                        [lVar34 + lVar39 + lVar35 + local_c20.nstride * 3] -
                                       local_c20.p[lVar34 + lVar39 + lVar35]) -
                                      local_c20.p[lVar34 + lVar39 + lVar35 + local_c20.nstride * 4])
                                      * 4.5;
                          pdVar26[lVar100 + lVar47 + lVar112 + lVar109 * 2] =
                               (((local_c20.p[lVar34 + lVar39 + lVar35 + local_c20.nstride * 9] -
                                 local_c20.p[lVar34 + lVar39 + lVar35 + local_c20.nstride * 6]) -
                                local_c20.p[lVar34 + lVar39 + lVar35 + local_c20.nstride * 0xb]) +
                               local_c20.p[lVar34 + lVar39 + lVar35 + local_c20.nstride * 0xf]) *
                               9.0 + *(double *)(lVar101 + lVar89 * 8) * 0.5625 +
                                     ((local_c20.p[lVar34 + lVar39 + lVar35 + local_c20.nstride] -
                                      local_c20.p[lVar34 + lVar39 + lVar35]) +
                                      local_c20.p[lVar34 + lVar39 + lVar35 + local_c20.nstride * 3]
                                     + local_c20.p[lVar34 + lVar39 + lVar35 + local_c20.nstride * 4]
                                     ) * 2.25;
                          pdVar26[lVar100 + lVar47 + lVar112 + lVar109 * 3] =
                               (local_c20.p[lVar34 + lVar39 + lVar35 + local_c20.nstride * 9] -
                               local_c20.p[lVar34 + lVar39 + lVar35 + local_c20.nstride * 0xf]) *
                               18.0 + *(double *)(lVar101 + lVar89 * 8) * 1.125 +
                                      ((-local_c20.p[lVar34 + lVar39 + lVar35 + local_c20.nstride] -
                                       local_c20.p[lVar34 + lVar39 + lVar35 + local_c20.nstride * 3]
                                       ) + local_c20.p
                                           [lVar34 + lVar39 + lVar35 + local_c20.nstride * 4]) * 4.5
                          ;
                          pdVar26[lVar100 + lVar47 + lVar112 + lVar109 * 4] =
                               local_c20.p[lVar34 + lVar39 + lVar35 + local_c20.nstride * 0xf] *
                               36.0 + *(double *)(lVar101 + lVar89 * 8) * 2.25 +
                                      (-local_c20.p
                                        [lVar34 + lVar39 + lVar35 + local_c20.nstride * 3] -
                                      local_c20.p[lVar34 + lVar39 + lVar35 + local_c20.nstride * 4])
                                      * 9.0;
                          pdVar26[lVar100 + lVar47 + lVar112 + lVar109 * 5] =
                               (-local_c20.p[lVar34 + lVar39 + lVar35 + local_c20.nstride * 9] -
                               local_c20.p[lVar34 + lVar39 + lVar35 + local_c20.nstride * 0xf]) *
                               18.0 + *(double *)(lVar101 + lVar89 * 8) * 1.125 +
                                      ((local_c20.p[lVar34 + lVar39 + lVar35 + local_c20.nstride] -
                                       local_c20.p[lVar34 + lVar39 + lVar35 + local_c20.nstride * 3]
                                       ) + local_c20.p
                                           [lVar34 + lVar39 + lVar35 + local_c20.nstride * 4]) * 4.5
                          ;
                          pdVar26[lVar100 + lVar47 + lVar112 + lVar109 * 6] =
                               ((-local_c20.p[lVar34 + lVar39 + lVar35 + local_c20.nstride * 6] -
                                local_c20.p[lVar34 + lVar39 + lVar35 + local_c20.nstride * 9]) +
                                local_c20.p[lVar34 + lVar39 + lVar35 + local_c20.nstride * 0xb] +
                               local_c20.p[lVar34 + lVar39 + lVar35 + local_c20.nstride * 0xf]) *
                               9.0 + *(double *)(lVar101 + lVar89 * 8) * 0.5625 +
                                     ((local_c20.p[lVar34 + lVar39 + lVar35] -
                                      local_c20.p[lVar34 + lVar39 + lVar35 + local_c20.nstride]) +
                                      local_c20.p[lVar34 + lVar39 + lVar35 + local_c20.nstride * 3]
                                     + local_c20.p[lVar34 + lVar39 + lVar35 + local_c20.nstride * 4]
                                     ) * 2.25;
                          lVar58 = (lVar45 - local_c20.begin.y) * local_c20.jstride;
                          lVar34 = (lVar88 - local_c20.begin.z) * local_c20.kstride;
                          lVar35 = lVar111 - local_c20.begin.x;
                          pdVar26[lVar100 + lVar47 + lVar112 + lVar109 * 7] =
                               (-local_c20.p[lVar58 + lVar35 + lVar34 + local_c20.nstride * 0xb] -
                               local_c20.p[lVar58 + lVar35 + lVar34 + local_c20.nstride * 0xf]) *
                               18.0 + *(double *)(lVar101 + lVar89 * 8) * 1.125 +
                                      ((local_c20.p[lVar58 + lVar35 + lVar34] +
                                       local_c20.p[lVar58 + lVar35 + lVar34 + local_c20.nstride * 3]
                                       ) - local_c20.p
                                           [lVar58 + lVar35 + lVar34 + local_c20.nstride * 4]) * 4.5
                          ;
                          lVar39 = (lVar88 - local_bb8) *
                                   CONCAT44(local_be0._20_4_,local_be0._16_4_);
                          lVar101 = (lVar45 - local_bbc) *
                                    CONCAT44(local_be0._12_4_,local_be0._8_4_) * 8 +
                                    CONCAT44(local_be0._4_4_,local_be0._0_4_) +
                                    (lVar111 - local_bc0) * 8;
                          pdVar26[lVar100 + lVar47 + lVar112 + lVar109 * 8] =
                               (local_c20.p[lVar58 + lVar35 + lVar34 + local_c20.nstride * 6] +
                                local_c20.p[lVar58 + lVar35 + lVar34 + local_c20.nstride * 9] +
                                local_c20.p[lVar58 + lVar35 + lVar34 + local_c20.nstride * 0xb] +
                               local_c20.p[lVar58 + lVar35 + lVar34 + local_c20.nstride * 0xf]) *
                               9.0 + *(double *)(lVar101 + lVar39 * 8) * 0.5625 +
                                     (local_c20.p[lVar58 + lVar35 + lVar34] +
                                      local_c20.p[lVar58 + lVar35 + lVar34 + local_c20.nstride] +
                                      local_c20.p[lVar58 + lVar35 + lVar34 + local_c20.nstride * 3]
                                     + local_c20.p[lVar58 + lVar35 + lVar34 + local_c20.nstride * 4]
                                     ) * 2.25;
                          pdVar26[lVar100 + lVar47 + lVar112 + lVar109 * 9] =
                               (((local_c20.p[lVar58 + lVar35 + lVar34 + local_c20.nstride * 7] -
                                 local_c20.p[lVar58 + lVar35 + lVar34 + local_c20.nstride * 10]) -
                                local_c20.p[lVar58 + lVar35 + lVar34 + local_c20.nstride * 0xd]) +
                               local_c20.p[lVar58 + lVar35 + lVar34 + local_c20.nstride * 0x10]) *
                               9.0 + *(double *)(lVar101 + lVar39 * 8) * 0.5625 +
                                     ((-local_c20.p[lVar58 + lVar35 + lVar34] -
                                      local_c20.p[lVar58 + lVar35 + lVar34 + local_c20.nstride * 2])
                                      + local_c20.p
                                        [lVar58 + lVar35 + lVar34 + local_c20.nstride * 3] +
                                     local_c20.p[lVar58 + lVar35 + lVar34 + local_c20.nstride * 5])
                                     * 2.25;
                          lVar35 = (lVar45 - local_c20.begin.y) * local_c20.jstride;
                          lVar34 = (lVar88 - local_c20.begin.z) * local_c20.kstride;
                          lVar89 = lVar111 - local_c20.begin.x;
                          pdVar26[lVar100 + lVar47 + lVar112 + lVar109 * 10] =
                               (local_c20.p[lVar35 + lVar89 + lVar34 + local_c20.nstride * 0xd] -
                               local_c20.p[lVar35 + lVar89 + lVar34 + local_c20.nstride * 0x10]) *
                               18.0 + *(double *)(lVar101 + lVar39 * 8) * 1.125 +
                                      ((local_c20.p
                                        [lVar35 + lVar89 + lVar34 + local_c20.nstride * 3] -
                                       local_c20.p[lVar35 + lVar89 + lVar34]) -
                                      local_c20.p[lVar35 + lVar89 + lVar34 + local_c20.nstride * 5])
                                      * 4.5;
                          lVar39 = (lVar88 - local_bb8) *
                                   CONCAT44(local_be0._20_4_,local_be0._16_4_);
                          lVar101 = (lVar45 - local_bbc) *
                                    CONCAT44(local_be0._12_4_,local_be0._8_4_) * 8 +
                                    CONCAT44(local_be0._4_4_,local_be0._0_4_) +
                                    (lVar111 - local_bc0) * 8;
                          pdVar26[lVar100 + lVar47 + lVar112 + lVar109 * 0xb] =
                               (((local_c20.p[lVar35 + lVar89 + lVar34 + local_c20.nstride * 10] -
                                 local_c20.p[lVar35 + lVar89 + lVar34 + local_c20.nstride * 7]) -
                                local_c20.p[lVar35 + lVar89 + lVar34 + local_c20.nstride * 0xd]) +
                               local_c20.p[lVar35 + lVar89 + lVar34 + local_c20.nstride * 0x10]) *
                               9.0 + *(double *)(lVar101 + lVar39 * 8) * 0.5625 +
                                     ((local_c20.p[lVar35 + lVar89 + lVar34 + local_c20.nstride * 2]
                                      - local_c20.p[lVar35 + lVar89 + lVar34]) +
                                      local_c20.p[lVar35 + lVar89 + lVar34 + local_c20.nstride * 3]
                                     + local_c20.p[lVar35 + lVar89 + lVar34 + local_c20.nstride * 5]
                                     ) * 2.25;
                          pdVar26[lVar100 + lVar47 + lVar112 + lVar109 * 0xc] =
                               (local_c20.p[lVar35 + lVar89 + lVar34 + local_c20.nstride * 10] -
                               local_c20.p[lVar35 + lVar89 + lVar34 + local_c20.nstride * 0x10]) *
                               18.0 + *(double *)(lVar101 + lVar39 * 8) * 1.125 +
                                      ((-local_c20.p
                                         [lVar35 + lVar89 + lVar34 + local_c20.nstride * 2] -
                                       local_c20.p[lVar35 + lVar89 + lVar34 + local_c20.nstride * 3]
                                       ) + local_c20.p
                                           [lVar35 + lVar89 + lVar34 + local_c20.nstride * 5]) * 4.5
                          ;
                          pdVar26[lVar100 + lVar47 + lVar112 + lVar109 * 0xd] =
                               local_c20.p[lVar35 + lVar89 + lVar34 + local_c20.nstride * 0x10] *
                               36.0 + *(double *)(lVar101 + lVar39 * 8) * 2.25 +
                                      (-local_c20.p
                                        [lVar35 + lVar89 + lVar34 + local_c20.nstride * 3] -
                                      local_c20.p[lVar35 + lVar89 + lVar34 + local_c20.nstride * 5])
                                      * 9.0;
                          lVar34 = (lVar45 - local_c20.begin.y) * local_c20.jstride;
                          lVar35 = (lVar88 - local_c20.begin.z) * local_c20.kstride;
                          lVar89 = lVar111 - local_c20.begin.x;
                          pdVar26[lVar100 + lVar47 + lVar112 + lVar109 * 0xe] =
                               (-local_c20.p[lVar34 + lVar89 + lVar35 + local_c20.nstride * 10] -
                               local_c20.p[lVar34 + lVar89 + lVar35 + local_c20.nstride * 0x10]) *
                               18.0 + *(double *)(lVar101 + lVar39 * 8) * 1.125 +
                                      ((local_c20.p
                                        [lVar34 + lVar89 + lVar35 + local_c20.nstride * 2] -
                                       local_c20.p[lVar34 + lVar89 + lVar35 + local_c20.nstride * 3]
                                       ) + local_c20.p
                                           [lVar34 + lVar89 + lVar35 + local_c20.nstride * 5]) * 4.5
                          ;
                          lVar101 = (lVar88 - local_bb8) *
                                    CONCAT44(local_be0._20_4_,local_be0._16_4_);
                          lVar39 = (lVar111 - local_bc0) * 8 +
                                   (lVar45 - local_bbc) * CONCAT44(local_be0._12_4_,local_be0._8_4_)
                                   * 8 + CONCAT44(local_be0._4_4_,local_be0._0_4_);
                          pdVar26[lVar100 + lVar47 + lVar112 + lVar109 * 0xf] =
                               ((-local_c20.p[lVar34 + lVar89 + lVar35 + local_c20.nstride * 7] -
                                local_c20.p[lVar34 + lVar89 + lVar35 + local_c20.nstride * 10]) +
                                local_c20.p[lVar34 + lVar89 + lVar35 + local_c20.nstride * 0xd] +
                               local_c20.p[lVar34 + lVar89 + lVar35 + local_c20.nstride * 0x10]) *
                               9.0 + *(double *)(lVar39 + lVar101 * 8) * 0.5625 +
                                     ((local_c20.p[lVar34 + lVar89 + lVar35] -
                                      local_c20.p[lVar34 + lVar89 + lVar35 + local_c20.nstride * 2])
                                      + local_c20.p
                                        [lVar34 + lVar89 + lVar35 + local_c20.nstride * 3] +
                                     local_c20.p[lVar34 + lVar89 + lVar35 + local_c20.nstride * 5])
                                     * 2.25;
                          pdVar26[lVar100 + lVar47 + lVar112 + lVar109 * 0x10] =
                               (-local_c20.p[lVar34 + lVar89 + lVar35 + local_c20.nstride * 0xd] -
                               local_c20.p[lVar34 + lVar89 + lVar35 + local_c20.nstride * 0x10]) *
                               18.0 + *(double *)(lVar39 + lVar101 * 8) * 1.125 +
                                      ((local_c20.p[lVar34 + lVar89 + lVar35] +
                                       local_c20.p[lVar34 + lVar89 + lVar35 + local_c20.nstride * 3]
                                       ) - local_c20.p
                                           [lVar34 + lVar89 + lVar35 + local_c20.nstride * 5]) * 4.5
                          ;
                          lVar35 = (lVar45 - local_c20.begin.y) * local_c20.jstride;
                          lVar34 = (lVar88 - local_c20.begin.z) * local_c20.kstride;
                          lVar89 = lVar111 - local_c20.begin.x;
                          pdVar26[lVar100 + lVar47 + lVar112 + lVar109 * 0x11] =
                               (local_c20.p[lVar35 + lVar89 + lVar34 + local_c20.nstride * 7] +
                                local_c20.p[lVar35 + lVar89 + lVar34 + local_c20.nstride * 10] +
                                local_c20.p[lVar35 + lVar89 + lVar34 + local_c20.nstride * 0xd] +
                               local_c20.p[lVar35 + lVar89 + lVar34 + local_c20.nstride * 0x10]) *
                               9.0 + *(double *)(lVar39 + lVar101 * 8) * 0.5625 +
                                     (local_c20.p[lVar35 + lVar89 + lVar34] +
                                      local_c20.p[lVar35 + lVar89 + lVar34 + local_c20.nstride * 2]
                                      + local_c20.p
                                        [lVar35 + lVar89 + lVar34 + local_c20.nstride * 3] +
                                     local_c20.p[lVar35 + lVar89 + lVar34 + local_c20.nstride * 5])
                                     * 2.25;
                          lVar39 = (lVar88 - local_bb8) *
                                   CONCAT44(local_be0._20_4_,local_be0._16_4_);
                          lVar101 = (lVar45 - local_bbc) *
                                    CONCAT44(local_be0._12_4_,local_be0._8_4_) * 8 +
                                    CONCAT44(local_be0._4_4_,local_be0._0_4_) +
                                    (lVar111 - local_bc0) * 8;
                          pdVar26[lVar100 + lVar47 + lVar112 + lVar109 * 0x12] =
                               (((local_c20.p[lVar35 + lVar89 + lVar34 + local_c20.nstride * 8] -
                                 local_c20.p[lVar35 + lVar89 + lVar34 + local_c20.nstride * 0xc]) -
                                local_c20.p[lVar35 + lVar89 + lVar34 + local_c20.nstride * 0xe]) +
                               local_c20.p[lVar35 + lVar89 + lVar34 + local_c20.nstride * 0x11]) *
                               9.0 + *(double *)(lVar101 + lVar39 * 8) * 0.5625 +
                                     ((-local_c20.p[lVar35 + lVar89 + lVar34 + local_c20.nstride] -
                                      local_c20.p[lVar35 + lVar89 + lVar34 + local_c20.nstride * 2])
                                      + local_c20.p
                                        [lVar35 + lVar89 + lVar34 + local_c20.nstride * 4] +
                                     local_c20.p[lVar35 + lVar89 + lVar34 + local_c20.nstride * 5])
                                     * 2.25;
                          lVar89 = lVar111 - local_c20.begin.x;
                          lVar34 = (lVar45 - local_c20.begin.y) * local_c20.jstride;
                          lVar35 = (lVar88 - local_c20.begin.z) * local_c20.kstride;
                          pdVar26[lVar100 + lVar47 + lVar112 + lVar109 * 0x13] =
                               (local_c20.p[lVar34 + lVar89 + lVar35 + local_c20.nstride * 0xe] -
                               local_c20.p[lVar34 + lVar89 + lVar35 + local_c20.nstride * 0x11]) *
                               18.0 + *(double *)(lVar101 + lVar39 * 8) * 1.125 +
                                      ((local_c20.p
                                        [lVar34 + lVar89 + lVar35 + local_c20.nstride * 4] -
                                       local_c20.p[lVar34 + lVar89 + lVar35 + local_c20.nstride]) -
                                      local_c20.p[lVar34 + lVar89 + lVar35 + local_c20.nstride * 5])
                                      * 4.5;
                          pdVar26[lVar100 + lVar47 + lVar112 + lVar109 * 0x14] =
                               (((local_c20.p[lVar34 + lVar89 + lVar35 + local_c20.nstride * 0xc] -
                                 local_c20.p[lVar34 + lVar89 + lVar35 + local_c20.nstride * 8]) -
                                local_c20.p[lVar34 + lVar89 + lVar35 + local_c20.nstride * 0xe]) +
                               local_c20.p[lVar34 + lVar89 + lVar35 + local_c20.nstride * 0x11]) *
                               9.0 + *(double *)(lVar101 + lVar39 * 8) * 0.5625 +
                                     ((local_c20.p[lVar34 + lVar89 + lVar35 + local_c20.nstride * 2]
                                      - local_c20.p[lVar34 + lVar89 + lVar35 + local_c20.nstride]) +
                                      local_c20.p[lVar34 + lVar89 + lVar35 + local_c20.nstride * 4]
                                     + local_c20.p[lVar34 + lVar89 + lVar35 + local_c20.nstride * 5]
                                     ) * 2.25;
                          lVar39 = (lVar88 - local_bb8) *
                                   CONCAT44(local_be0._20_4_,local_be0._16_4_);
                          lVar101 = (lVar45 - local_bbc) *
                                    CONCAT44(local_be0._12_4_,local_be0._8_4_) * 8 +
                                    CONCAT44(local_be0._4_4_,local_be0._0_4_) +
                                    (lVar111 - local_bc0) * 8;
                          pdVar26[lVar100 + lVar47 + lVar112 + lVar109 * 0x15] =
                               (local_c20.p[lVar34 + lVar89 + lVar35 + local_c20.nstride * 0xc] -
                               local_c20.p[lVar34 + lVar89 + lVar35 + local_c20.nstride * 0x11]) *
                               18.0 + *(double *)(lVar101 + lVar39 * 8) * 1.125 +
                                      ((-local_c20.p
                                         [lVar34 + lVar89 + lVar35 + local_c20.nstride * 2] -
                                       local_c20.p[lVar34 + lVar89 + lVar35 + local_c20.nstride * 4]
                                       ) + local_c20.p
                                           [lVar34 + lVar89 + lVar35 + local_c20.nstride * 5]) * 4.5
                          ;
                          lVar89 = lVar111 - local_c20.begin.x;
                          lVar34 = (lVar45 - local_c20.begin.y) * local_c20.jstride;
                          lVar35 = (lVar88 - local_c20.begin.z) * local_c20.kstride;
                          pdVar26[lVar100 + lVar47 + lVar112 + lVar109 * 0x16] =
                               local_c20.p[lVar34 + lVar89 + lVar35 + local_c20.nstride * 0x11] *
                               36.0 + *(double *)(lVar101 + lVar39 * 8) * 2.25 +
                                      (-local_c20.p
                                        [lVar34 + lVar89 + lVar35 + local_c20.nstride * 4] -
                                      local_c20.p[lVar34 + lVar89 + lVar35 + local_c20.nstride * 5])
                                      * 9.0;
                          pdVar26[lVar100 + lVar47 + lVar112 + lVar109 * 0x17] =
                               (-local_c20.p[lVar34 + lVar89 + lVar35 + local_c20.nstride * 0xc] -
                               local_c20.p[lVar34 + lVar89 + lVar35 + local_c20.nstride * 0x11]) *
                               18.0 + *(double *)(lVar101 + lVar39 * 8) * 1.125 +
                                      ((local_c20.p
                                        [lVar34 + lVar89 + lVar35 + local_c20.nstride * 2] -
                                       local_c20.p[lVar34 + lVar89 + lVar35 + local_c20.nstride * 4]
                                       ) + local_c20.p
                                           [lVar34 + lVar89 + lVar35 + local_c20.nstride * 5]) * 4.5
                          ;
                          pdVar26[lVar100 + lVar47 + lVar112 + lVar109 * 0x18] =
                               ((-local_c20.p[lVar34 + lVar89 + lVar35 + local_c20.nstride * 8] -
                                local_c20.p[lVar34 + lVar89 + lVar35 + local_c20.nstride * 0xc]) +
                                local_c20.p[lVar34 + lVar89 + lVar35 + local_c20.nstride * 0xe] +
                               local_c20.p[lVar34 + lVar89 + lVar35 + local_c20.nstride * 0x11]) *
                               9.0 + *(double *)(lVar101 + lVar39 * 8) * 0.5625 +
                                     ((local_c20.p[lVar34 + lVar89 + lVar35 + local_c20.nstride] -
                                      local_c20.p[lVar34 + lVar89 + lVar35 + local_c20.nstride * 2])
                                      + local_c20.p
                                        [lVar34 + lVar89 + lVar35 + local_c20.nstride * 4] +
                                     local_c20.p[lVar34 + lVar89 + lVar35 + local_c20.nstride * 5])
                                     * 2.25;
                          lVar39 = (lVar111 - local_bc0) * 8 +
                                   (lVar45 - local_bbc) * CONCAT44(local_be0._12_4_,local_be0._8_4_)
                                   * 8 + CONCAT44(local_be0._4_4_,local_be0._0_4_);
                          lVar34 = lVar111 - local_c20.begin.x;
                          lVar101 = (lVar45 - local_c20.begin.y) * local_c20.jstride;
                          lVar35 = (lVar88 - local_c20.begin.z) * local_c20.kstride;
                          lVar89 = (lVar88 - local_bb8) *
                                   CONCAT44(local_be0._20_4_,local_be0._16_4_);
                          pdVar26[lVar100 + lVar47 + lVar112 + lVar109 * 0x19] =
                               (-local_c20.p[lVar101 + lVar34 + lVar35 + local_c20.nstride * 0xe] -
                               local_c20.p[lVar101 + lVar34 + lVar35 + local_c20.nstride * 0x11]) *
                               18.0 + *(double *)(lVar39 + lVar89 * 8) * 1.125 +
                                      ((local_c20.p[lVar101 + lVar34 + lVar35 + local_c20.nstride] +
                                       local_c20.p
                                       [lVar101 + lVar34 + lVar35 + local_c20.nstride * 4]) -
                                      local_c20.p[lVar101 + lVar34 + lVar35 + local_c20.nstride * 5]
                                      ) * 4.5;
                          pdVar26[lVar100 + lVar47 + lVar112 + lVar109 * 0x1a] =
                               (local_c20.p[lVar101 + lVar34 + lVar35 + local_c20.nstride * 8] +
                                local_c20.p[lVar101 + lVar34 + lVar35 + local_c20.nstride * 0xc] +
                                local_c20.p[lVar101 + lVar34 + lVar35 + local_c20.nstride * 0xe] +
                               local_c20.p[lVar101 + lVar34 + lVar35 + local_c20.nstride * 0x11]) *
                               9.0 + *(double *)(lVar39 + lVar89 * 8) * 0.5625 +
                                     (local_c20.p[lVar101 + lVar34 + lVar35 + local_c20.nstride] +
                                      local_c20.p[lVar101 + lVar34 + lVar35 + local_c20.nstride * 2]
                                      + local_c20.p
                                        [lVar101 + lVar34 + lVar35 + local_c20.nstride * 4] +
                                     local_c20.p[lVar101 + lVar34 + lVar35 + local_c20.nstride * 5])
                                     * 2.25;
                        }
                        dVar124 = *(double *)
                                   ((lVar45 - local_a24) *
                                    CONCAT44(bx_6.bigend.vect[0],bx_6.smallend.vect[2]) * 8 +
                                    bx_6.smallend.vect._0_8_ + (lVar111 - local_a28) * 8 +
                                   (lVar88 - local_a20) *
                                   CONCAT44(bx_6.bigend.vect[2],bx_6.bigend.vect[1]) * 8);
                      }
                      else {
                        lVar112 = lVar111 - lVar38;
                        puVar40 = puVar51;
                        while (bVar27 = lVar101 != 0, lVar101 = lVar101 + -1, bVar27) {
                          *puVar40 = 0;
                          puVar40 = (undefined8 *)((long)puVar40 + lVar92);
                        }
                        dVar124 = 0.0;
                      }
                      pdVar26[lVar109 * 0x1b + lVar100 + lVar47 + lVar112] = dVar124;
                      lVar111 = lVar111 + 1;
                      puVar51 = puVar51 + 1;
                    }
                    puVar50 = puVar50 + lVar62;
                  }
                  local_f30 = (undefined8 *)((long)local_f30 + local_b78);
                }
                lVar101 = (long)local_9c8.smallend.vect[1];
                lVar112 = (long)local_9c8.smallend.vect[2];
                local_6f0 = lVar101 * 8 + lVar42 * -8;
                local_6f8 = lVar33 * 0xd8;
                lVar92 = (local_6f8 + lVar112 * 8 + lVar43 * -8) * local_af0;
                local_700 = lVar33 * 0x20;
                lVar89 = (lVar33 * 0x68 + lVar112 * 8 + lVar43 * -8) * local_af0;
                lVar100 = (lVar33 * 0x50 + lVar112 * 8 + lVar43 * -8) * local_af0;
                local_708 = lVar33 * 8;
                local_710 = lVar33 * 0x18;
                lVar111 = (lVar112 * 8 + lVar33 * 0x60 + lVar43 * -8) * local_af0;
                lVar47 = (long)local_9c8.smallend.vect[0];
                lVar45 = lVar112 * 8;
                lVar79 = lVar112 * 8;
                lVar66 = lVar112 * 8;
                local_718 = lVar33 * 0x28;
                lVar70 = lVar112 * 8;
                local_758 = lVar37 * 8;
                local_760 = local_990 * 8;
                local_b88 = ((local_758 + lVar112 * 8 + local_990 * -8) * lVar31 + lVar101 * 8 +
                            local_988 * -8) * local_ad0 + lVar47 * 8 + local_998 * -8 +
                            (long)local_d90;
                lVar88 = lVar31 * local_ad0;
                local_b80 = lVar88 * 8;
                local_768 = lVar37 * 0x10;
                local_b90 = ((local_768 + lVar112 * 8 + local_990 * -8) * lVar31 + lVar101 * 8 +
                            local_988 * -8) * local_ad0 + lVar47 * 8 + local_998 * -8 +
                            (long)local_d90;
                local_770 = lVar37 * 0x18;
                local_e48 = ((local_770 + lVar112 * 8 + local_990 * -8) * lVar31 + lVar101 * 8 +
                            local_988 * -8) * local_ad0 + lVar47 * 8 + local_998 * -8 +
                            (long)local_d90;
                local_778 = lVar37 * 0x20;
                local_b98 = ((local_778 + lVar112 * 8 + local_990 * -8) * lVar31 + lVar101 * 8 +
                            local_988 * -8) * local_ad0 + lVar47 * 8 + local_998 * -8 +
                            (long)local_d90;
                local_780 = lVar37 * 0x28;
                local_ad8 = ((local_780 + lVar112 * 8 + local_990 * -8) * lVar31 + lVar101 * 8 +
                            local_988 * -8) * local_ad0 + lVar47 * 8 + local_998 * -8 +
                            (long)local_d90;
                local_788 = lVar37 * 0x30;
                local_ae0 = ((local_788 + lVar112 * 8 + local_990 * -8) * lVar31 + lVar101 * 8 +
                            local_988 * -8) * local_ad0 + lVar47 * 8 + local_998 * -8 +
                            (long)local_d90;
                local_790 = lVar37 * 0x38;
                local_ae8 = ((local_790 + lVar112 * 8 + local_990 * -8) * lVar31 + lVar101 * 8 +
                            local_988 * -8) * local_ad0 + lVar47 * 8 + local_998 * -8 +
                            (long)local_d90;
                pdVar49 = pdVar26 + (lVar47 - lVar38);
                lVar35 = (lVar92 + lVar101 * 8 + lVar42 * -8) * lVar62 + lVar47 * 8 + lVar38 * -8 +
                         (long)pdVar26;
                local_f58 = ((lVar33 * 0x48 + lVar112 * 8 + lVar43 * -8) * local_af0 + lVar101 * 8 +
                            lVar42 * -8) * lVar62 + lVar47 * 8 + lVar38 * -8 + (long)pdVar26;
                local_d78 = ((lVar33 * 0x90 + lVar112 * 8 + lVar43 * -8) * local_af0 + lVar101 * 8 +
                            lVar42 * -8) * lVar62 + lVar47 * 8 + lVar38 * -8 + (long)pdVar26;
                local_d08 = ((lVar33 * 0xb0 + lVar112 * 8 + lVar43 * -8) * local_af0 + lVar101 * 8 +
                            lVar42 * -8) * lVar62 + lVar47 * 8 + lVar38 * -8 + (long)pdVar26;
                lVar39 = (lVar89 + lVar101 * 8 + lVar42 * -8) * lVar62 + lVar47 * 8 + lVar38 * -8 +
                         (long)pdVar26;
                local_d10 = ((local_700 + lVar112 * 8 + lVar43 * -8) * local_af0 + lVar101 * 8 +
                            lVar42 * -8) * lVar62 + lVar47 * 8 + lVar38 * -8 + (long)pdVar26;
                local_d18 = (lVar101 * 8 + (lVar112 - lVar43) * local_af0 * 8 + lVar42 * -8) *
                            lVar62 + lVar47 * 8 + lVar38 * -8 + (long)pdVar26;
                local_d20 = (lVar100 + lVar101 * 8 + lVar42 * -8) * lVar62 + lVar47 * 8 +
                            lVar38 * -8 + (long)pdVar26;
                local_d28 = ((lVar33 * 0x98 + lVar112 * 8 + lVar43 * -8) * local_af0 + lVar101 * 8 +
                            lVar42 * -8) * lVar62 + lVar47 * 8 + lVar38 * -8 + (long)pdVar26;
                local_d30 = ((local_708 + lVar112 * 8 + lVar43 * -8) * local_af0 + lVar101 * 8 +
                            lVar42 * -8) * lVar62 + lVar47 * 8 + lVar38 * -8 + (long)pdVar26;
                local_d38 = ((lVar33 * 0xa8 + lVar112 * 8 + lVar43 * -8) * local_af0 + lVar101 * 8 +
                            lVar42 * -8) * lVar62 + lVar47 * 8 + lVar38 * -8 + (long)pdVar26;
                local_d40 = ((local_710 + lVar112 * 8 + lVar43 * -8) * local_af0 + lVar101 * 8 +
                            lVar42 * -8) * lVar62 + lVar47 * 8 + lVar38 * -8 + (long)pdVar26;
                local_d48 = lVar47 * 8 + (lVar111 + lVar101 * 8 + lVar42 * -8) * lVar62 +
                            lVar38 * -8 + (long)pdVar26;
                local_720 = lVar33 * 0x58;
                local_728 = lVar33 * 0xa0;
                local_730 = lVar33 * 0xb8;
                local_738 = lVar33 * 0x70;
                local_740 = lVar33 * 0xd0;
                local_6e8 = (long)local_9c8.bigend.vect[2];
                lVar38 = local_ad0 * 8;
                local_940 = ~iVar60 + local_9c8.smallend.vect[1];
                iVar36 = ~iVar61 + local_9c8.smallend.vect[2];
                local_ed0 = pdVar49;
                for (; iVar136 = iVar36, lVar112 <= local_6e8; lVar112 = lVar112 + 1) {
                  lVar58 = (long)iVar136;
                  lVar44 = (local_6f8 + lVar58 * 8) * local_af0;
                  local_f70 = (double *)((lVar44 + local_6f0) * lVar62 + (long)pdVar49);
                  local_1000 = (double *)
                               (((local_720 + lVar58 * 8) * local_af0 + local_6f0) * lVar62 +
                               (long)pdVar49);
                  local_ff8 = (double *)
                              (((local_728 + lVar58 * 8) * local_af0 + local_6f0) * lVar62 +
                              (long)pdVar49);
                  local_fb8 = (double *)
                              (((local_700 + lVar58 * 8) * local_af0 + local_6f0) * lVar62 +
                              (long)pdVar49);
                  local_fc0 = (double *)
                              (((local_708 + lVar58 * 8) * local_af0 + local_6f0) * lVar62 +
                              (long)pdVar49);
                  local_f90 = (double *)
                              (((local_730 + lVar58 * 8) * local_af0 + local_6f0) * lVar62 +
                              (long)pdVar49);
                  local_f68 = (double *)
                              (((local_710 + lVar58 * 8) * local_af0 + local_6f0) * lVar62 +
                              (long)pdVar49);
                  lVar93 = (local_738 + lVar58 * 8) * local_af0;
                  local_1028 = (double *)((local_6f0 + lVar93) * lVar62 + (long)pdVar49);
                  lVar48 = (lVar112 - lVar43) * lVar56;
                  lVar67 = (~iVar61 + (int)lVar112) * lVar56;
                  local_1018 = local_d48;
                  local_1020 = local_d40;
                  local_f78 = local_d38;
                  local_fe8 = local_d30;
                  local_f80 = local_d28;
                  local_fd8 = local_d20;
                  local_e50 = local_d18;
                  local_e58 = local_d10;
                  local_ea0 = local_d08;
                  local_e60 = local_d78;
                  local_e68 = local_f58;
                  local_f40 = local_ae8;
                  local_ee0 = local_ae0;
                  local_f08 = local_ad8;
                  local_ea8 = local_b98;
                  local_f48 = local_e48;
                  local_ee8 = local_b90;
                  local_f10 = local_b88;
                  iVar36 = local_940;
                  local_f50 = (double *)lVar35;
                  local_e98 = lVar39;
                  for (lVar34 = lVar101; lVar34 <= local_9c8.bigend.vect[1]; lVar34 = lVar34 + 1) {
                    lVar59 = (long)iVar36;
                    lVar74 = (lVar92 + lVar59 * 8) * lVar62;
                    lVar68 = ((lVar33 * 200 + lVar66 + lVar43 * -8) * local_af0 + lVar59 * 8) *
                             lVar62;
                    lVar71 = ((local_718 + lVar70 + lVar43 * -8) * local_af0 + lVar59 * 8) * lVar62;
                    lVar63 = (lVar34 - lVar42) * lVar62;
                    lVar64 = (~iVar60 + (int)lVar34) * lVar62;
                    for (lVar81 = 0; lVar47 + lVar81 <= (long)local_9c8.bigend.vect[0];
                        lVar81 = lVar81 + 1) {
                      *(double *)(local_f10 + lVar81 * 8) =
                           (*(double *)
                             ((long)pdVar49 +
                             lVar81 * 8 +
                             ((local_718 + lVar58 * 8) * local_af0 + lVar59 * 8) * lVar62) * dVar154
                           + *(double *)
                              ((long)pdVar49 +
                              lVar81 * 8 +
                              ((local_740 + lVar58 * 8) * local_af0 + lVar59 * 8) * lVar62) *
                             dVar116 + *(double *)
                                        ((long)pdVar49 + lVar81 * 8 + (lVar93 + lVar59 * 8) * lVar62
                                        ) * dVar139) *
                           *(double *)((long)pdVar49 + lVar81 * 8 + (lVar44 + lVar59 * 8) * lVar62)
                           + (local_f68[lVar81] * dVar154 +
                             local_ff8[lVar81] * dVar116 + local_1028[lVar81] * dVar139) *
                             local_f70[lVar81] +
                             (*(double *)(local_1020 + lVar81 * 8) * dVar154 +
                             *(double *)(local_e60 + lVar81 * 8) * dVar116 +
                             *(double *)(local_1018 + lVar81 * 8) * dVar139) *
                             *(double *)((long)local_f50 + lVar81 * 8) +
                             (*(double *)((long)local_ed0 + lVar81 * 8 + lVar71) * dVar154 +
                             *(double *)
                              ((long)local_ed0 +
                              lVar81 * 8 +
                              ((lVar33 * 0xc0 + lVar79 + lVar43 * -8) * local_af0 + lVar59 * 8) *
                              lVar62) * dVar116 +
                             *(double *)
                              ((long)local_ed0 + lVar81 * 8 + (lVar111 + lVar59 * 8) * lVar62) *
                             dVar139) * *(double *)((long)local_ed0 + lVar81 * 8 + lVar74);
                      lVar82 = (long)(~iVar41 + local_9c8.smallend.vect[0] + (int)lVar81);
                      *(double *)(local_ee8 + lVar81 * 8) =
                           (pdVar26[lVar63 + lVar82 + lVar67 + lVar109 * 7] * dVar154 +
                           pdVar26[lVar63 + lVar82 + lVar67 + lVar109 * 0x17] * dVar155 +
                           pdVar26[lVar63 + lVar82 + lVar67 + lVar109 * 0x11] * dVar150) *
                           pdVar26[lVar109 * 0x1b + lVar63 + lVar82 + lVar67] +
                           (local_fc0[lVar81] * dVar154 +
                           local_f90[lVar81] * dVar155 + local_1000[lVar81] * dVar150) *
                           local_f70[lVar81] +
                           (*(double *)(local_fe8 + lVar81 * 8) * dVar154 +
                           *(double *)(local_f78 + lVar81 * 8) * dVar155 +
                           *(double *)(local_e68 + lVar81 * 8) * dVar150) *
                           *(double *)((long)local_f50 + lVar81 * 8) +
                           (pdVar26[lVar63 + lVar82 + lVar48 + lVar109 * 7] * dVar154 +
                           pdVar26[lVar63 + lVar82 + lVar48 + lVar109 * 0x15] * dVar155 +
                           pdVar26[lVar63 + lVar82 + lVar48 + lVar109 * 0xf] * dVar150) *
                           pdVar26[lVar109 * 0x1b + lVar63 + lVar82 + lVar48];
                      *(double *)(local_f48 + lVar81 * 8) =
                           (pdVar26[lVar64 + lVar48 + lVar82 + lVar109 * 8] * dVar140 +
                           pdVar26[lVar64 + lVar48 + lVar82 + lVar109 * 0x19] * dVar155 +
                           pdVar26[lVar64 + lVar48 + lVar82 + lVar109 * 0x10] * dVar139) *
                           pdVar26[lVar109 * 0x1b + lVar64 + lVar48 + lVar82] +
                           (*(double *)
                             ((long)local_ed0 +
                             lVar81 * 8 +
                             ((lVar33 * 0x10 + lVar45 + lVar43 * -8) * local_af0 + lVar59 * 8) *
                             lVar62) * dVar140 +
                           *(double *)((long)local_ed0 + lVar81 * 8 + lVar68) * dVar155 +
                           *(double *)
                            ((long)local_ed0 + lVar81 * 8 + (lVar100 + lVar59 * 8) * lVar62) *
                           dVar139) * *(double *)((long)local_ed0 + lVar81 * 8 + lVar74) +
                           (*(double *)(local_e50 + lVar81 * 8) * dVar140 +
                           *(double *)(local_f80 + lVar81 * 8) * dVar155 +
                           *(double *)(local_fd8 + lVar81 * 8) * dVar139) *
                           *(double *)((long)local_f50 + lVar81 * 8) +
                           (pdVar26[lVar63 + lVar82 + lVar48 + lVar109 * 6] * dVar140 +
                           pdVar26[lVar63 + lVar82 + lVar48 + lVar109 * 0x13] * dVar155 +
                           pdVar26[lVar63 + lVar82 + lVar48 + lVar109 * 0x10] * dVar139) *
                           pdVar26[lVar109 * 0x1b + lVar63 + lVar82 + lVar48];
                      *(double *)(local_ea8 + lVar81 * 8) =
                           (*(double *)(local_e58 + lVar81 * 8) * -dVar128 +
                           *(double *)(local_f78 + lVar81 * 8) * dVar138 +
                           *(double *)(local_1018 + lVar81 * 8) * dVar148) *
                           *(double *)((long)local_f50 + lVar81 * 8) +
                           (local_fb8[lVar81] * -dVar128 +
                           local_f90[lVar81] * dVar138 + local_1028[lVar81] * dVar148) *
                           local_f70[lVar81];
                      *(double *)(local_f08 + lVar81 * 8) =
                           (*(double *)(local_1020 + lVar81 * 8) * dVar153 +
                           *(double *)(local_f80 + lVar81 * 8) * dVar138 +
                           *(double *)(local_e98 + lVar81 * 8) * -dVar145) *
                           *(double *)((long)local_f50 + lVar81 * 8) +
                           (*(double *)((long)local_ed0 + lVar81 * 8 + lVar71) * dVar153 +
                           *(double *)((long)local_ed0 + lVar81 * 8 + lVar68) * dVar138 +
                           *(double *)
                            ((long)local_ed0 + lVar81 * 8 + (lVar89 + lVar59 * 8) * lVar62) *
                           -dVar145) * *(double *)((long)local_ed0 + lVar81 * 8 + lVar74);
                      *(double *)(local_ee0 + lVar81 * 8) =
                           (*(double *)(local_fe8 + lVar81 * 8) * dVar153 +
                           *(double *)(local_ea0 + lVar81 * 8) * -dVar137 +
                           *(double *)(local_fd8 + lVar81 * 8) * dVar148) *
                           *(double *)((long)local_f50 + lVar81 * 8) +
                           (pdVar26[lVar63 + lVar82 + lVar48 + lVar109 * 7] * dVar153 +
                           pdVar26[lVar63 + lVar82 + lVar48 + lVar109 * 0x16] * -dVar137 +
                           pdVar26[lVar63 + lVar82 + lVar48 + lVar109 * 0x10] * dVar148) *
                           pdVar26[lVar109 * 0x1b + lVar63 + lVar82 + lVar48];
                      *(double *)(local_f40 + lVar81 * 8) =
                           (*(double *)(local_e58 + lVar81 * 8) * dVar128 +
                           *(double *)(local_ea0 + lVar81 * 8) * dVar137 +
                           *(double *)(local_e98 + lVar81 * 8) * dVar145) *
                           *(double *)((long)local_f50 + lVar81 * 8);
                    }
                    local_f10 = local_f10 + lVar38;
                    local_ee8 = local_ee8 + lVar38;
                    local_f48 = local_f48 + lVar38;
                    local_ea8 = local_ea8 + lVar38;
                    local_f08 = local_f08 + lVar38;
                    local_ee0 = local_ee0 + lVar38;
                    local_f40 = local_f40 + lVar38;
                    local_f70 = local_f70 + lVar62;
                    local_f50 = (double *)((long)local_f50 + lVar87);
                    local_1000 = local_1000 + lVar62;
                    local_ff8 = local_ff8 + lVar62;
                    local_fb8 = local_fb8 + lVar62;
                    local_fc0 = local_fc0 + lVar62;
                    local_f90 = local_f90 + lVar62;
                    local_f68 = local_f68 + lVar62;
                    local_1028 = local_1028 + lVar62;
                    local_e68 = local_e68 + lVar87;
                    local_e60 = local_e60 + lVar87;
                    local_ea0 = local_ea0 + lVar87;
                    local_e98 = local_e98 + lVar87;
                    local_e58 = local_e58 + lVar87;
                    local_e50 = local_e50 + lVar87;
                    local_fd8 = local_fd8 + lVar87;
                    local_f80 = local_f80 + lVar87;
                    local_fe8 = local_fe8 + lVar87;
                    local_f78 = local_f78 + lVar87;
                    local_1020 = local_1020 + lVar87;
                    local_1018 = local_1018 + lVar87;
                    iVar36 = iVar36 + 1;
                  }
                  local_b88 = local_b88 + local_b80;
                  local_b90 = local_b90 + local_b80;
                  local_e48 = local_e48 + local_b80;
                  local_b98 = local_b98 + local_b80;
                  local_ad8 = local_ad8 + local_b80;
                  local_ae0 = local_ae0 + local_b80;
                  local_ae8 = local_ae8 + local_b80;
                  lVar35 = lVar35 + local_b78;
                  local_f58 = local_f58 + local_b78;
                  local_d78 = local_d78 + local_b78;
                  local_d08 = local_d08 + local_b78;
                  lVar39 = lVar39 + local_b78;
                  local_d10 = local_d10 + local_b78;
                  local_d18 = local_d18 + local_b78;
                  local_d20 = local_d20 + local_b78;
                  local_d28 = local_d28 + local_b78;
                  local_d30 = local_d30 + local_b78;
                  local_d38 = local_d38 + local_b78;
                  local_d40 = local_d40 + local_b78;
                  local_d48 = local_d48 + local_b78;
                  local_ed0 = (double *)((long)local_ed0 + local_b78);
                  iVar36 = iVar136 + 1;
                  local_93c = iVar136;
                }
                lVar42 = (long)local_e38.smallend.vect[0];
                pdVar76 = pdVar76 + (lVar42 - local_b08);
                lVar43 = (long)local_e38.smallend.vect[2];
                local_d88 = local_d90 + (lVar42 - local_998);
                local_d90 = local_d90 + ((lVar42 + -1) - local_998);
                lVar109 = local_788 + lVar43 * 8 + local_990 * -8;
                lVar33 = local_790 + lVar43 * 8 + local_990 * -8;
                lVar62 = local_780 + lVar43 * 8 + local_990 * -8;
                lVar45 = local_770 + lVar43 * 8 + local_990 * -8;
                lVar56 = (local_768 + lVar43 * 8 + local_990 * -8) * lVar31 + local_988 * -8;
                lVar87 = lVar109 * lVar31 + local_988 * -8;
                lVar38 = (local_778 + lVar43 * 8 + local_990 * -8) * lVar31 + local_988 * -8;
                lVar66 = (lVar33 + -8) * lVar31 + local_988 * -8;
                lVar79 = (lVar109 + -8) * lVar31 + local_988 * -8;
                local_b70 = (lVar45 + -8) * lVar31 + local_988 * -8;
                lVar109 = lVar33 * lVar31 + local_988 * -8;
                local_e88 = lVar43 + -1;
                lVar33 = lVar43;
                iVar41 = local_e38.smallend.vect[2];
                while (iVar41 = iVar41 + 1, lVar33 <= local_e38.bigend.vect[2]) {
                  lVar70 = CONCAT44(bx_1.bigend.vect[2],bx_1.bigend.vect[1]) * 4;
                  lVar111 = bx_1.smallend.vect._0_8_ + lVar42 * 4;
                  lVar92 = (lVar33 - (int)local_c60) * lVar70 + (long)local_c68 * -4 + lVar111;
                  lVar111 = (local_e88 - (int)local_c60) * lVar70 + (long)local_c68 * -4 + lVar111;
                  lVar100 = CONCAT44(bx_1.bigend.vect[0],bx_1.smallend.vect[2]) * 4;
                  lVar70 = (long)local_e38.smallend.vect[1];
                  while (lVar47 = lVar70, lVar47 <= local_e38.bigend.vect[1]) {
                    if (local_e38.bigend.vect[0] < local_e38.smallend.vect[0]) {
                      lVar70 = lVar47 + 1;
                    }
                    else {
                      lVar105 = lVar47 - local_980.begin.y;
                      lVar89 = CONCAT44(local_980.jstride._4_4_,(undefined4)local_980.jstride);
                      lVar101 = (long)local_980.begin.z;
                      lVar114 = local_980.kstride * (lVar33 - lVar101);
                      lVar98 = (lVar47 + -1) - (long)local_980.begin.y;
                      lVar91 = (long)((int)(lVar47 + 1) - local_980.begin.y);
                      lVar69 = ((lVar33 + -1) - lVar101) * local_980.kstride;
                      lVar95 = ((int)(lVar33 + 1) - local_980.begin.z) * local_980.kstride;
                      lVar70 = local_980.kstride * 8;
                      lVar39 = (iVar41 - local_980.begin.z) * lVar70;
                      lVar34 = (local_e88 - lVar101) * lVar70;
                      lVar70 = lVar70 * (lVar33 - lVar101);
                      lVar67 = lVar89 * 8;
                      lVar35 = lVar105 * lVar67;
                      lVar58 = lVar98 * lVar67;
                      lVar67 = lVar67 * lVar91;
                      lVar101 = (long)local_980.begin.x;
                      lVar112 = CONCAT44(local_980.p._4_4_,local_980.p._0_4_);
                      lVar94 = lVar112 + lVar42 * 8;
                      lVar104 = lVar35 + lVar39 + lVar101 * -8 + lVar94;
                      lVar72 = lVar35 + lVar34 + lVar101 * -8 + lVar94;
                      lVar106 = lVar35 + lVar70 + lVar101 * -8 + lVar94;
                      lVar77 = lVar39 + lVar58 + lVar101 * -8 + lVar94;
                      lVar35 = lVar34 + lVar58 + lVar101 * -8 + lVar94;
                      lVar99 = lVar58 + lVar70 + lVar101 * -8 + lVar94;
                      lVar96 = lVar39 + lVar67 + lVar101 * -8 + lVar94;
                      lVar85 = lVar34 + lVar67 + lVar101 * -8 + lVar94;
                      lVar94 = lVar67 + lVar70 + lVar101 * -8 + lVar94;
                      lVar39 = (lVar47 - local_a08.begin.y) * local_a08.jstride * 8 +
                               (lVar33 - local_a08.begin.z) * local_a08.kstride * 8 +
                               (long)local_a08.begin.x * -8 + lVar42 * 8;
                      lVar65 = ((lVar47 + -1) - (long)(int)local_c64) * lVar100;
                      lVar101 = lVar92 + lVar65;
                      lVar65 = lVar65 + lVar111;
                      lVar75 = (lVar47 - (int)local_c64) * lVar100;
                      lVar34 = lVar92 + lVar75;
                      lVar75 = lVar75 + lVar111;
                      lVar58 = (lVar56 + -8 + lVar47 * 8) * local_ad0;
                      lVar67 = (lVar87 + -8 + lVar47 * 8) * local_ad0;
                      lVar44 = (lVar38 + -8 + lVar47 * 8) * local_ad0;
                      lVar48 = (lVar66 + lVar47 * 8) * local_ad0;
                      lVar93 = (lVar79 + lVar47 * 8) * local_ad0;
                      lVar59 = ((lVar62 + -8) * lVar31 + local_988 * -8 + lVar47 * 8) * local_ad0;
                      lVar63 = (local_b70 + lVar47 * 8) * local_ad0;
                      lVar64 = ((lVar43 - local_990) * lVar31 * 8 + local_988 * -8 + lVar47 * 8) *
                               local_ad0;
                      lVar68 = (lVar109 + lVar47 * 8) * local_ad0;
                      lVar71 = (lVar87 + lVar47 * 8) * local_ad0;
                      lVar74 = (lVar62 * lVar31 + local_988 * -8 + lVar47 * 8) * local_ad0;
                      lVar84 = (lVar38 + lVar47 * 8) * local_ad0;
                      lVar102 = (lVar45 * lVar31 + local_988 * -8 + lVar47 * 8) * local_ad0;
                      lVar113 = (lVar56 + lVar47 * 8) * local_ad0;
                      lVar81 = ((local_758 + lVar43 * 8 + local_990 * -8) * lVar31 + local_988 * -8
                               + lVar47 * 8) * local_ad0;
                      lVar82 = (lVar66 + -8 + lVar47 * 8) * local_ad0;
                      lVar83 = (lVar79 + -8 + lVar47 * 8) * local_ad0;
                      lVar90 = (lVar109 + -8 + lVar47 * 8) * local_ad0;
                      lVar115 = 0;
                      do {
                        *(double *)((long)local_d88 + lVar115 * 8 + lVar64) =
                             -(*(double *)((long)local_d88 + lVar115 * 8 + lVar81 + -8) +
                               *(double *)((long)local_d88 + lVar115 * 8 + lVar81) +
                               *(double *)((long)local_d88 + lVar115 * 8 + lVar58) +
                               *(double *)((long)local_d88 + lVar115 * 8 + lVar113) +
                               *(double *)((long)local_d88 + lVar115 * 8 + lVar63) +
                               *(double *)((long)local_d88 + lVar115 * 8 + lVar102) +
                               *(double *)((long)local_d90 + lVar115 * 8 + lVar44) +
                               *(double *)((long)local_d90 + lVar115 * 8 + lVar44 + 8) +
                               *(double *)((long)local_d88 + lVar115 * 8 + lVar84 + -8) +
                               *(double *)((long)local_d88 + lVar115 * 8 + lVar84) +
                               *(double *)((long)local_d88 + lVar115 * 8 + lVar59 + -8) +
                               *(double *)((long)local_d88 + lVar115 * 8 + lVar59) +
                               *(double *)((long)local_d88 + lVar115 * 8 + lVar74 + -8) +
                               *(double *)((long)local_d88 + lVar115 * 8 + lVar74) +
                               *(double *)((long)local_d88 + lVar115 * 8 + lVar83) +
                               *(double *)((long)local_d88 + lVar115 * 8 + lVar93) +
                               *(double *)((long)local_d88 + lVar115 * 8 + lVar67) +
                               *(double *)((long)local_d88 + lVar115 * 8 + lVar71) +
                               *(double *)((long)local_d88 + lVar115 * 8 + lVar82 + -8) +
                               *(double *)((long)local_d88 + lVar115 * 8 + lVar82) +
                               *(double *)((long)local_d88 + lVar115 * 8 + lVar48 + -8) +
                               *(double *)((long)local_d88 + lVar115 * 8 + lVar48) +
                               *(double *)((long)local_d88 + lVar115 * 8 + lVar90 + -8) +
                               *(double *)((long)local_d88 + lVar115 * 8 + lVar90) +
                               *(double *)((long)local_d88 + lVar115 * 8 + lVar68 + -8) +
                              *(double *)((long)local_d88 + lVar115 * 8 + lVar68));
                        *(double *)
                         ((long)local_d88 +
                         lVar115 * 8 +
                         ((lVar37 * 0x40 + lVar43 * 8 + local_990 * -8) * lVar31 + local_988 * -8 +
                         lVar47 * 8) * local_ad0) =
                             1.0 / (ABS(*(double *)((long)local_d88 + lVar115 * 8 + lVar68)) +
                                    ABS(*(double *)((long)local_d88 + lVar115 * 8 + lVar68 + -8)) +
                                    ABS(*(double *)((long)local_d88 + lVar115 * 8 + lVar90)) +
                                    ABS(*(double *)((long)local_d88 + lVar115 * 8 + lVar90 + -8)) +
                                    ABS(*(double *)((long)local_d88 + lVar115 * 8 + lVar48)) +
                                    ABS(*(double *)((long)local_d88 + lVar115 * 8 + lVar48 + -8)) +
                                    ABS(*(double *)((long)local_d88 + lVar115 * 8 + lVar82)) +
                                    ABS(*(double *)((long)local_d88 + lVar115 * 8 + lVar82 + -8)) +
                                    ABS(*(double *)((long)local_d88 + lVar115 * 8 + lVar71)) +
                                    ABS(*(double *)((long)local_d88 + lVar115 * 8 + lVar67)) +
                                    ABS(*(double *)((long)local_d88 + lVar115 * 8 + lVar93)) +
                                    ABS(*(double *)((long)local_d88 + lVar115 * 8 + lVar83)) +
                                    ABS(*(double *)((long)local_d88 + lVar115 * 8 + lVar74)) +
                                    ABS(*(double *)((long)local_d88 + lVar115 * 8 + lVar74 + -8)) +
                                    ABS(*(double *)((long)local_d88 + lVar115 * 8 + lVar59)) +
                                    ABS(*(double *)((long)local_d88 + lVar115 * 8 + lVar59 + -8)) +
                                    ABS(*(double *)((long)local_d88 + lVar115 * 8 + lVar84)) +
                                    ABS(*(double *)((long)local_d88 + lVar115 * 8 + lVar84 + -8)) +
                                    ABS(*(double *)((long)local_d90 + lVar115 * 8 + lVar44 + 8)) +
                                    ABS(*(double *)((long)local_d90 + lVar115 * 8 + lVar44)) +
                                    ABS(*(double *)((long)local_d88 + lVar115 * 8 + lVar102)) +
                                    ABS(*(double *)((long)local_d88 + lVar115 * 8 + lVar63)) +
                                    ABS(*(double *)((long)local_d88 + lVar115 * 8 + lVar113)) +
                                    ABS(*(double *)((long)local_d88 + lVar115 * 8 + lVar58)) +
                                    ABS(*(double *)((long)local_d88 + lVar115 * 8 + lVar81)) +
                                    ABS(*(double *)((long)local_d88 + lVar115 * 8 + lVar81 + -8)) +
                                   1e-100);
                        dVar124 = 0.0;
                        if (*(int *)((lVar47 - local_b58.begin.y) *
                                     CONCAT44(local_b58.jstride._4_4_,(undefined4)local_b58.jstride)
                                     * 4 + (lVar33 - local_b58.begin.z) * local_b58.kstride * 4 +
                                           (long)local_b58.begin.x * -4 +
                                           CONCAT44(local_b58.p._4_4_,(int)local_b58.p) + lVar42 * 4
                                    + lVar115 * 4) == 0) {
                          lVar52 = (long)(((local_e38.smallend.vect[0] + 1) - local_980.begin.x) +
                                         (int)lVar115);
                          lVar70 = lVar112 + lVar89 * lVar105 * 8 + lVar52 * 8;
                          lVar4 = lVar112 + lVar89 * lVar98 * 8 + lVar52 * 8;
                          lVar52 = lVar112 + lVar89 * lVar91 * 8 + lVar52 * 8;
                          dVar124 = *(double *)(lVar52 + lVar95 * 8) *
                                    *(double *)((long)local_d88 + lVar115 * 8 + lVar68) +
                                    *(double *)(lVar96 + -8 + lVar115 * 8) *
                                    *(double *)((long)local_d88 + lVar115 * 8 + lVar68 + -8) +
                                    *(double *)(lVar4 + lVar95 * 8) *
                                    *(double *)((long)local_d88 + lVar115 * 8 + lVar90) +
                                    *(double *)(lVar77 + -8 + lVar115 * 8) *
                                    *(double *)((long)local_d88 + lVar115 * 8 + lVar90 + -8) +
                                    *(double *)(lVar52 + lVar69 * 8) *
                                    *(double *)((long)local_d88 + lVar115 * 8 + lVar48) +
                                    *(double *)(lVar85 + -8 + lVar115 * 8) *
                                    *(double *)((long)local_d88 + lVar115 * 8 + lVar48 + -8) +
                                    *(double *)(lVar4 + lVar69 * 8) *
                                    *(double *)((long)local_d88 + lVar115 * 8 + lVar82) +
                                    *(double *)(lVar35 + -8 + lVar115 * 8) *
                                    *(double *)((long)local_d88 + lVar115 * 8 + lVar82 + -8) +
                                    *(double *)(lVar96 + lVar115 * 8) *
                                    *(double *)((long)local_d88 + lVar115 * 8 + lVar71) +
                                    *(double *)(lVar77 + lVar115 * 8) *
                                    *(double *)((long)local_d88 + lVar115 * 8 + lVar67) +
                                    *(double *)(lVar85 + lVar115 * 8) *
                                    *(double *)((long)local_d88 + lVar115 * 8 + lVar93) +
                                    *(double *)(lVar35 + lVar115 * 8) *
                                    *(double *)((long)local_d88 + lVar115 * 8 + lVar83) +
                                    *(double *)(lVar70 + lVar95 * 8) *
                                    *(double *)((long)local_d88 + lVar115 * 8 + lVar74) +
                                    *(double *)(lVar104 + -8 + lVar115 * 8) *
                                    *(double *)((long)local_d88 + lVar115 * 8 + lVar74 + -8) +
                                    *(double *)(lVar70 + lVar69 * 8) *
                                    *(double *)((long)local_d88 + lVar115 * 8 + lVar59) +
                                    *(double *)(lVar72 + -8 + lVar115 * 8) *
                                    *(double *)((long)local_d88 + lVar115 * 8 + lVar59 + -8) +
                                    *(double *)(lVar52 + lVar114 * 8) *
                                    *(double *)((long)local_d88 + lVar115 * 8 + lVar84) +
                                    *(double *)(lVar94 + -8 + lVar115 * 8) *
                                    *(double *)((long)local_d88 + lVar115 * 8 + lVar84 + -8) +
                                    *(double *)(lVar4 + lVar114 * 8) *
                                    *(double *)((long)local_d90 + lVar115 * 8 + lVar44 + 8) +
                                    *(double *)(lVar99 + -8 + lVar115 * 8) *
                                    *(double *)((long)local_d90 + lVar115 * 8 + lVar44) +
                                    *(double *)(lVar104 + lVar115 * 8) *
                                    *(double *)((long)local_d88 + lVar115 * 8 + lVar102) +
                                    *(double *)(lVar72 + lVar115 * 8) *
                                    *(double *)((long)local_d88 + lVar115 * 8 + lVar63) +
                                    *(double *)(lVar94 + lVar115 * 8) *
                                    *(double *)((long)local_d88 + lVar115 * 8 + lVar113) +
                                    *(double *)(lVar99 + lVar115 * 8) *
                                    *(double *)((long)local_d88 + lVar115 * 8 + lVar58) +
                                    *(double *)(lVar70 + lVar114 * 8) *
                                    *(double *)((long)local_d88 + lVar115 * 8 + lVar81) +
                                    *(double *)(lVar106 + lVar115 * 8) *
                                    *(double *)((long)local_d88 + lVar115 * 8 + lVar64) +
                                    *(double *)(lVar106 + -8 + lVar115 * 8) *
                                    *(double *)((long)local_d88 + lVar115 * 8 + lVar81 + -8);
                        }
                        *(double *)((long)local_a08.p + lVar115 * 8 + lVar39) = dVar124;
                        if (((*(int *)(lVar65 + -4 + lVar115 * 4) == 0) ||
                            (*(int *)(lVar65 + lVar115 * 4) == 0)) ||
                           (((*(int *)(lVar75 + -4 + lVar115 * 4) == 0 ||
                             ((((*(int *)(lVar75 + lVar115 * 4) == 0 ||
                                (*(int *)(lVar101 + -4 + lVar115 * 4) == 0)) ||
                               (*(int *)(lVar101 + lVar115 * 4) == 0)) ||
                              ((*(int *)(lVar34 + -4 + lVar115 * 4) == 0 ||
                               (dVar134 = 0.0, *(int *)(lVar34 + lVar115 * 4) == 0)))))) &&
                            ((*(int *)(lVar75 + -4 + lVar115 * 4) == 0 ||
                             (((*(int *)(lVar75 + lVar115 * 4) == 0 ||
                               (*(int *)(lVar101 + -4 + lVar115 * 4) == 0)) ||
                              ((*(int *)(lVar101 + lVar115 * 4) == 0 ||
                               ((*(int *)(lVar34 + -4 + lVar115 * 4) == 0 ||
                                (dVar134 = 0.0, *(int *)(lVar34 + lVar115 * 4) == 0)))))))))))) {
                          if (((bx.smallend.vect[0] - lVar42 != lVar115) ||
                              ((dVar134 = 2.0, iVar57 != 0x66 && (dVar134 = 2.0, iVar57 != 0x6a))))
                             && (dVar134 = 1.0, bx.bigend.vect[0] - lVar42 == lVar115)) {
                            dVar134 = dVar8;
                          }
                          if ((lVar47 == bx.smallend.vect[1]) &&
                             ((local_d80 == 0x6a || (local_d80 == 0x66)))) {
                            dVar134 = dVar134 + dVar134;
                          }
                          else if ((lVar47 == bx.bigend.vect[1]) &&
                                  ((local_ce8 == 0x6a || (local_ce8 == 0x66)))) {
                            dVar134 = dVar134 + dVar134;
                          }
                          if ((lVar33 == bx.smallend.vect[2]) &&
                             ((LVar19 == inflow || (LVar19 == Neumann)))) {
                            dVar134 = dVar134 + dVar134;
                          }
                          else if ((lVar33 == bx.bigend.vect[2]) &&
                                  ((LVar20 == inflow || (LVar20 == Neumann)))) {
                            dVar134 = dVar134 + dVar134;
                          }
                          dVar134 = (*(double *)
                                      ((long)pdVar76 +
                                      lVar115 * 8 +
                                      ((lVar43 - local_b00) * local_ba0 * 8 + local_af8 * -8 +
                                      lVar47 * 8) * lVar73) - dVar124) * dVar134;
                        }
                        *(double *)((long)local_a08.p + lVar115 * 8 + lVar39) = dVar134;
                        lVar115 = lVar115 + 1;
                        lVar70 = lVar47 + 1;
                      } while ((local_e38.bigend.vect[0] - local_e38.smallend.vect[0]) + 1 !=
                               (int)lVar115);
                    }
                  }
                  local_e88 = local_e88 + 1;
                  pdVar76 = pdVar76 + local_ba0 * lVar73;
                  local_d88 = local_d88 + lVar88;
                  local_d90 = local_d90 + lVar88;
                  lVar33 = lVar33 + 1;
                }
                local_998 = local_998 * 8;
                local_988 = local_988 * 8;
                Gpu::Elixir::~Elixir(&cneli);
                Gpu::Elixir::~Elixir(&steneli);
              }
              else {
                MFIter::validbox((Box *)local_be0,&mfi_1);
                bx_6.smallend.vect._0_8_ = CONCAT44(local_be0._4_4_,local_be0._0_4_);
                bx_6.bigend.vect[1] = local_be0._16_4_;
                bx_6.bigend.vect[2] = local_be0._20_4_;
                bx_6.btype.itype = local_be0._24_4_;
                bx_6.smallend.vect[2] = local_be0._8_4_;
                bx_6.bigend.vect[0] = local_be0._12_4_;
                for (lVar37 = 0; lVar37 != 3; lVar37 = lVar37 + 1) {
                  if (((uint)local_be0._24_4_ >> ((uint)lVar37 & 0x1f) & 1) != 0) {
                    piVar80 = bx_6.bigend.vect + lVar37;
                    *piVar80 = *piVar80 + -1;
                  }
                }
                lhs_1.btype = bx_2.btype;
                uVar141 = CONCAT44(-(uint)((int)local_be0._4_4_ < bx_2.smallend.vect[1]),
                                   -(uint)((int)local_be0._0_4_ < bx_2.smallend.vect[0]));
                lhs_1.smallend.vect._0_8_ =
                     ~uVar141 & bx_6.smallend.vect._0_8_ |
                     CONCAT44(bx_2.smallend.vect[1],bx_2.smallend.vect[0]) & uVar141;
                lhs_1.smallend.vect[2] = local_be0._8_4_;
                if ((int)local_be0._8_4_ < bx_2.smallend.vect[2]) {
                  lhs_1.smallend.vect[2] = bx_2.smallend.vect[2];
                }
                uVar141 = CONCAT44(-(uint)(bx_2.bigend.vect[1] < bx_6.bigend.vect[1]),
                                   -(uint)(bx_2.bigend.vect[0] < bx_6.bigend.vect[0]));
                uVar141 = ~uVar141 & CONCAT44(bx_6.bigend.vect[1],bx_6.bigend.vect[0]) |
                          CONCAT44(bx_2.bigend.vect[1],bx_2.bigend.vect[0]) & uVar141;
                lhs_1.bigend.vect[0] = (int)uVar141;
                lhs_1.bigend.vect[1] = (int)(uVar141 >> 0x20);
                lhs_1.bigend.vect[2] = bx_6.bigend.vect[2];
                if (bx_2.bigend.vect[2] < bx_6.bigend.vect[2]) {
                  lhs_1.bigend.vect[2] = bx_2.bigend.vect[2];
                }
                this_02 = (FabArray<amrex::FArrayBox> *)*puVar24;
                if (this_02 == (FabArray<amrex::FArrayBox> *)0x0) {
                  RVar18 = this->m_const_sigma;
                  lVar38 = (long)bx_2.smallend.vect[0];
                  lVar62 = (long)bx_2.smallend.vect[1];
                  lVar43 = (long)bx_2.smallend.vect[2];
                  lVar42 = (long)bx_2.bigend.vect[0];
                  lVar37 = (long)bx_2.bigend.vect[1];
                  lVar109 = (long)bx_2.bigend.vect[2];
                  pRVar53 = (Real *)((lVar62 * 8 + (lVar43 - lVar56) * lVar31 * 8 + lVar33 * -8) *
                                     lVar100 + lVar38 * 8 + lVar87 * -8 + (long)pdVar26);
                  for (; pRVar54 = pRVar53, lVar45 = lVar62, lVar43 <= lVar109; lVar43 = lVar43 + 1)
                  {
                    for (; lVar79 = lVar38, pRVar107 = pRVar54, lVar45 <= lVar37;
                        lVar45 = lVar45 + 1) {
                      for (; lVar79 <= lVar42; lVar79 = lVar79 + 1) {
                        bx_6.smallend.vect[1] = (int)lVar45;
                        bx_6.smallend.vect[0] = (int)lVar79;
                        bx_6.smallend.vect[2] = (int)lVar43;
                        bVar27 = Box::contains(&lhs_1,&bx_6.smallend);
                        if ((!bVar27) ||
                           (RVar126 = RVar18,
                           *(int *)((lVar45 - (int)local_c64) *
                                    CONCAT44(bx_1.bigend.vect[0],bx_1.smallend.vect[2]) * 4 +
                                    (lVar43 - (int)local_c60) *
                                    CONCAT44(bx_1.bigend.vect[2],bx_1.bigend.vect[1]) * 4 +
                                    (long)local_c68 * -4 + bx_1.smallend.vect._0_8_ + lVar79 * 4) ==
                           0)) {
                          RVar126 = 0.0;
                        }
                        *pRVar107 = RVar126;
                        pRVar107 = pRVar107 + 1;
                      }
                      pRVar54 = pRVar54 + lVar100;
                    }
                    pRVar53 = pRVar53 + lVar111;
                  }
                }
                else {
                  FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                            ((Array4<const_double> *)&bx_6,this_02,&mfi_1);
                  lVar38 = (long)bx_2.smallend.vect[0];
                  lVar62 = (long)bx_2.smallend.vect[1];
                  lVar43 = (long)bx_2.smallend.vect[2];
                  lVar42 = (long)bx_2.bigend.vect[0];
                  lVar37 = (long)bx_2.bigend.vect[1];
                  lVar109 = (long)bx_2.bigend.vect[2];
                  puVar50 = (undefined8 *)
                            ((lVar62 * 8 + (lVar43 - lVar56) * lVar31 * 8 + lVar33 * -8) * lVar100 +
                             lVar38 * 8 + lVar87 * -8 + (long)pdVar26);
                  for (; puVar51 = puVar50, lVar45 = lVar62, lVar43 <= lVar109; lVar43 = lVar43 + 1)
                  {
                    for (; lVar79 = lVar38, puVar40 = puVar51, lVar45 <= lVar37; lVar45 = lVar45 + 1
                        ) {
                      for (; lVar79 <= lVar42; lVar79 = lVar79 + 1) {
                        local_be0._0_4_ = (undefined4)lVar79;
                        local_be0._4_4_ = (undefined4)lVar45;
                        local_be0._8_4_ = (undefined4)lVar43;
                        bVar27 = Box::contains(&lhs_1,(IntVect *)local_be0);
                        if ((bVar27) &&
                           (*(int *)((lVar45 - (int)local_c64) *
                                     CONCAT44(bx_1.bigend.vect[0],bx_1.smallend.vect[2]) * 4 +
                                     (lVar43 - (int)local_c60) *
                                     CONCAT44(bx_1.bigend.vect[2],bx_1.bigend.vect[1]) * 4 +
                                     (long)local_c68 * -4 + bx_1.smallend.vect._0_8_ + lVar79 * 4)
                            != 0)) {
                          uVar125 = *(undefined8 *)
                                     ((lVar45 - local_a24) *
                                      CONCAT44(bx_6.bigend.vect[0],bx_6.smallend.vect[2]) * 8 +
                                      (lVar43 - local_a20) *
                                      CONCAT44(bx_6.bigend.vect[2],bx_6.bigend.vect[1]) * 8 +
                                      (long)local_a28 * -8 + bx_6.smallend.vect._0_8_ + lVar79 * 8);
                        }
                        else {
                          uVar125 = 0;
                        }
                        *puVar40 = uVar125;
                        puVar40 = puVar40 + 1;
                      }
                      puVar51 = puVar51 + lVar100;
                    }
                    puVar50 = puVar50 + lVar111;
                  }
                }
                lVar109 = (long)local_e38.smallend.vect[0];
                lVar37 = (long)local_e38.smallend.vect[2];
                pdVar76 = pdVar76 + (lVar109 - local_b08);
                local_f28 = lVar37 + -1;
                local_ec0 = pdVar26 + (lVar109 - lVar87);
                local_ef0 = pdVar26 + ((lVar109 + -1) - lVar87);
                lVar87 = (lVar37 - lVar56) * lVar31 * 8 + lVar33 * -8;
                lVar56 = (local_f28 - lVar56) * lVar31 * 8 + lVar33 * -8;
                lVar31 = lVar37;
                iVar41 = local_e38.smallend.vect[2];
                while (iVar41 = iVar41 + 1, lVar31 <= local_e38.bigend.vect[2]) {
                  lVar62 = CONCAT44(bx_1.bigend.vect[2],bx_1.bigend.vect[1]);
                  lVar43 = (int)(~local_c60 + (int)lVar31) * lVar62;
                  lVar45 = lVar62 * (lVar31 - (int)local_c60);
                  lVar33 = bx_1.smallend.vect._0_8_ + lVar109 * 4;
                  lVar42 = (lVar31 - (int)local_c60) * lVar62 * 4 + (long)local_c68 * -4 + lVar33;
                  lVar33 = (long)(int)((int)local_f28 - local_c60) * lVar62 * 4 +
                           (long)local_c68 * -4 + lVar33;
                  lVar62 = CONCAT44(bx_1.bigend.vect[0],bx_1.smallend.vect[2]);
                  lVar38 = (long)local_e38.smallend.vect[1];
                  while (lVar79 = lVar38, lVar79 <= local_e38.bigend.vect[1]) {
                    if (local_e38.bigend.vect[0] < local_e38.smallend.vect[0]) {
                      lVar38 = lVar79 + 1;
                    }
                    else {
                      lVar92 = lVar79 - local_980.begin.y;
                      lVar88 = CONCAT44(local_980.jstride._4_4_,(undefined4)local_980.jstride);
                      lVar38 = (long)local_980.begin.z;
                      lVar59 = local_980.kstride * (lVar31 - lVar38);
                      lVar81 = (long)local_a08.begin.x;
                      lVar90 = (lVar79 - local_a08.begin.y) * local_a08.jstride;
                      lVar48 = (lVar31 - local_a08.begin.z) * local_a08.kstride;
                      lVar67 = ((lVar31 + -1) - lVar38) * local_980.kstride;
                      lVar63 = (long)((int)(lVar79 + 1) - local_980.begin.y);
                      lVar58 = ((int)(lVar31 + 1) - local_980.begin.z) * local_980.kstride;
                      lVar39 = local_980.kstride * 8;
                      lVar66 = (iVar41 - local_980.begin.z) * lVar39;
                      lVar89 = (local_f28 - lVar38) * lVar39;
                      lVar39 = lVar39 * (lVar31 - lVar38);
                      lVar35 = lVar88 * 8;
                      lVar112 = lVar92 * lVar35;
                      lVar101 = (lVar92 + -1) * lVar35;
                      lVar35 = lVar35 * lVar63;
                      lVar38 = (long)local_980.begin.x;
                      lVar70 = CONCAT44(local_980.p._4_4_,local_980.p._0_4_);
                      lVar64 = lVar70 + lVar109 * 8;
                      lVar113 = lVar112 + lVar66 + lVar38 * -8 + lVar64;
                      lVar47 = lVar112 + lVar89 + lVar38 * -8 + lVar64;
                      lVar82 = lVar112 + lVar39 + lVar38 * -8 + lVar64;
                      lVar93 = lVar101 + lVar39 + lVar38 * -8 + lVar64;
                      lVar68 = lVar101 + lVar66 + lVar38 * -8 + lVar64;
                      lVar101 = lVar101 + lVar89 + lVar38 * -8 + lVar64;
                      lVar102 = lVar39 + lVar35 + lVar38 * -8 + lVar64;
                      lVar44 = lVar66 + lVar35 + lVar38 * -8 + lVar64;
                      lVar64 = lVar35 + lVar89 + lVar38 * -8 + lVar64;
                      lVar71 = (long)(int)(~local_c64 + (int)lVar79);
                      lVar83 = (lVar79 - (int)local_c64) * lVar62 * 4;
                      lVar66 = lVar42 + lVar83;
                      lVar83 = lVar83 + lVar33;
                      lVar74 = lVar71 * lVar62 * 4;
                      lVar112 = lVar42 + lVar74;
                      lVar89 = (lVar87 + lVar79 * 8) * lVar100;
                      lVar39 = (lVar56 + lVar79 * 8) * lVar100;
                      lVar35 = (lVar87 + -8 + lVar79 * 8) * lVar100;
                      lVar34 = (lVar56 + -8 + lVar79 * 8) * lVar100;
                      lVar94 = 0;
                      do {
                        dVar124 = 0.0;
                        if (*(int *)((lVar79 - local_b58.begin.y) *
                                     CONCAT44(local_b58.jstride._4_4_,(undefined4)local_b58.jstride)
                                     * 4 + (lVar31 - local_b58.begin.z) * local_b58.kstride * 4 +
                                           (long)local_b58.begin.x * -4 +
                                           CONCAT44(local_b58.p._4_4_,(int)local_b58.p) +
                                           lVar109 * 4 + lVar94 * 4) == 0) {
                          dVar124 = *(double *)((long)local_ec0 + lVar94 * 8 + lVar34 + -8);
                          dVar134 = *(double *)((long)local_ec0 + lVar94 * 8 + lVar34);
                          dVar135 = dVar124 + dVar134;
                          dVar142 = *(double *)((long)local_ef0 + lVar94 * 8 + lVar39);
                          dVar146 = *(double *)((long)local_ef0 + lVar94 * 8 + lVar39 + 8);
                          dVar127 = dVar135 + dVar142 + dVar146;
                          dVar149 = *(double *)((long)local_ec0 + lVar94 * 8 + lVar35 + -8);
                          dVar147 = *(double *)((long)local_ec0 + lVar94 * 8 + lVar35);
                          dVar9 = *(double *)((long)local_ec0 + lVar94 * 8 + lVar89 + -8);
                          dVar118 = *(double *)((long)local_ec0 + lVar94 * 8 + lVar89);
                          lVar69 = (long)(((local_e38.smallend.vect[0] + 1) - local_980.begin.x) +
                                         (int)lVar94);
                          lVar38 = lVar70 + lVar88 * (lVar92 + -1) * 8 + lVar69 * 8;
                          lVar65 = lVar70 + lVar88 * lVar63 * 8 + lVar69 * 8;
                          lVar69 = lVar70 + lVar88 * lVar92 * 8 + lVar69 * 8;
                          dVar124 = (dVar127 * *(double *)(lVar47 + lVar94 * 8) +
                                    (dVar149 + dVar147 + dVar9 + dVar118) *
                                    *(double *)(lVar113 + lVar94 * 8)) *
                                    ((dVar155 - dVar148) + dVar140) +
                                    ((dVar135 + dVar149 + dVar147) *
                                     *(double *)(lVar93 + lVar94 * 8) +
                                    (dVar142 + dVar146 + dVar9 + dVar118) *
                                    *(double *)(lVar102 + lVar94 * 8)) *
                                    (dVar155 + dVar150 + dVar128 * -2.0) +
                                    ((dVar124 + dVar142 + dVar149 + dVar9) *
                                     *(double *)(lVar82 + -8 + lVar94 * 8) +
                                    (dVar134 + dVar146 + dVar147 + dVar118) *
                                    *(double *)(lVar69 + lVar59 * 8)) *
                                    ((dVar116 - dVar148) + dVar128 * -2.0) +
                                    ((dVar146 + dVar118) * *(double *)(lVar65 + lVar59 * 8) +
                                    (dVar142 + dVar9) * *(double *)(lVar102 + -8 + lVar94 * 8) +
                                    (dVar124 + dVar149) * *(double *)(lVar93 + -8 + lVar94 * 8) +
                                    (dVar134 + dVar147) * *(double *)(lVar38 + lVar59 * 8)) *
                                    ((dVar138 + dVar148) - dVar128) +
                                    ((dVar147 + dVar118) * *(double *)(lVar69 + lVar58 * 8) +
                                    (dVar149 + dVar9) * *(double *)(lVar113 + -8 + lVar94 * 8) +
                                    *(double *)(lVar47 + -8 + lVar94 * 8) * (dVar124 + dVar142) +
                                    *(double *)(lVar69 + lVar67 * 8) * (dVar134 + dVar146)) *
                                    ((dVar138 - dVar145) + dVar153) +
                                    ((dVar9 + dVar118) * *(double *)(lVar44 + lVar94 * 8) +
                                    *(double *)(lVar68 + lVar94 * 8) * (dVar149 + dVar147) +
                                    *(double *)(lVar101 + lVar94 * 8) * dVar135 +
                                    *(double *)(lVar64 + lVar94 * 8) * (dVar142 + dVar146)) *
                                    ((dVar148 - dVar137) + dVar153) +
                                    (*(double *)(lVar65 + lVar58 * 8) * dVar118 +
                                    *(double *)(lVar44 + -8 + lVar94 * 8) * dVar9 +
                                    *(double *)(lVar38 + lVar58 * 8) * dVar147 +
                                    *(double *)(lVar68 + -8 + lVar94 * 8) * dVar149 +
                                    *(double *)(lVar65 + lVar67 * 8) * dVar146 +
                                    *(double *)(lVar64 + -8 + lVar94 * 8) * dVar142 +
                                    *(double *)(lVar101 + -8 + lVar94 * 8) * dVar124 +
                                    *(double *)(lVar38 + lVar67 * 8) * dVar134) * dVar117 +
                                    (dVar127 + dVar149 + dVar147 + dVar9 + dVar118) *
                                    *(double *)(lVar82 + lVar94 * 8) * -4.0 * dVar117;
                        }
                        *(double *)
                         ((long)local_a08.p +
                         lVar94 * 8 +
                         (lVar79 - local_a08.begin.y) * local_a08.jstride * 8 +
                         (lVar31 - local_a08.begin.z) * local_a08.kstride * 8 +
                         (long)local_a08.begin.x * -8 + lVar109 * 8) = dVar124;
                        lVar65 = (long)(((local_e38.smallend.vect[0] + -1) - local_c68) +
                                       (int)lVar94);
                        lVar38 = bx_1.smallend.vect._0_8_ + lVar62 * lVar71 * 4 + lVar65 * 4;
                        if (((*(int *)(lVar38 + lVar43 * 4) == 0) ||
                            (*(int *)(lVar74 + lVar33 + lVar94 * 4) == 0)) ||
                           ((((lVar65 = bx_1.smallend.vect._0_8_ +
                                        lVar62 * (lVar79 - (int)local_c64) * 4 + lVar65 * 4,
                              *(int *)(lVar65 + lVar43 * 4) == 0 ||
                              (((*(int *)(lVar83 + lVar94 * 4) == 0 ||
                                (*(int *)(lVar38 + lVar45 * 4) == 0)) ||
                               (*(int *)(lVar112 + lVar94 * 4) == 0)))) ||
                             ((*(int *)(lVar65 + lVar45 * 4) == 0 ||
                              (*(int *)(lVar66 + lVar94 * 4) == 0)))) &&
                            ((*(int *)(lVar65 + lVar43 * 4) == 0 ||
                             (((*(int *)(lVar83 + lVar94 * 4) == 0 ||
                               (*(int *)(lVar38 + lVar45 * 4) == 0)) ||
                              ((*(int *)(lVar112 + lVar94 * 4) == 0 ||
                               ((*(int *)(lVar65 + lVar45 * 4) == 0 ||
                                (*(int *)(lVar66 + lVar94 * 4) == 0)))))))))))) {
                          if (((bx.smallend.vect[0] - lVar109 != lVar94) ||
                              ((dVar124 = 2.0, iVar57 != 0x66 && (dVar124 = 2.0, iVar57 != 0x6a))))
                             && (dVar124 = 1.0, bx.bigend.vect[0] - lVar109 == lVar94)) {
                            dVar124 = dVar8;
                          }
                          if (((lVar79 == bx.smallend.vect[1]) &&
                              ((local_d80 == 0x6a || (local_d80 == 0x66)))) ||
                             ((lVar79 == bx.bigend.vect[1] &&
                              ((local_ce8 == 0x6a || (local_ce8 == 0x66)))))) {
                            dVar124 = dVar124 + dVar124;
                          }
                          if (((lVar31 == bx.smallend.vect[2]) &&
                              ((LVar19 == inflow || (LVar19 == Neumann)))) ||
                             ((lVar31 == bx.bigend.vect[2] &&
                              ((LVar20 == inflow || (LVar20 == Neumann)))))) {
                            dVar124 = dVar124 + dVar124;
                          }
                          local_a08.p[lVar109 + ((lVar90 + lVar48 + lVar94) - lVar81)] =
                               (*(double *)
                                 ((long)pdVar76 +
                                 lVar94 * 8 +
                                 ((lVar37 - local_b00) * local_ba0 * 8 + local_af8 * -8 + lVar79 * 8
                                 ) * lVar73) -
                               local_a08.p[lVar109 + ((lVar90 + lVar48 + lVar94) - lVar81)]) *
                               dVar124;
                        }
                        else {
                          local_a08.p[lVar109 + ((lVar90 + lVar48 + lVar94) - lVar81)] = 0.0;
                        }
                        lVar94 = lVar94 + 1;
                        lVar38 = lVar79 + 1;
                      } while ((local_e38.bigend.vect[0] - local_e38.smallend.vect[0]) + 1 !=
                               (int)lVar94);
                    }
                  }
                  local_f28 = local_f28 + 1;
                  pdVar76 = pdVar76 + local_ba0 * lVar73;
                  local_ec0 = local_ec0 + lVar111;
                  local_ef0 = local_ef0 + lVar111;
                  lVar31 = lVar31 + 1;
                }
              }
              Gpu::Elixir::~Elixir(&rhseli);
              Gpu::Elixir::~Elixir(&ueli);
              goto LAB_005285a7;
            }
          }
          piVar46 = piVar46 + CONCAT44(bx_1.bigend.vect[0],bx_1.smallend.vect[2]);
        }
        piVar80 = piVar80 + CONCAT44(bx_1.bigend.vect[2],bx_1.bigend.vect[1]);
      }
    }
LAB_005285a7:
    MFIter::operator++(&mfi_1);
  } while( true );
}

Assistant:

void
MLNodeLaplacian::compSyncResidualCoarse (MultiFab& sync_resid, const MultiFab& a_phi,
                                         const MultiFab& vold, const MultiFab* rhcc,
                                         const BoxArray& fine_grids, const IntVect& ref_ratio)
{
    BL_PROFILE("MLNodeLaplacian::SyncResCrse()");

    sync_resid.setVal(0.0);

    const Geometry& geom = m_geom[0][0];
    const DistributionMapping& dmap = m_dmap[0][0];
    const BoxArray& ccba = m_grids[0][0];
    const BoxArray& ndba = amrex::convert(ccba, IntVect::TheNodeVector());
    const BoxArray& ccfba = amrex::convert(fine_grids, IntVect::TheZeroVector());

    const auto lobc = LoBC();
    const auto hibc = HiBC();

    // cell-center, 1: coarse; 0: covered by fine
    const int owner = 1;
    const int nonowner = 0;
    iMultiFab crse_cc_mask = amrex::makeFineMask(ccba, dmap, IntVect(1), ccfba, ref_ratio,
                                                 geom.periodicity(), owner, nonowner);

    const Box& ccdom = geom.Domain();
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(crse_cc_mask); mfi.isValid(); ++mfi)
    {
        Array4<int> const& fab = crse_cc_mask.array(mfi);
        mlndlap_fillbc_cc<int>(mfi.validbox(),fab,ccdom,lobc,hibc);
    }

    MultiFab phi(ndba, dmap, 1, 1);
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(phi,TilingIfNotGPU()); mfi.isValid(); ++mfi)
    {
        const Box& bx = mfi.tilebox();
        const Box& gbx = mfi.growntilebox();
        Array4<Real> const& fab = phi.array(mfi);
        Array4<Real const> const& a_fab = a_phi.const_array(mfi);
        Array4<int const> const& msk = crse_cc_mask.const_array(mfi);
        AMREX_HOST_DEVICE_FOR_3D(gbx, i, j, k,
        {
            if (bx.contains(IntVect(AMREX_D_DECL(i,j,k)))) {
                fab(i,j,k) = a_fab(i,j,k);
                mlndlap_zero_fine(i,j,k,fab,msk,nonowner);
            } else {
                fab(i,j,k) = 0.0;
            }
        });
    }

    const auto& nddom = amrex::surroundingNodes(ccdom);

    const auto dxinv = geom.InvCellSizeArray();

#if (AMREX_SPACEDIM == 2)
    bool is_rz = m_is_rz;
#endif

    const auto& sigma_orig = m_sigma[0][0][0];
    const iMultiFab& dmsk = *m_dirichlet_mask[0][0];

#ifdef AMREX_USE_EB
    auto factory = dynamic_cast<EBFArrayBoxFactory const*>(m_factory[0][0].get());
    const FabArray<EBCellFlagFab>* flags = (factory) ? &(factory->getMultiEBCellFlagFab()) : nullptr;
    const MultiFab* intg = m_integral[0].get();
    const MultiFab* vfrac = (factory) ? &(factory->getVolFrac()) : nullptr;
#endif

    bool neumann_doubling = true; // yes even for RAP, because unimposeNeumannBC will be called on rhs

    MFItInfo mfi_info;
    if (Gpu::notInLaunchRegion()) mfi_info.EnableTiling().SetDynamic(true);
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    {
        FArrayBox rhs, u;
#ifdef AMREX_USE_EB
        FArrayBox sten, cn;
#endif
        for (MFIter mfi(sync_resid,mfi_info); mfi.isValid(); ++mfi)
        {
            const Box& bx = mfi.tilebox();

            auto typ = FabType::regular;
#ifdef AMREX_USE_EB
            if (factory) {
                typ = (*flags)[mfi].getType(amrex::enclosedCells(bx));
            }
#endif
            if (typ != FabType::covered)
            {
                const Box& bxg1 = amrex::grow(bx,1);
                const Box& ccbxg1 = amrex::enclosedCells(bxg1);
                Array4<int const> const& cccmsk = crse_cc_mask.const_array(mfi);

                bool has_fine;
                if (Gpu::inLaunchRegion()) {
                    AMREX_ASSERT(ccbxg1 == crse_cc_mask[mfi].box());
                    has_fine = Reduce::AnyOf(ccbxg1,
                                             [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept -> bool
                    {
                        return cccmsk(i,j,k) == nonowner;
                    });
                } else {
                    has_fine = mlndlap_any_fine_sync_cells(ccbxg1,cccmsk,nonowner);
                }

                if (has_fine)
                {
                    const Box& ccvbx = amrex::enclosedCells(mfi.validbox());

                    u.resize(ccbxg1, AMREX_SPACEDIM);
                    Elixir ueli = u.elixir();
                    Array4<Real> const& uarr = u.array();

                    Box b = ccbxg1 & ccvbx;
                    for (int idim = 0; idim < AMREX_SPACEDIM; ++idim)
                    {
                        if (m_lobc[0][idim] == LinOpBCType::inflow)
                        {
                            if (b.smallEnd(idim) == ccdom.smallEnd(idim)) {
                                b.growLo(idim, 1);
                            }
                        }
                        if (m_hibc[0][idim] == LinOpBCType::inflow)
                        {
                            if (b.bigEnd(idim) == ccdom.bigEnd(idim)) {
                                b.growHi(idim, 1);
                            }
                        }
                    }

                    Array4<Real const> const& voarr = vold.const_array(mfi);
                    AMREX_HOST_DEVICE_FOR_3D(ccbxg1, i, j, k,
                    {
                        if (b.contains(IntVect(AMREX_D_DECL(i,j,k))) && cccmsk(i,j,k)){
                            AMREX_D_TERM(uarr(i,j,k,0) = voarr(i,j,k,0);,
                                         uarr(i,j,k,1) = voarr(i,j,k,1);,
                                         uarr(i,j,k,2) = voarr(i,j,k,2););
                        } else {
                            AMREX_D_TERM(uarr(i,j,k,0) = 0.0;,
                                         uarr(i,j,k,1) = 0.0;,
                                         uarr(i,j,k,2) = 0.0;);
                        }
                    });

                    rhs.resize(bx);
                    Elixir rhseli = rhs.elixir();
                    Array4<Real> const& rhsarr = rhs.array();
                    Array4<int const> const& dmskarr = dmsk.const_array(mfi);

#ifdef AMREX_USE_EB
                    if (typ == FabType::singlevalued)
                    {
                        Array4<Real const> const& vfracarr = vfrac->const_array(mfi);
                        Array4<Real const> const& intgarr = intg->const_array(mfi);
                        AMREX_HOST_DEVICE_FOR_3D(bx, i, j, k,
                        {
                            mlndlap_divu_eb(i,j,k,rhsarr,uarr,vfracarr,intgarr,dmskarr,dxinv,nddom,lobc,hibc);
                        });
                    }
                    else
#endif
                    {
#if (AMREX_SPACEDIM == 2)
                        AMREX_HOST_DEVICE_PARALLEL_FOR_3D (bx, i, j, k,
                        {
                            mlndlap_divu(i,j,k,rhsarr,uarr,dmskarr,dxinv,nddom,lobc,hibc,is_rz);
                        });
#else
                        AMREX_HOST_DEVICE_PARALLEL_FOR_3D (bx, i, j, k,
                        {
                            mlndlap_divu(i,j,k,rhsarr,uarr,dmskarr,dxinv,nddom,lobc,hibc);
                        });
#endif
                    }

                    if (rhcc)
                    {
                        Array4<Real> rhccarr = uarr;
                        Array4<Real const> const& rhccarr_orig = rhcc->const_array(mfi);
                        const Box& b2 = ccbxg1 & ccvbx;
                        AMREX_HOST_DEVICE_FOR_3D(ccbxg1, i, j, k,
                        {
                            if (b2.contains(IntVect(AMREX_D_DECL(i,j,k))) && cccmsk(i,j,k)){
                                rhccarr(i,j,k) = rhccarr_orig(i,j,k);
                            } else {
                                rhccarr(i,j,k) = 0.0;
                            }
                        });

#ifdef AMREX_USE_EB
                        if (typ == FabType::singlevalued)
                        {
                            Array4<Real const> const& vfracarr = vfrac->const_array(mfi);
                            Array4<Real const> const& intgarr = intg->const_array(mfi);
                            AMREX_HOST_DEVICE_FOR_3D(bx, i, j, k,
                            {
                                Real rhs2 = mlndlap_rhcc_eb(i,j,k,rhccarr,vfracarr,intgarr,dmskarr);
                                rhsarr(i,j,k) += rhs2;
                            });
                        }
                        else
#endif
                        {
                            AMREX_HOST_DEVICE_FOR_3D (bx, i, j, k,
                            {
                                Real rhs2 = mlndlap_rhcc(i,j,k,rhccarr,dmskarr);
                                rhsarr(i,j,k) += rhs2;
                            });
                        }
                    }

                    Array4<Real> const& sync_resid_a = sync_resid.array(mfi);
                    Array4<Real const> const& phiarr = phi.const_array(mfi);
#ifdef AMREX_USE_EB
                    if (typ == FabType::singlevalued)
                    {
                        Array4<Real const> const& sigmaarr_orig = sigma_orig->const_array(mfi);

                        Box stbx = bx;
                        AMREX_D_TERM(stbx.growLo(0,1);, stbx.growLo(1,1);, stbx.growLo(2,1));
                        Box const& sgbx = amrex::grow(amrex::enclosedCells(stbx),1);

                        constexpr int ncomp_s = (AMREX_SPACEDIM == 2) ? 5 : 9;
                        sten.resize(stbx,ncomp_s);
                        Elixir steneli = sten.elixir();
                        Array4<Real> const& stenarr = sten.array();

                        constexpr int ncomp_c = (AMREX_SPACEDIM == 2) ? 6 : 27;
                        cn.resize(sgbx,ncomp_c+1);
                        Elixir cneli = cn.elixir();
                        Array4<Real> const& cnarr = cn.array();
                        Array4<Real> const& sgarr = cn.array(ncomp_c);

                        Array4<EBCellFlag const> const& flagarr = flags->const_array(mfi);
                        Array4<Real const> const& vfracarr = vfrac->const_array(mfi);
                        Array4<Real const> const& intgarr = intg->const_array(mfi);

                        const Box& ibx = sgbx & amrex::enclosedCells(mfi.validbox());
                        AMREX_HOST_DEVICE_FOR_3D(sgbx, i, j, k,
                        {
                            if (ibx.contains(IntVect(AMREX_D_DECL(i,j,k))) && cccmsk(i,j,k)) {
                                mlndlap_set_connection(i,j,k,cnarr,intgarr,vfracarr,flagarr);
                                sgarr(i,j,k) = sigmaarr_orig(i,j,k);
                            } else {
                                for (int n = 0; n < ncomp_c; ++n) {
                                    cnarr(i,j,k,n) = 0.0;
                                }
                                sgarr(i,j,k) = 0.0;
                            }
                        });

                        AMREX_HOST_DEVICE_FOR_3D(stbx, i, j, k,
                        {
                            mlndlap_set_stencil_eb(i, j, k, stenarr, sgarr, cnarr, dxinv);
                        });

                        AMREX_HOST_DEVICE_PARALLEL_FOR_3D(bx, i, j, k,
                        {
                            mlndlap_set_stencil_s0(i, j, k, stenarr);
                            sync_resid_a(i,j,k) = mlndlap_adotx_sten(i, j, k, phiarr, stenarr, dmskarr);
                            mlndlap_crse_resid(i, j, k, sync_resid_a, rhsarr, cccmsk, nddom, lobc, hibc, neumann_doubling);
                        });
                    }
                    else
#endif
                    {
                        Array4<Real> sigmaarr = uarr;
                        const Box& ibx = ccbxg1 & amrex::enclosedCells(mfi.validbox());
                        if (sigma_orig) {
                            Array4<Real const> const& sigmaarr_orig = sigma_orig->const_array(mfi);
                            AMREX_HOST_DEVICE_FOR_3D(ccbxg1, i, j, k,
                            {
                                if (ibx.contains(IntVect(AMREX_D_DECL(i,j,k))) && cccmsk(i,j,k)) {
                                    sigmaarr(i,j,k) = sigmaarr_orig(i,j,k);
                                } else {
                                    sigmaarr(i,j,k) = 0.0;
                                }
                            });
                        } else {
                            Real const_sigma = m_const_sigma;
                            AMREX_HOST_DEVICE_FOR_3D(ccbxg1, i, j, k,
                            {
                                if (ibx.contains(IntVect(AMREX_D_DECL(i,j,k))) && cccmsk(i,j,k)) {
                                    sigmaarr(i,j,k) = const_sigma;
                                } else {
                                    sigmaarr(i,j,k) = 0.0;
                                }
                            });
                        }

#if (AMREX_SPACEDIM == 2)
                        AMREX_HOST_DEVICE_PARALLEL_FOR_3D(bx, i, j, k,
                        {
                            sync_resid_a(i,j,k) = mlndlap_adotx_aa(i, j, k, phiarr, sigmaarr, dmskarr, is_rz, dxinv);
                            mlndlap_crse_resid(i, j, k, sync_resid_a, rhsarr, cccmsk, nddom, lobc, hibc, neumann_doubling);
                        });
#else
                        AMREX_HOST_DEVICE_PARALLEL_FOR_3D(bx, i, j, k,
                        {
                            sync_resid_a(i,j,k) = mlndlap_adotx_aa(i, j, k, phiarr, sigmaarr, dmskarr, dxinv);
                            mlndlap_crse_resid(i, j, k, sync_resid_a, rhsarr, cccmsk, nddom, lobc, hibc, neumann_doubling);
                        });
#endif
                    }
                }
            }
        }
    }
}